

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx::CurveNiIntersector1<8>::
     intersect_t<embree::avx::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  undefined4 uVar1;
  undefined8 uVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Primitive PVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  long lVar12;
  long lVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [12];
  ulong uVar75;
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  uint uVar84;
  uint uVar85;
  long lVar86;
  uint uVar87;
  ulong uVar88;
  ulong uVar89;
  uint uVar90;
  ulong uVar91;
  bool bVar92;
  __m128 a;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar114;
  float fVar115;
  float fVar116;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar113;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar117;
  float fVar147;
  float fVar148;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar149;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  float fVar150;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar152 [16];
  float fVar151;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar168;
  float fVar169;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  float fVar170;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar155 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar171 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar193;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar216;
  float fVar233;
  float fVar234;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar236;
  float fVar237;
  float fVar238;
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  float fVar235;
  undefined1 auVar232 [64];
  float fVar239;
  float fVar240;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar250;
  float fVar252;
  float fVar258;
  float fVar262;
  float fVar266;
  undefined1 auVar245 [32];
  float fVar254;
  undefined1 auVar246 [32];
  float fVar251;
  float fVar253;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar263;
  float fVar264;
  float fVar265;
  float fVar267;
  float fVar268;
  float fVar269;
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [64];
  float fVar270;
  undefined1 auVar271 [28];
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  float fVar287;
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [64];
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  float fVar299;
  float fVar303;
  float fVar311;
  float fVar315;
  float fVar319;
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar304;
  float fVar305;
  float fVar306;
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  float fVar330;
  float fVar331;
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [64];
  float fVar332;
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar345;
  float fVar346;
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [64];
  float fVar348;
  undefined1 auVar349 [16];
  float fVar347;
  float fVar354;
  float fVar356;
  float fVar360;
  float fVar362;
  float fVar364;
  undefined1 auVar350 [32];
  float fVar355;
  float fVar357;
  float fVar358;
  float fVar359;
  float fVar361;
  float fVar363;
  float fVar365;
  float fVar366;
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [64];
  float fVar367;
  float fVar372;
  float fVar373;
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar377;
  float in_register_0000151c;
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [64];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  float fVar382;
  float fVar384;
  float fVar385;
  float fVar386;
  float fVar387;
  float fVar388;
  float fVar389;
  float in_register_0000159c;
  undefined1 auVar383 [32];
  float in_register_000015dc;
  undefined1 auVar390 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  uint local_b4c;
  undefined1 local_b20 [8];
  float fStack_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float fStack_b08;
  float fStack_b04;
  RTCFilterFunctionNArguments local_ad8;
  int local_aa4;
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  undefined1 auStack_a90 [16];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  undefined1 local_9f0 [8];
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  undefined1 local_9d0 [8];
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [32];
  undefined8 local_990;
  float local_988;
  float local_984;
  undefined4 local_980;
  uint local_97c;
  uint local_978;
  uint local_974;
  uint local_970;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_870 [16];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined4 uStack_844;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  float local_800;
  float fStack_7fc;
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_630 [16];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined4 uStack_384;
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  
  PVar9 = prim[1];
  uVar89 = (ulong)(byte)PVar9;
  fVar193 = *(float *)(prim + uVar89 * 0x19 + 0x12);
  auVar19 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar89 * 0x19 + 6));
  auVar217._0_4_ = fVar193 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar217._4_4_ = fVar193 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar217._8_4_ = fVar193 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar217._12_4_ = fVar193 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 4 + 6)));
  auVar118._0_4_ = fVar193 * auVar19._0_4_;
  auVar118._4_4_ = fVar193 * auVar19._4_4_;
  auVar118._8_4_ = fVar193 * auVar19._8_4_;
  auVar118._12_4_ = fVar193 * auVar19._12_4_;
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 4 + 10)));
  auVar102._16_16_ = auVar19;
  auVar102._0_16_ = auVar175;
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 5 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 5 + 10)));
  auVar159._16_16_ = auVar19;
  auVar159._0_16_ = auVar175;
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 6 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 6 + 10)));
  auVar108 = vcvtdq2ps_avx(auVar159);
  auVar183._16_16_ = auVar19;
  auVar183._0_16_ = auVar175;
  auVar14 = vcvtdq2ps_avx(auVar183);
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0xb + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0xb + 10)));
  auVar184._16_16_ = auVar19;
  auVar184._0_16_ = auVar175;
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0xc + 6)));
  auVar337 = vcvtdq2ps_avx(auVar184);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0xc + 10)));
  auVar245._16_16_ = auVar19;
  auVar245._0_16_ = auVar175;
  auVar15 = vcvtdq2ps_avx(auVar245);
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0xd + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0xd + 10)));
  auVar272._16_16_ = auVar19;
  auVar272._0_16_ = auVar175;
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0x12 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0x12 + 10)));
  auVar189 = vcvtdq2ps_avx(auVar272);
  auVar273._16_16_ = auVar19;
  auVar273._0_16_ = auVar175;
  auVar16 = vcvtdq2ps_avx(auVar273);
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0x13 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0x13 + 10)));
  auVar325._16_16_ = auVar19;
  auVar325._0_16_ = auVar175;
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0x14 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar325);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0x14 + 10)));
  auVar333._16_16_ = auVar19;
  auVar333._0_16_ = auVar175;
  auVar336 = vcvtdq2ps_avx(auVar333);
  auVar175 = vshufps_avx(auVar217,auVar217,0);
  auVar19 = vshufps_avx(auVar217,auVar217,0x55);
  auVar18 = vshufps_avx(auVar217,auVar217,0xaa);
  fVar193 = auVar18._0_4_;
  fVar210 = auVar18._4_4_;
  fVar211 = auVar18._8_4_;
  fVar212 = auVar18._12_4_;
  fVar213 = auVar19._0_4_;
  fVar214 = auVar19._4_4_;
  fVar215 = auVar19._8_4_;
  fVar239 = auVar19._12_4_;
  fVar250 = auVar175._0_4_;
  fVar252 = auVar175._4_4_;
  fVar254 = auVar175._8_4_;
  fVar258 = auVar175._12_4_;
  auVar368._0_4_ = fVar250 * auVar102._0_4_ + fVar213 * auVar108._0_4_ + fVar193 * auVar14._0_4_;
  auVar368._4_4_ = fVar252 * auVar102._4_4_ + fVar214 * auVar108._4_4_ + fVar210 * auVar14._4_4_;
  auVar368._8_4_ = fVar254 * auVar102._8_4_ + fVar215 * auVar108._8_4_ + fVar211 * auVar14._8_4_;
  auVar368._12_4_ = fVar258 * auVar102._12_4_ + fVar239 * auVar108._12_4_ + fVar212 * auVar14._12_4_
  ;
  auVar368._16_4_ = fVar250 * auVar102._16_4_ + fVar213 * auVar108._16_4_ + fVar193 * auVar14._16_4_
  ;
  auVar368._20_4_ = fVar252 * auVar102._20_4_ + fVar214 * auVar108._20_4_ + fVar210 * auVar14._20_4_
  ;
  auVar368._24_4_ = fVar254 * auVar102._24_4_ + fVar215 * auVar108._24_4_ + fVar211 * auVar14._24_4_
  ;
  auVar368._28_4_ = fVar239 + in_register_000015dc + in_register_0000151c;
  auVar350._0_4_ = fVar250 * auVar337._0_4_ + fVar213 * auVar15._0_4_ + auVar189._0_4_ * fVar193;
  auVar350._4_4_ = fVar252 * auVar337._4_4_ + fVar214 * auVar15._4_4_ + auVar189._4_4_ * fVar210;
  auVar350._8_4_ = fVar254 * auVar337._8_4_ + fVar215 * auVar15._8_4_ + auVar189._8_4_ * fVar211;
  auVar350._12_4_ = fVar258 * auVar337._12_4_ + fVar239 * auVar15._12_4_ + auVar189._12_4_ * fVar212
  ;
  auVar350._16_4_ = fVar250 * auVar337._16_4_ + fVar213 * auVar15._16_4_ + auVar189._16_4_ * fVar193
  ;
  auVar350._20_4_ = fVar252 * auVar337._20_4_ + fVar214 * auVar15._20_4_ + auVar189._20_4_ * fVar210
  ;
  auVar350._24_4_ = fVar254 * auVar337._24_4_ + fVar215 * auVar15._24_4_ + auVar189._24_4_ * fVar211
  ;
  auVar350._28_4_ = fVar239 + in_register_000015dc + in_register_0000159c;
  auVar222._0_4_ = fVar250 * auVar16._0_4_ + fVar213 * auVar17._0_4_ + auVar336._0_4_ * fVar193;
  auVar222._4_4_ = fVar252 * auVar16._4_4_ + fVar214 * auVar17._4_4_ + auVar336._4_4_ * fVar210;
  auVar222._8_4_ = fVar254 * auVar16._8_4_ + fVar215 * auVar17._8_4_ + auVar336._8_4_ * fVar211;
  auVar222._12_4_ = fVar258 * auVar16._12_4_ + fVar239 * auVar17._12_4_ + auVar336._12_4_ * fVar212;
  auVar222._16_4_ = fVar250 * auVar16._16_4_ + fVar213 * auVar17._16_4_ + auVar336._16_4_ * fVar193;
  auVar222._20_4_ = fVar252 * auVar16._20_4_ + fVar214 * auVar17._20_4_ + auVar336._20_4_ * fVar210;
  auVar222._24_4_ = fVar254 * auVar16._24_4_ + fVar215 * auVar17._24_4_ + auVar336._24_4_ * fVar211;
  auVar222._28_4_ = fVar258 + fVar239 + fVar212;
  auVar175 = vshufps_avx(auVar118,auVar118,0);
  auVar19 = vshufps_avx(auVar118,auVar118,0x55);
  auVar18 = vshufps_avx(auVar118,auVar118,0xaa);
  fVar210 = auVar18._0_4_;
  fVar211 = auVar18._4_4_;
  fVar212 = auVar18._8_4_;
  fVar213 = auVar18._12_4_;
  fVar252 = auVar19._0_4_;
  fVar254 = auVar19._4_4_;
  fVar258 = auVar19._8_4_;
  fVar262 = auVar19._12_4_;
  fVar214 = auVar175._0_4_;
  fVar215 = auVar175._4_4_;
  fVar239 = auVar175._8_4_;
  fVar250 = auVar175._12_4_;
  fVar193 = auVar102._28_4_;
  auVar131._0_4_ = fVar214 * auVar102._0_4_ + fVar252 * auVar108._0_4_ + fVar210 * auVar14._0_4_;
  auVar131._4_4_ = fVar215 * auVar102._4_4_ + fVar254 * auVar108._4_4_ + fVar211 * auVar14._4_4_;
  auVar131._8_4_ = fVar239 * auVar102._8_4_ + fVar258 * auVar108._8_4_ + fVar212 * auVar14._8_4_;
  auVar131._12_4_ = fVar250 * auVar102._12_4_ + fVar262 * auVar108._12_4_ + fVar213 * auVar14._12_4_
  ;
  auVar131._16_4_ = fVar214 * auVar102._16_4_ + fVar252 * auVar108._16_4_ + fVar210 * auVar14._16_4_
  ;
  auVar131._20_4_ = fVar215 * auVar102._20_4_ + fVar254 * auVar108._20_4_ + fVar211 * auVar14._20_4_
  ;
  auVar131._24_4_ = fVar239 * auVar102._24_4_ + fVar258 * auVar108._24_4_ + fVar212 * auVar14._24_4_
  ;
  auVar131._28_4_ = fVar193 + auVar108._28_4_ + auVar14._28_4_;
  auVar185._0_4_ = fVar214 * auVar337._0_4_ + auVar189._0_4_ * fVar210 + fVar252 * auVar15._0_4_;
  auVar185._4_4_ = fVar215 * auVar337._4_4_ + auVar189._4_4_ * fVar211 + fVar254 * auVar15._4_4_;
  auVar185._8_4_ = fVar239 * auVar337._8_4_ + auVar189._8_4_ * fVar212 + fVar258 * auVar15._8_4_;
  auVar185._12_4_ = fVar250 * auVar337._12_4_ + auVar189._12_4_ * fVar213 + fVar262 * auVar15._12_4_
  ;
  auVar185._16_4_ = fVar214 * auVar337._16_4_ + auVar189._16_4_ * fVar210 + fVar252 * auVar15._16_4_
  ;
  auVar185._20_4_ = fVar215 * auVar337._20_4_ + auVar189._20_4_ * fVar211 + fVar254 * auVar15._20_4_
  ;
  auVar185._24_4_ = fVar239 * auVar337._24_4_ + auVar189._24_4_ * fVar212 + fVar258 * auVar15._24_4_
  ;
  auVar185._28_4_ = fVar193 + auVar189._28_4_ + auVar14._28_4_;
  auVar274._8_4_ = 0x7fffffff;
  auVar274._0_8_ = 0x7fffffff7fffffff;
  auVar274._12_4_ = 0x7fffffff;
  auVar274._16_4_ = 0x7fffffff;
  auVar274._20_4_ = 0x7fffffff;
  auVar274._24_4_ = 0x7fffffff;
  auVar274._28_4_ = 0x7fffffff;
  auVar160._0_4_ = fVar214 * auVar16._0_4_ + fVar252 * auVar17._0_4_ + auVar336._0_4_ * fVar210;
  auVar160._4_4_ = fVar215 * auVar16._4_4_ + fVar254 * auVar17._4_4_ + auVar336._4_4_ * fVar211;
  auVar160._8_4_ = fVar239 * auVar16._8_4_ + fVar258 * auVar17._8_4_ + auVar336._8_4_ * fVar212;
  auVar160._12_4_ = fVar250 * auVar16._12_4_ + fVar262 * auVar17._12_4_ + auVar336._12_4_ * fVar213;
  auVar160._16_4_ = fVar214 * auVar16._16_4_ + fVar252 * auVar17._16_4_ + auVar336._16_4_ * fVar210;
  auVar160._20_4_ = fVar215 * auVar16._20_4_ + fVar254 * auVar17._20_4_ + auVar336._20_4_ * fVar211;
  auVar160._24_4_ = fVar239 * auVar16._24_4_ + fVar258 * auVar17._24_4_ + auVar336._24_4_ * fVar212;
  auVar160._28_4_ = fVar193 + auVar15._28_4_ + fVar213;
  auVar102 = vandps_avx(auVar368,auVar274);
  auVar294._8_4_ = 0x219392ef;
  auVar294._0_8_ = 0x219392ef219392ef;
  auVar294._12_4_ = 0x219392ef;
  auVar294._16_4_ = 0x219392ef;
  auVar294._20_4_ = 0x219392ef;
  auVar294._24_4_ = 0x219392ef;
  auVar294._28_4_ = 0x219392ef;
  auVar102 = vcmpps_avx(auVar102,auVar294,1);
  auVar108 = vblendvps_avx(auVar368,auVar294,auVar102);
  auVar102 = vandps_avx(auVar350,auVar274);
  auVar102 = vcmpps_avx(auVar102,auVar294,1);
  auVar14 = vblendvps_avx(auVar350,auVar294,auVar102);
  auVar102 = vandps_avx(auVar222,auVar274);
  auVar102 = vcmpps_avx(auVar102,auVar294,1);
  auVar337 = vrcpps_avx(auVar108);
  auVar102 = vblendvps_avx(auVar222,auVar294,auVar102);
  auVar295._8_4_ = 0x3f800000;
  auVar295._0_8_ = 0x3f8000003f800000;
  auVar295._12_4_ = 0x3f800000;
  auVar295._16_4_ = 0x3f800000;
  auVar295._20_4_ = 0x3f800000;
  auVar295._24_4_ = 0x3f800000;
  auVar295._28_4_ = 0x3f800000;
  fVar193 = auVar337._0_4_;
  fVar210 = auVar337._4_4_;
  auVar15._4_4_ = auVar108._4_4_ * fVar210;
  auVar15._0_4_ = auVar108._0_4_ * fVar193;
  fVar211 = auVar337._8_4_;
  auVar15._8_4_ = auVar108._8_4_ * fVar211;
  fVar212 = auVar337._12_4_;
  auVar15._12_4_ = auVar108._12_4_ * fVar212;
  fVar213 = auVar337._16_4_;
  auVar15._16_4_ = auVar108._16_4_ * fVar213;
  fVar214 = auVar337._20_4_;
  auVar15._20_4_ = auVar108._20_4_ * fVar214;
  fVar215 = auVar337._24_4_;
  auVar15._24_4_ = auVar108._24_4_ * fVar215;
  auVar15._28_4_ = auVar108._28_4_;
  auVar108 = vsubps_avx(auVar295,auVar15);
  fVar193 = fVar193 + fVar193 * auVar108._0_4_;
  fVar210 = fVar210 + fVar210 * auVar108._4_4_;
  fVar211 = fVar211 + fVar211 * auVar108._8_4_;
  fVar212 = fVar212 + fVar212 * auVar108._12_4_;
  fVar213 = fVar213 + fVar213 * auVar108._16_4_;
  fVar214 = fVar214 + fVar214 * auVar108._20_4_;
  fVar215 = fVar215 + fVar215 * auVar108._24_4_;
  auVar108 = vrcpps_avx(auVar14);
  fVar239 = auVar108._0_4_;
  fVar250 = auVar108._4_4_;
  auVar337._4_4_ = fVar250 * auVar14._4_4_;
  auVar337._0_4_ = fVar239 * auVar14._0_4_;
  fVar252 = auVar108._8_4_;
  auVar337._8_4_ = fVar252 * auVar14._8_4_;
  fVar254 = auVar108._12_4_;
  auVar337._12_4_ = fVar254 * auVar14._12_4_;
  fVar258 = auVar108._16_4_;
  auVar337._16_4_ = fVar258 * auVar14._16_4_;
  fVar262 = auVar108._20_4_;
  auVar337._20_4_ = fVar262 * auVar14._20_4_;
  fVar266 = auVar108._24_4_;
  auVar337._24_4_ = fVar266 * auVar14._24_4_;
  auVar337._28_4_ = auVar14._28_4_;
  auVar337 = vsubps_avx(auVar295,auVar337);
  auVar14 = vrcpps_avx(auVar102);
  fVar239 = fVar239 + fVar239 * auVar337._0_4_;
  fVar250 = fVar250 + fVar250 * auVar337._4_4_;
  fVar252 = fVar252 + fVar252 * auVar337._8_4_;
  fVar254 = fVar254 + fVar254 * auVar337._12_4_;
  fVar258 = fVar258 + fVar258 * auVar337._16_4_;
  fVar262 = fVar262 + fVar262 * auVar337._20_4_;
  fVar266 = fVar266 + fVar266 * auVar337._24_4_;
  fVar216 = auVar14._0_4_;
  fVar233 = auVar14._4_4_;
  auVar189._4_4_ = fVar233 * auVar102._4_4_;
  auVar189._0_4_ = fVar216 * auVar102._0_4_;
  fVar234 = auVar14._8_4_;
  auVar189._8_4_ = fVar234 * auVar102._8_4_;
  fVar235 = auVar14._12_4_;
  auVar189._12_4_ = fVar235 * auVar102._12_4_;
  fVar236 = auVar14._16_4_;
  auVar189._16_4_ = fVar236 * auVar102._16_4_;
  fVar237 = auVar14._20_4_;
  auVar189._20_4_ = fVar237 * auVar102._20_4_;
  fVar238 = auVar14._24_4_;
  auVar189._24_4_ = fVar238 * auVar102._24_4_;
  auVar189._28_4_ = auVar108._28_4_;
  auVar102 = vsubps_avx(auVar295,auVar189);
  auVar175._8_8_ = 0;
  auVar175._0_8_ = *(ulong *)(prim + uVar89 * 7 + 6);
  auVar175 = vpmovsxwd_avx(auVar175);
  fVar216 = fVar216 + fVar216 * auVar102._0_4_;
  fVar233 = fVar233 + fVar233 * auVar102._4_4_;
  fVar234 = fVar234 + fVar234 * auVar102._8_4_;
  fVar235 = fVar235 + fVar235 * auVar102._12_4_;
  fVar236 = fVar236 + fVar236 * auVar102._16_4_;
  fVar237 = fVar237 + fVar237 * auVar102._20_4_;
  fVar238 = fVar238 + fVar238 * auVar102._24_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar89 * 7 + 0xe);
  auVar19 = vpmovsxwd_avx(auVar19);
  auVar103._16_16_ = auVar19;
  auVar103._0_16_ = auVar175;
  auVar102 = vcvtdq2ps_avx(auVar103);
  auVar102 = vsubps_avx(auVar102,auVar131);
  auVar93._0_4_ = fVar193 * auVar102._0_4_;
  auVar93._4_4_ = fVar210 * auVar102._4_4_;
  auVar93._8_4_ = fVar211 * auVar102._8_4_;
  auVar93._12_4_ = fVar212 * auVar102._12_4_;
  auVar14._16_4_ = fVar213 * auVar102._16_4_;
  auVar14._0_16_ = auVar93;
  auVar14._20_4_ = fVar214 * auVar102._20_4_;
  auVar14._24_4_ = fVar215 * auVar102._24_4_;
  auVar14._28_4_ = auVar102._28_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar89 * 9 + 6);
  auVar175 = vpmovsxwd_avx(auVar18);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + uVar89 * 9 + 0xe);
  auVar19 = vpmovsxwd_avx(auVar97);
  auVar275._16_16_ = auVar19;
  auVar275._0_16_ = auVar175;
  auVar102 = vcvtdq2ps_avx(auVar275);
  auVar102 = vsubps_avx(auVar102,auVar131);
  auVar122._8_8_ = 0;
  auVar122._0_8_ = *(ulong *)(prim + uVar89 * 0xe + 6);
  auVar175 = vpmovsxwd_avx(auVar122);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar89 * 0xe + 0xe);
  auVar19 = vpmovsxwd_avx(auVar96);
  auVar119._0_4_ = fVar193 * auVar102._0_4_;
  auVar119._4_4_ = fVar210 * auVar102._4_4_;
  auVar119._8_4_ = fVar211 * auVar102._8_4_;
  auVar119._12_4_ = fVar212 * auVar102._12_4_;
  auVar16._16_4_ = fVar213 * auVar102._16_4_;
  auVar16._0_16_ = auVar119;
  auVar16._20_4_ = fVar214 * auVar102._20_4_;
  auVar16._24_4_ = fVar215 * auVar102._24_4_;
  auVar16._28_4_ = auVar102._28_4_;
  auVar203._16_16_ = auVar19;
  auVar203._0_16_ = auVar175;
  auVar102 = vcvtdq2ps_avx(auVar203);
  auVar102 = vsubps_avx(auVar102,auVar185);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + 6);
  auVar175 = vpmovsxwd_avx(auVar5);
  auVar349._8_8_ = 0;
  auVar349._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + 0xe);
  auVar19 = vpmovsxwd_avx(auVar349);
  auVar194._0_4_ = fVar239 * auVar102._0_4_;
  auVar194._4_4_ = fVar250 * auVar102._4_4_;
  auVar194._8_4_ = fVar252 * auVar102._8_4_;
  auVar194._12_4_ = fVar254 * auVar102._12_4_;
  auVar17._16_4_ = fVar258 * auVar102._16_4_;
  auVar17._0_16_ = auVar194;
  auVar17._20_4_ = fVar262 * auVar102._20_4_;
  auVar17._24_4_ = fVar266 * auVar102._24_4_;
  auVar17._28_4_ = auVar102._28_4_;
  auVar276._16_16_ = auVar19;
  auVar276._0_16_ = auVar175;
  auVar102 = vcvtdq2ps_avx(auVar276);
  auVar102 = vsubps_avx(auVar102,auVar185);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + uVar89 * 0x15 + 6);
  auVar175 = vpmovsxwd_avx(auVar99);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar89 * 0x15 + 0xe);
  auVar19 = vpmovsxwd_avx(auVar6);
  auVar171._0_4_ = fVar239 * auVar102._0_4_;
  auVar171._4_4_ = fVar250 * auVar102._4_4_;
  auVar171._8_4_ = fVar252 * auVar102._8_4_;
  auVar171._12_4_ = fVar254 * auVar102._12_4_;
  auVar336._16_4_ = fVar258 * auVar102._16_4_;
  auVar336._0_16_ = auVar171;
  auVar336._20_4_ = fVar262 * auVar102._20_4_;
  auVar336._24_4_ = fVar266 * auVar102._24_4_;
  auVar336._28_4_ = auVar102._28_4_;
  auVar246._16_16_ = auVar19;
  auVar246._0_16_ = auVar175;
  auVar102 = vcvtdq2ps_avx(auVar246);
  auVar102 = vsubps_avx(auVar102,auVar160);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar89 * 0x17 + 6);
  auVar175 = vpmovsxwd_avx(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar89 * 0x17 + 0xe);
  auVar19 = vpmovsxwd_avx(auVar8);
  auVar241._0_4_ = fVar216 * auVar102._0_4_;
  auVar241._4_4_ = fVar233 * auVar102._4_4_;
  auVar241._8_4_ = fVar234 * auVar102._8_4_;
  auVar241._12_4_ = fVar235 * auVar102._12_4_;
  auVar20._16_4_ = fVar236 * auVar102._16_4_;
  auVar20._0_16_ = auVar241;
  auVar20._20_4_ = fVar237 * auVar102._20_4_;
  auVar20._24_4_ = fVar238 * auVar102._24_4_;
  auVar20._28_4_ = auVar102._28_4_;
  auVar277._16_16_ = auVar19;
  auVar277._0_16_ = auVar175;
  auVar102 = vcvtdq2ps_avx(auVar277);
  auVar102 = vsubps_avx(auVar102,auVar160);
  auVar152._0_4_ = fVar216 * auVar102._0_4_;
  auVar152._4_4_ = fVar233 * auVar102._4_4_;
  auVar152._8_4_ = fVar234 * auVar102._8_4_;
  auVar152._12_4_ = fVar235 * auVar102._12_4_;
  auVar21._16_4_ = fVar236 * auVar102._16_4_;
  auVar21._0_16_ = auVar152;
  auVar21._20_4_ = fVar237 * auVar102._20_4_;
  auVar21._24_4_ = fVar238 * auVar102._24_4_;
  auVar21._28_4_ = auVar102._28_4_;
  auVar175 = vpminsd_avx(auVar14._16_16_,auVar16._16_16_);
  auVar19 = vpminsd_avx(auVar93,auVar119);
  auVar296._16_16_ = auVar175;
  auVar296._0_16_ = auVar19;
  auVar175 = vpminsd_avx(auVar17._16_16_,auVar336._16_16_);
  auVar19 = vpminsd_avx(auVar194,auVar171);
  auVar326._16_16_ = auVar175;
  auVar326._0_16_ = auVar19;
  auVar102 = vmaxps_avx(auVar296,auVar326);
  auVar175 = vpminsd_avx(auVar20._16_16_,auVar21._16_16_);
  auVar19 = vpminsd_avx(auVar241,auVar152);
  auVar378._16_16_ = auVar175;
  auVar378._0_16_ = auVar19;
  uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar383._4_4_ = uVar1;
  auVar383._0_4_ = uVar1;
  auVar383._8_4_ = uVar1;
  auVar383._12_4_ = uVar1;
  auVar383._16_4_ = uVar1;
  auVar383._20_4_ = uVar1;
  auVar383._24_4_ = uVar1;
  auVar383._28_4_ = uVar1;
  auVar108 = vmaxps_avx(auVar378,auVar383);
  auVar102 = vmaxps_avx(auVar102,auVar108);
  local_360._4_4_ = auVar102._4_4_ * 0.99999964;
  local_360._0_4_ = auVar102._0_4_ * 0.99999964;
  local_360._8_4_ = auVar102._8_4_ * 0.99999964;
  local_360._12_4_ = auVar102._12_4_ * 0.99999964;
  local_360._16_4_ = auVar102._16_4_ * 0.99999964;
  local_360._20_4_ = auVar102._20_4_ * 0.99999964;
  local_360._24_4_ = auVar102._24_4_ * 0.99999964;
  local_360._28_4_ = auVar102._28_4_;
  auVar371 = ZEXT3264(local_360);
  auVar175 = vpmaxsd_avx(auVar14._16_16_,auVar16._16_16_);
  auVar340 = ZEXT1664(auVar175);
  auVar353 = ZEXT464((uint)(byte)PVar9);
  auVar19 = vpmaxsd_avx(auVar93,auVar119);
  auVar104._16_16_ = auVar175;
  auVar104._0_16_ = auVar19;
  auVar175 = vpmaxsd_avx(auVar17._16_16_,auVar336._16_16_);
  auVar19 = vpmaxsd_avx(auVar194,auVar171);
  auVar132._16_16_ = auVar175;
  auVar132._0_16_ = auVar19;
  auVar102 = vminps_avx(auVar104,auVar132);
  auVar175 = vpmaxsd_avx(auVar20._16_16_,auVar21._16_16_);
  auVar19 = vpmaxsd_avx(auVar241,auVar152);
  fVar193 = (ray->super_RayK<1>).tfar;
  auVar186._4_4_ = fVar193;
  auVar186._0_4_ = fVar193;
  auVar186._8_4_ = fVar193;
  auVar186._12_4_ = fVar193;
  auVar186._16_4_ = fVar193;
  auVar186._20_4_ = fVar193;
  auVar186._24_4_ = fVar193;
  auVar186._28_4_ = fVar193;
  auVar133._16_16_ = auVar175;
  auVar133._0_16_ = auVar19;
  auVar108 = vminps_avx(auVar133,auVar186);
  auVar102 = vminps_avx(auVar102,auVar108);
  auVar108._4_4_ = auVar102._4_4_ * 1.0000004;
  auVar108._0_4_ = auVar102._0_4_ * 1.0000004;
  auVar108._8_4_ = auVar102._8_4_ * 1.0000004;
  auVar108._12_4_ = auVar102._12_4_ * 1.0000004;
  auVar108._16_4_ = auVar102._16_4_ * 1.0000004;
  auVar108._20_4_ = auVar102._20_4_ * 1.0000004;
  auVar108._24_4_ = auVar102._24_4_ * 1.0000004;
  auVar108._28_4_ = auVar102._28_4_;
  auVar102 = vcmpps_avx(local_360,auVar108,2);
  auVar175 = vpshufd_avx(ZEXT416((uint)(byte)PVar9),0);
  auVar134._16_16_ = auVar175;
  auVar134._0_16_ = auVar175;
  auVar108 = vcvtdq2ps_avx(auVar134);
  auVar108 = vcmpps_avx(_DAT_01f7b060,auVar108,1);
  auVar102 = vandps_avx(auVar102,auVar108);
  auVar135._16_16_ = mm_lookupmask_ps._240_16_;
  auVar135._0_16_ = mm_lookupmask_ps._240_16_;
  uVar84 = vmovmskps_avx(auVar102);
  local_520 = vblendps_avx(auVar135,ZEXT832(0) << 0x20,0x80);
LAB_00a4d4b5:
  uVar89 = (ulong)uVar84;
  if (uVar89 == 0) {
    return;
  }
  lVar86 = 0;
  if (uVar89 != 0) {
    for (; (uVar84 >> lVar86 & 1) == 0; lVar86 = lVar86 + 1) {
    }
  }
  uVar89 = uVar89 - 1 & uVar89;
  uVar84 = *(uint *)(prim + 2);
  pGVar10 = (context->scene->geometries).items[uVar84].ptr;
  uVar88 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                           pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar86 * 4 + 6));
  p_Var11 = pGVar10[1].intersectionFilterN;
  lVar12 = *(long *)&pGVar10[1].time_range.upper;
  auVar175 = *(undefined1 (*) [16])(lVar12 + (long)p_Var11 * uVar88);
  auVar19 = *(undefined1 (*) [16])(lVar12 + (uVar88 + 1) * (long)p_Var11);
  auVar18 = *(undefined1 (*) [16])(lVar12 + (uVar88 + 2) * (long)p_Var11);
  lVar13 = 0;
  if (uVar89 != 0) {
    for (; (uVar89 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
    }
  }
  auVar97 = *(undefined1 (*) [16])(lVar12 + (uVar88 + 3) * (long)p_Var11);
  if (((uVar89 != 0) && (uVar88 = uVar89 - 1 & uVar89, uVar88 != 0)) && (lVar12 = 0, uVar88 != 0)) {
    for (; (uVar88 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
    }
  }
  auVar94._0_4_ = (auVar175._0_4_ + auVar19._0_4_ + auVar18._0_4_ + auVar97._0_4_) * 0.25;
  auVar94._4_4_ = (auVar175._4_4_ + auVar19._4_4_ + auVar18._4_4_ + auVar97._4_4_) * 0.25;
  auVar94._8_4_ = (auVar175._8_4_ + auVar19._8_4_ + auVar18._8_4_ + auVar97._8_4_) * 0.25;
  auVar94._12_4_ = (auVar175._12_4_ + auVar19._12_4_ + auVar18._12_4_ + auVar97._12_4_) * 0.25;
  aVar3 = (ray->super_RayK<1>).org.field_0.field_1;
  aVar4 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar122 = vsubps_avx(auVar94,(undefined1  [16])aVar3);
  auVar122 = vdpps_avx(auVar122,(undefined1  [16])aVar4,0x7f);
  auVar96 = vdpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,0x7f);
  auVar5 = vrcpss_avx(auVar96,auVar96);
  auVar329 = ZEXT464(0x40000000);
  fVar193 = auVar122._0_4_ * auVar5._0_4_ * (2.0 - auVar5._0_4_ * auVar96._0_4_);
  local_870 = ZEXT416((uint)fVar193);
  auVar96 = vshufps_avx(ZEXT416((uint)fVar193),ZEXT416((uint)fVar193),0);
  fVar193 = aVar4.x;
  fVar210 = aVar4.y;
  fVar211 = aVar4.z;
  aVar149 = aVar4.field_3;
  auVar242._0_4_ = aVar3.x + fVar193 * auVar96._0_4_;
  auVar242._4_4_ = aVar3.y + fVar210 * auVar96._4_4_;
  auVar242._8_4_ = aVar3.z + fVar211 * auVar96._8_4_;
  auVar242._12_4_ = aVar3.field_3.w + aVar149.w * auVar96._12_4_;
  auVar122 = vblendps_avx(auVar242,_DAT_01f45a50,8);
  _local_9d0 = vsubps_avx(auVar175,auVar122);
  _local_9e0 = vsubps_avx(auVar18,auVar122);
  auVar232 = ZEXT1664(_local_9e0);
  _local_9f0 = vsubps_avx(auVar19,auVar122);
  auVar281 = ZEXT1664(_local_9f0);
  _local_a00 = vsubps_avx(auVar97,auVar122);
  auVar175 = vshufps_avx(_local_9d0,_local_9d0,0);
  local_a20._16_16_ = auVar175;
  local_a20._0_16_ = auVar175;
  auVar390 = ZEXT3264(local_a20);
  auVar175 = vshufps_avx(_local_9d0,_local_9d0,0x55);
  register0x00001290 = auVar175;
  _local_1e0 = auVar175;
  auVar175 = vshufps_avx(_local_9d0,_local_9d0,0xaa);
  register0x00001290 = auVar175;
  _local_200 = auVar175;
  auVar175 = vshufps_avx(_local_9d0,_local_9d0,0xff);
  register0x00001290 = auVar175;
  _local_220 = auVar175;
  auVar175 = vshufps_avx(_local_9f0,_local_9f0,0);
  register0x00001290 = auVar175;
  _local_240 = auVar175;
  auVar175 = vshufps_avx(_local_9f0,_local_9f0,0x55);
  register0x00001290 = auVar175;
  _local_260 = auVar175;
  auVar175 = vshufps_avx(_local_9f0,_local_9f0,0xaa);
  register0x00001290 = auVar175;
  _local_280 = auVar175;
  auVar120._0_4_ = fVar193 * fVar193;
  auVar120._4_4_ = fVar210 * fVar210;
  auVar120._8_4_ = fVar211 * fVar211;
  auVar120._12_4_ = aVar149.w * aVar149.w;
  auVar175 = vshufps_avx(auVar120,auVar120,0xaa);
  auVar19 = vshufps_avx(auVar120,auVar120,0x55);
  auVar18 = vshufps_avx(_local_9f0,_local_9f0,0xff);
  register0x000012d0 = auVar18;
  _local_400 = auVar18;
  auVar18 = vshufps_avx(auVar120,auVar120,0);
  local_2a0._0_4_ = auVar18._0_4_ + auVar19._0_4_ + auVar175._0_4_;
  local_2a0._4_4_ = auVar18._4_4_ + auVar19._4_4_ + auVar175._4_4_;
  local_2a0._8_4_ = auVar18._8_4_ + auVar19._8_4_ + auVar175._8_4_;
  local_2a0._12_4_ = auVar18._12_4_ + auVar19._12_4_ + auVar175._12_4_;
  local_2a0._16_4_ = auVar18._0_4_ + auVar19._0_4_ + auVar175._0_4_;
  local_2a0._20_4_ = auVar18._4_4_ + auVar19._4_4_ + auVar175._4_4_;
  local_2a0._24_4_ = auVar18._8_4_ + auVar19._8_4_ + auVar175._8_4_;
  local_2a0._28_4_ = auVar18._12_4_ + auVar19._12_4_ + auVar175._12_4_;
  auVar249 = ZEXT3264(local_2a0);
  auVar175 = vshufps_avx(_local_9e0,_local_9e0,0);
  register0x00001250 = auVar175;
  _local_420 = auVar175;
  auVar175 = vshufps_avx(_local_9e0,_local_9e0,0x55);
  register0x00001250 = auVar175;
  _local_440 = auVar175;
  auVar175 = vshufps_avx(_local_9e0,_local_9e0,0xaa);
  register0x00001250 = auVar175;
  _local_460 = auVar175;
  auVar175 = vshufps_avx(_local_9e0,_local_9e0,0xff);
  register0x00001250 = auVar175;
  _local_480 = auVar175;
  auVar175 = vshufps_avx(_local_a00,_local_a00,0);
  register0x00001250 = auVar175;
  _local_4a0 = auVar175;
  auVar175 = vshufps_avx(_local_a00,_local_a00,0x55);
  register0x00001250 = auVar175;
  _local_4c0 = auVar175;
  auVar175 = vshufps_avx(_local_a00,_local_a00,0xaa);
  register0x00001250 = auVar175;
  _local_4e0 = auVar175;
  auVar175 = vshufps_avx(_local_a00,_local_a00,0xff);
  register0x00001250 = auVar175;
  _local_500 = auVar175;
  local_900._16_16_ = auVar96;
  local_900._0_16_ = auVar96;
  uVar91 = 0;
  local_b4c = 1;
  local_660 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fStack_65c = local_660;
  fStack_658 = local_660;
  fStack_654 = local_660;
  fStack_650 = local_660;
  fStack_64c = local_660;
  fStack_648 = local_660;
  fStack_644 = local_660;
  local_680 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fStack_67c = local_680;
  fStack_678 = local_680;
  fStack_674 = local_680;
  fStack_670 = local_680;
  fStack_66c = local_680;
  fStack_668 = local_680;
  fStack_664 = local_680;
  local_800 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_7fc = local_800;
  fStack_7f8 = local_800;
  fStack_7f4 = local_800;
  fStack_7f0 = local_800;
  fStack_7ec = local_800;
  fStack_7e8 = local_800;
  fStack_7e4 = local_800;
  auVar105._8_4_ = 0x7fffffff;
  auVar105._0_8_ = 0x7fffffff7fffffff;
  auVar105._12_4_ = 0x7fffffff;
  auVar105._16_4_ = 0x7fffffff;
  auVar105._20_4_ = 0x7fffffff;
  auVar105._24_4_ = 0x7fffffff;
  auVar105._28_4_ = 0x7fffffff;
  local_540 = vandps_avx(local_2a0,auVar105);
  local_630 = ZEXT816(0x3f80000000000000);
  uVar88 = (ulong)*(uint *)(prim + lVar86 * 4 + 6);
  do {
    auVar204._8_4_ = 0x3f800000;
    auVar204._0_8_ = 0x3f8000003f800000;
    auVar204._12_4_ = 0x3f800000;
    auVar204._16_4_ = 0x3f800000;
    auVar204._20_4_ = 0x3f800000;
    auVar204._24_4_ = 0x3f800000;
    auVar204._28_4_ = 0x3f800000;
    auVar175 = vmovshdup_avx(local_630);
    auVar18 = vsubps_avx(auVar175,local_630);
    auVar175 = vshufps_avx(local_630,local_630,0);
    local_7e0._16_16_ = auVar175;
    local_7e0._0_16_ = auVar175;
    auVar19 = vshufps_avx(auVar18,auVar18,0);
    register0x00001250 = auVar19;
    _local_820 = auVar19;
    fVar117 = auVar19._0_4_;
    fVar147 = auVar19._4_4_;
    fVar148 = auVar19._8_4_;
    fVar150 = auVar19._12_4_;
    fVar151 = auVar175._0_4_;
    auVar187._0_4_ = fVar151 + fVar117 * 0.0;
    fVar168 = auVar175._4_4_;
    auVar187._4_4_ = fVar168 + fVar147 * 0.14285715;
    fVar169 = auVar175._8_4_;
    auVar187._8_4_ = fVar169 + fVar148 * 0.2857143;
    fVar170 = auVar175._12_4_;
    auVar187._12_4_ = fVar170 + fVar150 * 0.42857146;
    auVar187._16_4_ = fVar151 + fVar117 * 0.5714286;
    auVar187._20_4_ = fVar168 + fVar147 * 0.71428573;
    auVar187._24_4_ = fVar169 + fVar148 * 0.8571429;
    auVar187._28_4_ = fVar170 + fVar150;
    auVar102 = vsubps_avx(auVar204,auVar187);
    fVar210 = auVar102._0_4_;
    fVar211 = auVar102._4_4_;
    fVar212 = auVar102._8_4_;
    fVar213 = auVar102._12_4_;
    fVar214 = auVar102._16_4_;
    fVar215 = auVar102._20_4_;
    fVar239 = auVar102._24_4_;
    fVar262 = fVar210 * fVar210 * fVar210;
    fVar216 = fVar211 * fVar211 * fVar211;
    fVar234 = fVar212 * fVar212 * fVar212;
    fVar255 = fVar213 * fVar213 * fVar213;
    fVar259 = fVar214 * fVar214 * fVar214;
    fVar263 = fVar215 * fVar215 * fVar215;
    fVar267 = fVar239 * fVar239 * fVar239;
    fVar270 = auVar187._0_4_ * auVar187._0_4_ * auVar187._0_4_;
    fVar282 = auVar187._4_4_ * auVar187._4_4_ * auVar187._4_4_;
    fVar283 = auVar187._8_4_ * auVar187._8_4_ * auVar187._8_4_;
    fVar284 = auVar187._12_4_ * auVar187._12_4_ * auVar187._12_4_;
    fVar285 = auVar187._16_4_ * auVar187._16_4_ * auVar187._16_4_;
    fVar286 = auVar187._20_4_ * auVar187._20_4_ * auVar187._20_4_;
    fVar287 = auVar187._24_4_ * auVar187._24_4_ * auVar187._24_4_;
    fVar193 = auVar232._28_4_;
    fVar250 = auVar187._0_4_ * fVar210;
    fVar252 = auVar187._4_4_ * fVar211;
    fVar254 = auVar187._8_4_ * fVar212;
    fVar258 = auVar187._12_4_ * fVar213;
    fVar236 = auVar187._16_4_ * fVar214;
    fVar237 = auVar187._20_4_ * fVar215;
    fVar238 = auVar187._24_4_ * fVar239;
    fVar266 = auVar340._28_4_ + auVar371._28_4_;
    fVar323 = auVar281._28_4_ + fVar193 + fVar266;
    fVar330 = fVar266 + auVar249._28_4_ + auVar353._28_4_ + auVar329._28_4_;
    fVar266 = fVar262 * 0.16666667;
    fVar233 = fVar216 * 0.16666667;
    fVar235 = fVar234 * 0.16666667;
    fVar256 = fVar255 * 0.16666667;
    fVar260 = fVar259 * 0.16666667;
    fVar264 = fVar263 * 0.16666667;
    fVar268 = fVar267 * 0.16666667;
    fVar288 = (fVar270 + fVar262 * 4.0 + fVar210 * fVar250 * 12.0 + auVar187._0_4_ * fVar250 * 6.0)
              * 0.16666667;
    fVar299 = (fVar282 + fVar216 * 4.0 + fVar211 * fVar252 * 12.0 + auVar187._4_4_ * fVar252 * 6.0)
              * 0.16666667;
    fVar303 = (fVar283 + fVar234 * 4.0 + fVar212 * fVar254 * 12.0 + auVar187._8_4_ * fVar254 * 6.0)
              * 0.16666667;
    fVar307 = (fVar284 + fVar255 * 4.0 + fVar213 * fVar258 * 12.0 + auVar187._12_4_ * fVar258 * 6.0)
              * 0.16666667;
    fVar311 = (fVar285 + fVar259 * 4.0 + fVar214 * fVar236 * 12.0 + auVar187._16_4_ * fVar236 * 6.0)
              * 0.16666667;
    fVar315 = (fVar286 + fVar263 * 4.0 + fVar215 * fVar237 * 12.0 + auVar187._20_4_ * fVar237 * 6.0)
              * 0.16666667;
    fVar319 = (fVar287 + fVar267 * 4.0 + fVar239 * fVar238 * 12.0 + auVar187._24_4_ * fVar238 * 6.0)
              * 0.16666667;
    fVar262 = (fVar270 * 4.0 + fVar262 + auVar187._0_4_ * fVar250 * 12.0 + fVar210 * fVar250 * 6.0)
              * 0.16666667;
    fVar216 = (fVar282 * 4.0 + fVar216 + auVar187._4_4_ * fVar252 * 12.0 + fVar211 * fVar252 * 6.0)
              * 0.16666667;
    fVar234 = (fVar283 * 4.0 + fVar234 + auVar187._8_4_ * fVar254 * 12.0 + fVar212 * fVar254 * 6.0)
              * 0.16666667;
    fVar255 = (fVar284 * 4.0 + fVar255 + auVar187._12_4_ * fVar258 * 12.0 + fVar213 * fVar258 * 6.0)
              * 0.16666667;
    fVar259 = (fVar285 * 4.0 + fVar259 + auVar187._16_4_ * fVar236 * 12.0 + fVar214 * fVar236 * 6.0)
              * 0.16666667;
    fVar263 = (fVar286 * 4.0 + fVar263 + auVar187._20_4_ * fVar237 * 12.0 + fVar215 * fVar237 * 6.0)
              * 0.16666667;
    fVar267 = (fVar287 * 4.0 + fVar267 + auVar187._24_4_ * fVar238 * 12.0 + fVar239 * fVar238 * 6.0)
              * 0.16666667;
    fVar270 = fVar270 * 0.16666667;
    fVar282 = fVar282 * 0.16666667;
    fVar283 = fVar283 * 0.16666667;
    fVar284 = fVar284 * 0.16666667;
    fVar285 = fVar285 * 0.16666667;
    fVar286 = fVar286 * 0.16666667;
    fVar287 = fVar287 * 0.16666667;
    fVar366 = auVar353._28_4_ + 12.0;
    fVar331 = fVar330 + 12.166667;
    local_8c0 = auVar390._0_4_ * fVar266 +
                fVar288 * (float)local_240._0_4_ +
                fVar270 * (float)local_4a0._0_4_ + fVar262 * (float)local_420._0_4_;
    fStack_8bc = auVar390._4_4_ * fVar233 +
                 fVar299 * (float)local_240._4_4_ +
                 fVar282 * (float)local_4a0._4_4_ + fVar216 * (float)local_420._4_4_;
    fStack_8b8 = auVar390._8_4_ * fVar235 +
                 fVar303 * fStack_238 + fVar283 * fStack_498 + fVar234 * fStack_418;
    fStack_8b4 = auVar390._12_4_ * fVar256 +
                 fVar307 * fStack_234 + fVar284 * fStack_494 + fVar255 * fStack_414;
    fStack_8b0 = auVar390._16_4_ * fVar260 +
                 fVar311 * fStack_230 + fVar285 * fStack_490 + fVar259 * fStack_410;
    fStack_8ac = auVar390._20_4_ * fVar264 +
                 fVar315 * fStack_22c + fVar286 * fStack_48c + fVar263 * fStack_40c;
    fStack_8a8 = auVar390._24_4_ * fVar268 +
                 fVar319 * fStack_228 + fVar287 * fStack_488 + fVar267 * fStack_408;
    fStack_8a4 = fVar323 + fVar331;
    fVar289 = (float)local_1e0._0_4_ * fVar266 +
              (float)local_260._0_4_ * fVar288 +
              fVar270 * (float)local_4c0._0_4_ + fVar262 * (float)local_440._0_4_;
    fVar300 = (float)local_1e0._4_4_ * fVar233 +
              (float)local_260._4_4_ * fVar299 +
              fVar282 * (float)local_4c0._4_4_ + fVar216 * (float)local_440._4_4_;
    fVar304 = fStack_1d8 * fVar235 +
              fStack_258 * fVar303 + fVar283 * fStack_4b8 + fVar234 * fStack_438;
    fVar308 = fStack_1d4 * fVar256 +
              fStack_254 * fVar307 + fVar284 * fStack_4b4 + fVar255 * fStack_434;
    fVar312 = fStack_1d0 * fVar260 +
              fStack_250 * fVar311 + fVar285 * fStack_4b0 + fVar259 * fStack_430;
    fVar316 = fStack_1cc * fVar264 +
              fStack_24c * fVar315 + fVar286 * fStack_4ac + fVar263 * fStack_42c;
    fVar320 = fStack_1c8 * fVar268 +
              fStack_248 * fVar319 + fVar287 * fStack_4a8 + fVar267 * fStack_428;
    fVar324 = fStack_8a4 + fVar366 + 12.166667;
    local_8a0 = (float)local_200._0_4_ * fVar266 +
                (float)local_280._0_4_ * fVar288 +
                fVar270 * (float)local_4e0._0_4_ + fVar262 * (float)local_460._0_4_;
    fStack_89c = (float)local_200._4_4_ * fVar233 +
                 (float)local_280._4_4_ * fVar299 +
                 fVar282 * (float)local_4e0._4_4_ + fVar216 * (float)local_460._4_4_;
    fStack_898 = fStack_1f8 * fVar235 +
                 fStack_278 * fVar303 + fVar283 * fStack_4d8 + fVar234 * fStack_458;
    aStack_894.w = fStack_1f4 * fVar256 +
                   fStack_274 * fVar307 + fVar284 * fStack_4d4 + fVar255 * fStack_454;
    fStack_890 = fStack_1f0 * fVar260 +
                 fStack_270 * fVar311 + fVar285 * fStack_4d0 + fVar259 * fStack_450;
    fStack_88c = fStack_1ec * fVar264 +
                 fStack_26c * fVar315 + fVar286 * fStack_4cc + fVar263 * fStack_44c;
    fStack_888 = fStack_1e8 * fVar268 +
                 fStack_268 * fVar319 + fVar287 * fStack_4c8 + fVar267 * fStack_448;
    fStack_884 = fVar324 + fVar366 + auVar371._28_4_ + 12.0;
    local_b20._0_4_ =
         (float)local_220._0_4_ * fVar266 +
         fVar288 * (float)local_400._0_4_ +
         fVar262 * (float)local_480._0_4_ + fVar270 * (float)local_500._0_4_;
    local_b20._4_4_ =
         (float)local_220._4_4_ * fVar233 +
         fVar299 * (float)local_400._4_4_ +
         fVar216 * (float)local_480._4_4_ + fVar282 * (float)local_500._4_4_;
    fStack_b18 = fStack_218 * fVar235 +
                 fVar303 * fStack_3f8 + fVar234 * fStack_478 + fVar283 * fStack_4f8;
    fStack_b14 = fStack_214 * fVar256 +
                 fVar307 * fStack_3f4 + fVar255 * fStack_474 + fVar284 * fStack_4f4;
    fStack_b10 = fStack_210 * fVar260 +
                 fVar311 * fStack_3f0 + fVar259 * fStack_470 + fVar285 * fStack_4f0;
    fStack_b0c = fStack_20c * fVar264 +
                 fVar315 * fStack_3ec + fVar263 * fStack_46c + fVar286 * fStack_4ec;
    fStack_b08 = fStack_208 * fVar268 +
                 fVar319 * fStack_3e8 + fVar267 * fStack_468 + fVar287 * fStack_4e8;
    fStack_b04 = auVar249._28_4_ + fVar323 + fVar330 + auVar281._28_4_;
    auVar22._4_4_ = auVar187._4_4_ * -auVar187._4_4_;
    auVar22._0_4_ = auVar187._0_4_ * -auVar187._0_4_;
    auVar22._8_4_ = auVar187._8_4_ * -auVar187._8_4_;
    auVar22._12_4_ = auVar187._12_4_ * -auVar187._12_4_;
    auVar22._16_4_ = auVar187._16_4_ * -auVar187._16_4_;
    auVar22._20_4_ = auVar187._20_4_ * -auVar187._20_4_;
    auVar22._24_4_ = auVar187._24_4_ * -auVar187._24_4_;
    auVar22._28_4_ = auVar187._28_4_;
    auVar23._4_4_ = fVar252 * 4.0;
    auVar23._0_4_ = fVar250 * 4.0;
    auVar23._8_4_ = fVar254 * 4.0;
    auVar23._12_4_ = fVar258 * 4.0;
    auVar23._16_4_ = fVar236 * 4.0;
    auVar23._20_4_ = fVar237 * 4.0;
    auVar23._24_4_ = fVar238 * 4.0;
    auVar23._28_4_ = fVar193;
    auVar102 = vsubps_avx(auVar22,auVar23);
    fVar267 = fVar210 * -fVar210 * 0.5;
    fVar268 = fVar211 * -fVar211 * 0.5;
    fVar270 = fVar212 * -fVar212 * 0.5;
    fVar282 = fVar213 * -fVar213 * 0.5;
    fVar283 = fVar214 * -fVar214 * 0.5;
    fVar284 = fVar215 * -fVar215 * 0.5;
    fVar285 = fVar239 * -fVar239 * 0.5;
    fVar234 = auVar102._0_4_ * 0.5;
    fVar235 = auVar102._4_4_ * 0.5;
    fVar255 = auVar102._8_4_ * 0.5;
    fVar259 = auVar102._12_4_ * 0.5;
    fVar260 = auVar102._16_4_ * 0.5;
    fVar263 = auVar102._20_4_ * 0.5;
    fVar264 = auVar102._24_4_ * 0.5;
    fVar262 = (fVar210 * fVar210 + fVar250 * 4.0) * 0.5;
    fVar266 = (fVar211 * fVar211 + fVar252 * 4.0) * 0.5;
    fVar216 = (fVar212 * fVar212 + fVar254 * 4.0) * 0.5;
    fVar233 = (fVar213 * fVar213 + fVar258 * 4.0) * 0.5;
    fVar236 = (fVar214 * fVar214 + fVar236 * 4.0) * 0.5;
    fVar237 = (fVar215 * fVar215 + fVar237 * 4.0) * 0.5;
    fVar238 = (fVar239 * fVar239 + fVar238 * 4.0) * 0.5;
    fVar210 = auVar187._0_4_ * auVar187._0_4_ * 0.5;
    fVar211 = auVar187._4_4_ * auVar187._4_4_ * 0.5;
    fVar212 = auVar187._8_4_ * auVar187._8_4_ * 0.5;
    fVar239 = auVar187._12_4_ * auVar187._12_4_ * 0.5;
    fVar250 = auVar187._16_4_ * auVar187._16_4_ * 0.5;
    fVar252 = auVar187._20_4_ * auVar187._20_4_ * 0.5;
    fVar258 = auVar187._24_4_ * auVar187._24_4_ * 0.5;
    fVar256 = auVar102._28_4_ + fVar170 + fVar193 + fVar331 + fVar193;
    auVar175 = vpermilps_avx(ZEXT416((uint)(auVar18._0_4_ * 0.04761905)),0);
    fVar213 = auVar175._0_4_;
    fVar290 = fVar213 * (auVar390._0_4_ * fVar267 +
                        (float)local_240._0_4_ * fVar234 +
                        fVar262 * (float)local_420._0_4_ + fVar210 * (float)local_4a0._0_4_);
    fVar214 = auVar175._4_4_;
    fVar301 = fVar214 * (auVar390._4_4_ * fVar268 +
                        (float)local_240._4_4_ * fVar235 +
                        fVar266 * (float)local_420._4_4_ + fVar211 * (float)local_4a0._4_4_);
    local_a40._4_4_ = fVar301;
    local_a40._0_4_ = fVar290;
    fVar215 = auVar175._8_4_;
    fVar305 = fVar215 * (auVar390._8_4_ * fVar270 +
                        fStack_238 * fVar255 + fVar216 * fStack_418 + fVar212 * fStack_498);
    local_a40._8_4_ = fVar305;
    fVar254 = auVar175._12_4_;
    fVar309 = fVar254 * (auVar390._12_4_ * fVar282 +
                        fStack_234 * fVar259 + fVar233 * fStack_414 + fVar239 * fStack_494);
    local_a40._12_4_ = fVar309;
    fVar313 = fVar213 * (auVar390._16_4_ * fVar283 +
                        fStack_230 * fVar260 + fVar236 * fStack_410 + fVar250 * fStack_490);
    local_a40._16_4_ = fVar313;
    fVar317 = fVar214 * (auVar390._20_4_ * fVar284 +
                        fStack_22c * fVar263 + fVar237 * fStack_40c + fVar252 * fStack_48c);
    local_a40._20_4_ = fVar317;
    fVar321 = fVar215 * (auVar390._24_4_ * fVar285 +
                        fStack_228 * fVar264 + fVar238 * fStack_408 + fVar258 * fStack_488);
    local_a40._24_4_ = fVar321;
    local_a40._28_4_ = fStack_884 + fVar331;
    fVar332 = fVar213 * ((float)local_1e0._0_4_ * fVar267 +
                        (float)local_260._0_4_ * fVar234 +
                        fVar262 * (float)local_440._0_4_ + fVar210 * (float)local_4c0._0_4_);
    fVar341 = fVar214 * ((float)local_1e0._4_4_ * fVar268 +
                        (float)local_260._4_4_ * fVar235 +
                        fVar266 * (float)local_440._4_4_ + fVar211 * (float)local_4c0._4_4_);
    local_9c0._4_4_ = fVar341;
    local_9c0._0_4_ = fVar332;
    fVar342 = fVar215 * (fStack_1d8 * fVar270 +
                        fStack_258 * fVar255 + fVar216 * fStack_438 + fVar212 * fStack_4b8);
    local_9c0._8_4_ = fVar342;
    fVar343 = fVar254 * (fStack_1d4 * fVar282 +
                        fStack_254 * fVar259 + fVar233 * fStack_434 + fVar239 * fStack_4b4);
    local_9c0._12_4_ = fVar343;
    fVar344 = fVar213 * (fStack_1d0 * fVar283 +
                        fStack_250 * fVar260 + fVar236 * fStack_430 + fVar250 * fStack_4b0);
    local_9c0._16_4_ = fVar344;
    fVar345 = fVar214 * (fStack_1cc * fVar284 +
                        fStack_24c * fVar263 + fVar237 * fStack_42c + fVar252 * fStack_4ac);
    local_9c0._20_4_ = fVar345;
    fVar346 = fVar215 * (fStack_1c8 * fVar285 +
                        fStack_248 * fVar264 + fVar238 * fStack_428 + fVar258 * fStack_4a8);
    local_9c0._24_4_ = fVar346;
    local_9c0._28_4_ = uStack_1e4;
    fVar347 = fVar213 * ((float)local_200._0_4_ * fVar267 +
                        fVar210 * (float)local_4e0._0_4_ + fVar262 * (float)local_460._0_4_ +
                        (float)local_280._0_4_ * fVar234);
    fVar354 = fVar214 * ((float)local_200._4_4_ * fVar268 +
                        fVar211 * (float)local_4e0._4_4_ + fVar266 * (float)local_460._4_4_ +
                        (float)local_280._4_4_ * fVar235);
    local_940._4_4_ = fVar354;
    local_940._0_4_ = fVar347;
    fVar356 = fVar215 * (fStack_1f8 * fVar270 +
                        fVar212 * fStack_4d8 + fVar216 * fStack_458 + fStack_278 * fVar255);
    local_940._8_4_ = fVar356;
    fVar358 = fVar254 * (fStack_1f4 * fVar282 +
                        fVar239 * fStack_4d4 + fVar233 * fStack_454 + fStack_274 * fVar259);
    local_940._12_4_ = fVar358;
    fVar360 = fVar213 * (fStack_1f0 * fVar283 +
                        fVar250 * fStack_4d0 + fVar236 * fStack_450 + fStack_270 * fVar260);
    local_940._16_4_ = fVar360;
    fVar362 = fVar214 * (fStack_1ec * fVar284 +
                        fVar252 * fStack_4cc + fVar237 * fStack_44c + fStack_26c * fVar263);
    local_940._20_4_ = fVar362;
    fVar364 = fVar215 * (fStack_1e8 * fVar285 +
                        fVar258 * fStack_4c8 + fVar238 * fStack_448 + fStack_268 * fVar264);
    local_940._24_4_ = fVar364;
    local_940._28_4_ = fStack_204;
    fVar262 = fVar213 * ((float)local_220._0_4_ * fVar267 +
                        fVar234 * (float)local_400._0_4_ +
                        fVar210 * (float)local_500._0_4_ + fVar262 * (float)local_480._0_4_);
    fVar234 = fVar214 * ((float)local_220._4_4_ * fVar268 +
                        fVar235 * (float)local_400._4_4_ +
                        fVar211 * (float)local_500._4_4_ + fVar266 * (float)local_480._4_4_);
    auVar24._4_4_ = fVar234;
    auVar24._0_4_ = fVar262;
    fVar235 = fVar215 * (fStack_218 * fVar270 +
                        fVar255 * fStack_3f8 + fVar212 * fStack_4f8 + fVar216 * fStack_478);
    auVar24._8_4_ = fVar235;
    fVar254 = fVar254 * (fStack_214 * fVar282 +
                        fVar259 * fStack_3f4 + fVar239 * fStack_4f4 + fVar233 * fStack_474);
    auVar24._12_4_ = fVar254;
    fVar213 = fVar213 * (fStack_210 * fVar283 +
                        fVar260 * fStack_3f0 + fVar250 * fStack_4f0 + fVar236 * fStack_470);
    auVar24._16_4_ = fVar213;
    fVar214 = fVar214 * (fStack_20c * fVar284 +
                        fVar263 * fStack_3ec + fVar252 * fStack_4ec + fVar237 * fStack_46c);
    auVar24._20_4_ = fVar214;
    fVar215 = fVar215 * (fStack_208 * fVar285 +
                        fVar264 * fStack_3e8 + fVar258 * fStack_4e8 + fVar238 * fStack_468);
    auVar24._24_4_ = fVar215;
    auVar24._28_4_ = fVar256;
    auVar76._4_4_ = fVar300;
    auVar76._0_4_ = fVar289;
    auVar76._8_4_ = fVar304;
    auVar76._12_4_ = fVar308;
    auVar76._16_4_ = fVar312;
    auVar76._20_4_ = fVar316;
    auVar76._24_4_ = fVar320;
    auVar76._28_4_ = fVar324;
    auVar102 = vperm2f128_avx(auVar76,auVar76,1);
    auVar102 = vshufps_avx(auVar102,auVar76,0x30);
    auVar337 = vshufps_avx(auVar76,auVar102,0x29);
    auVar81._4_4_ = fStack_89c;
    auVar81._0_4_ = local_8a0;
    auVar81._8_4_ = fStack_898;
    auVar81._12_4_ = aStack_894;
    auVar81._16_4_ = fStack_890;
    auVar81._20_4_ = fStack_88c;
    auVar81._24_4_ = fStack_888;
    auVar81._28_4_ = fStack_884;
    auVar102 = vperm2f128_avx(auVar81,auVar81,1);
    auVar102 = vshufps_avx(auVar102,auVar81,0x30);
    local_8e0 = vshufps_avx(auVar81,auVar102,0x29);
    auVar108 = vsubps_avx(_local_b20,auVar24);
    auVar102 = vperm2f128_avx(auVar108,auVar108,1);
    auVar102 = vshufps_avx(auVar102,auVar108,0x30);
    _local_840 = vshufps_avx(auVar108,auVar102,0x29);
    local_2c0 = vsubps_avx(auVar337,auVar76);
    local_700 = vsubps_avx(local_8e0,auVar81);
    fVar210 = local_2c0._0_4_;
    fVar239 = local_2c0._4_4_;
    auVar25._4_4_ = fVar354 * fVar239;
    auVar25._0_4_ = fVar347 * fVar210;
    fVar266 = local_2c0._8_4_;
    auVar25._8_4_ = fVar356 * fVar266;
    fVar237 = local_2c0._12_4_;
    auVar25._12_4_ = fVar358 * fVar237;
    fVar263 = local_2c0._16_4_;
    auVar25._16_4_ = fVar360 * fVar263;
    fVar283 = local_2c0._20_4_;
    auVar25._20_4_ = fVar362 * fVar283;
    fVar299 = local_2c0._24_4_;
    auVar25._24_4_ = fVar364 * fVar299;
    auVar25._28_4_ = auVar108._28_4_;
    fVar211 = local_700._0_4_;
    fVar250 = local_700._4_4_;
    auVar26._4_4_ = fVar341 * fVar250;
    auVar26._0_4_ = fVar332 * fVar211;
    fVar216 = local_700._8_4_;
    auVar26._8_4_ = fVar342 * fVar216;
    fVar238 = local_700._12_4_;
    auVar26._12_4_ = fVar343 * fVar238;
    fVar264 = local_700._16_4_;
    auVar26._16_4_ = fVar344 * fVar264;
    fVar284 = local_700._20_4_;
    auVar26._20_4_ = fVar345 * fVar284;
    fVar303 = local_700._24_4_;
    auVar26._24_4_ = fVar346 * fVar303;
    auVar26._28_4_ = auVar102._28_4_;
    auVar14 = vsubps_avx(auVar26,auVar25);
    auVar78._4_4_ = fStack_8bc;
    auVar78._0_4_ = local_8c0;
    auVar78._8_4_ = fStack_8b8;
    auVar78._12_4_ = fStack_8b4;
    auVar78._16_4_ = fStack_8b0;
    auVar78._20_4_ = fStack_8ac;
    auVar78._24_4_ = fStack_8a8;
    auVar78._28_4_ = fStack_8a4;
    auVar102 = vperm2f128_avx(auVar78,auVar78,1);
    auVar102 = vshufps_avx(auVar102,auVar78,0x30);
    local_a60 = vshufps_avx(auVar78,auVar102,0x29);
    local_760 = vsubps_avx(local_a60,auVar78);
    auVar27._4_4_ = fVar301 * fVar250;
    auVar27._0_4_ = fVar290 * fVar211;
    auVar27._8_4_ = fVar305 * fVar216;
    auVar27._12_4_ = fVar309 * fVar238;
    auVar27._16_4_ = fVar313 * fVar264;
    auVar27._20_4_ = fVar317 * fVar284;
    auVar27._24_4_ = fVar321 * fVar303;
    auVar27._28_4_ = auVar102._28_4_;
    fVar212 = local_760._0_4_;
    fVar252 = local_760._4_4_;
    auVar28._4_4_ = fVar354 * fVar252;
    auVar28._0_4_ = fVar347 * fVar212;
    fVar233 = local_760._8_4_;
    auVar28._8_4_ = fVar356 * fVar233;
    fVar255 = local_760._12_4_;
    auVar28._12_4_ = fVar358 * fVar255;
    fVar267 = local_760._16_4_;
    auVar28._16_4_ = fVar360 * fVar267;
    fVar285 = local_760._20_4_;
    auVar28._20_4_ = fVar362 * fVar285;
    fVar307 = local_760._24_4_;
    auVar28._24_4_ = fVar364 * fVar307;
    auVar28._28_4_ = local_8e0._28_4_;
    auVar15 = vsubps_avx(auVar28,auVar27);
    auVar29._4_4_ = fVar341 * fVar252;
    auVar29._0_4_ = fVar332 * fVar212;
    auVar29._8_4_ = fVar342 * fVar233;
    auVar29._12_4_ = fVar343 * fVar255;
    auVar29._16_4_ = fVar344 * fVar267;
    auVar29._20_4_ = fVar345 * fVar285;
    auVar29._24_4_ = fVar346 * fVar307;
    auVar29._28_4_ = local_8e0._28_4_;
    auVar30._4_4_ = fVar301 * fVar239;
    auVar30._0_4_ = fVar290 * fVar210;
    auVar30._8_4_ = fVar305 * fVar266;
    auVar30._12_4_ = fVar309 * fVar237;
    auVar30._16_4_ = fVar313 * fVar263;
    auVar30._20_4_ = fVar317 * fVar283;
    auVar30._24_4_ = fVar321 * fVar299;
    auVar30._28_4_ = fVar331;
    auVar189 = vsubps_avx(auVar30,auVar29);
    fVar193 = auVar189._28_4_;
    fVar258 = auVar15._28_4_ + fVar193;
    auVar188._0_4_ = fVar212 * fVar212 + fVar210 * fVar210 + fVar211 * fVar211;
    auVar188._4_4_ = fVar252 * fVar252 + fVar239 * fVar239 + fVar250 * fVar250;
    auVar188._8_4_ = fVar233 * fVar233 + fVar266 * fVar266 + fVar216 * fVar216;
    auVar188._12_4_ = fVar255 * fVar255 + fVar237 * fVar237 + fVar238 * fVar238;
    auVar188._16_4_ = fVar267 * fVar267 + fVar263 * fVar263 + fVar264 * fVar264;
    auVar188._20_4_ = fVar285 * fVar285 + fVar283 * fVar283 + fVar284 * fVar284;
    auVar188._24_4_ = fVar307 * fVar307 + fVar299 * fVar299 + fVar303 * fVar303;
    auVar188._28_4_ = fVar193 + fVar193 + fVar258;
    auVar102 = vrcpps_avx(auVar188);
    fVar236 = auVar102._0_4_;
    fVar259 = auVar102._4_4_;
    auVar31._4_4_ = fVar259 * auVar188._4_4_;
    auVar31._0_4_ = fVar236 * auVar188._0_4_;
    fVar260 = auVar102._8_4_;
    auVar31._8_4_ = fVar260 * auVar188._8_4_;
    fVar268 = auVar102._12_4_;
    auVar31._12_4_ = fVar268 * auVar188._12_4_;
    fVar270 = auVar102._16_4_;
    auVar31._16_4_ = fVar270 * auVar188._16_4_;
    fVar282 = auVar102._20_4_;
    auVar31._20_4_ = fVar282 * auVar188._20_4_;
    fVar286 = auVar102._24_4_;
    auVar31._24_4_ = fVar286 * auVar188._24_4_;
    auVar31._28_4_ = fVar331;
    auVar369._8_4_ = 0x3f800000;
    auVar369._0_8_ = 0x3f8000003f800000;
    auVar369._12_4_ = 0x3f800000;
    auVar369._16_4_ = 0x3f800000;
    auVar369._20_4_ = 0x3f800000;
    auVar369._24_4_ = 0x3f800000;
    auVar369._28_4_ = 0x3f800000;
    auVar16 = vsubps_avx(auVar369,auVar31);
    fVar236 = auVar16._0_4_ * fVar236 + fVar236;
    fVar259 = auVar16._4_4_ * fVar259 + fVar259;
    fVar260 = auVar16._8_4_ * fVar260 + fVar260;
    fVar268 = auVar16._12_4_ * fVar268 + fVar268;
    fVar270 = auVar16._16_4_ * fVar270 + fVar270;
    fVar282 = auVar16._20_4_ * fVar282 + fVar282;
    fVar286 = auVar16._24_4_ * fVar286 + fVar286;
    auVar108 = vperm2f128_avx(local_9c0,local_9c0,1);
    auVar108 = vshufps_avx(auVar108,local_9c0,0x30);
    local_a80 = vshufps_avx(local_9c0,auVar108,0x29);
    auVar108 = vperm2f128_avx(local_940,local_940,1);
    auVar108 = vshufps_avx(auVar108,local_940,0x30);
    local_780 = vshufps_avx(local_940,auVar108,0x29);
    fVar348 = local_780._0_4_;
    fVar355 = local_780._4_4_;
    auVar32._4_4_ = fVar355 * fVar239;
    auVar32._0_4_ = fVar348 * fVar210;
    fVar357 = local_780._8_4_;
    auVar32._8_4_ = fVar357 * fVar266;
    fVar359 = local_780._12_4_;
    auVar32._12_4_ = fVar359 * fVar237;
    fVar361 = local_780._16_4_;
    auVar32._16_4_ = fVar361 * fVar263;
    fVar363 = local_780._20_4_;
    auVar32._20_4_ = fVar363 * fVar283;
    fVar365 = local_780._24_4_;
    auVar32._24_4_ = fVar365 * fVar299;
    auVar32._28_4_ = auVar108._28_4_;
    fVar367 = local_a80._0_4_;
    fVar372 = local_a80._4_4_;
    auVar33._4_4_ = fVar372 * fVar250;
    auVar33._0_4_ = fVar367 * fVar211;
    fVar373 = local_a80._8_4_;
    auVar33._8_4_ = fVar373 * fVar216;
    fVar374 = local_a80._12_4_;
    auVar33._12_4_ = fVar374 * fVar238;
    fVar375 = local_a80._16_4_;
    auVar33._16_4_ = fVar375 * fVar264;
    fVar376 = local_a80._20_4_;
    auVar33._20_4_ = fVar376 * fVar284;
    fVar377 = local_a80._24_4_;
    auVar33._24_4_ = fVar377 * fVar303;
    auVar33._28_4_ = uStack_1e4;
    auVar17 = vsubps_avx(auVar33,auVar32);
    auVar108 = vperm2f128_avx(local_a40,local_a40,1);
    auVar108 = vshufps_avx(auVar108,local_a40,0x30);
    local_960 = vshufps_avx(local_a40,auVar108,0x29);
    fVar291 = local_960._0_4_;
    fVar302 = local_960._4_4_;
    auVar34._4_4_ = fVar302 * fVar250;
    auVar34._0_4_ = fVar291 * fVar211;
    fVar306 = local_960._8_4_;
    auVar34._8_4_ = fVar306 * fVar216;
    fVar310 = local_960._12_4_;
    auVar34._12_4_ = fVar310 * fVar238;
    fVar314 = local_960._16_4_;
    auVar34._16_4_ = fVar314 * fVar264;
    fVar318 = local_960._20_4_;
    auVar34._20_4_ = fVar318 * fVar284;
    fVar322 = local_960._24_4_;
    auVar34._24_4_ = fVar322 * fVar303;
    auVar34._28_4_ = auVar108._28_4_;
    auVar35._4_4_ = fVar355 * fVar252;
    auVar35._0_4_ = fVar348 * fVar212;
    auVar35._8_4_ = fVar357 * fVar233;
    auVar35._12_4_ = fVar359 * fVar255;
    auVar35._16_4_ = fVar361 * fVar267;
    auVar35._20_4_ = fVar363 * fVar285;
    uVar90 = local_780._28_4_;
    auVar35._24_4_ = fVar365 * fVar307;
    auVar35._28_4_ = uVar90;
    auVar108 = vsubps_avx(auVar35,auVar34);
    auVar36._4_4_ = fVar372 * fVar252;
    auVar36._0_4_ = fVar367 * fVar212;
    auVar36._8_4_ = fVar373 * fVar233;
    auVar36._12_4_ = fVar374 * fVar255;
    auVar36._16_4_ = fVar375 * fVar267;
    auVar36._20_4_ = fVar376 * fVar285;
    auVar36._24_4_ = fVar377 * fVar307;
    auVar36._28_4_ = uVar90;
    auVar37._4_4_ = fVar302 * fVar239;
    auVar37._0_4_ = fVar291 * fVar210;
    auVar37._8_4_ = fVar306 * fVar266;
    auVar37._12_4_ = fVar310 * fVar237;
    auVar37._16_4_ = fVar314 * fVar263;
    auVar37._20_4_ = fVar318 * fVar283;
    auVar37._24_4_ = fVar322 * fVar299;
    auVar37._28_4_ = local_a80._28_4_;
    auVar336 = vsubps_avx(auVar37,auVar36);
    fVar193 = auVar336._28_4_;
    fVar288 = auVar108._28_4_ + fVar193;
    auVar38._4_4_ =
         (auVar14._4_4_ * auVar14._4_4_ +
         auVar15._4_4_ * auVar15._4_4_ + auVar189._4_4_ * auVar189._4_4_) * fVar259;
    auVar38._0_4_ =
         (auVar14._0_4_ * auVar14._0_4_ +
         auVar15._0_4_ * auVar15._0_4_ + auVar189._0_4_ * auVar189._0_4_) * fVar236;
    auVar38._8_4_ =
         (auVar14._8_4_ * auVar14._8_4_ +
         auVar15._8_4_ * auVar15._8_4_ + auVar189._8_4_ * auVar189._8_4_) * fVar260;
    auVar38._12_4_ =
         (auVar14._12_4_ * auVar14._12_4_ +
         auVar15._12_4_ * auVar15._12_4_ + auVar189._12_4_ * auVar189._12_4_) * fVar268;
    auVar38._16_4_ =
         (auVar14._16_4_ * auVar14._16_4_ +
         auVar15._16_4_ * auVar15._16_4_ + auVar189._16_4_ * auVar189._16_4_) * fVar270;
    auVar38._20_4_ =
         (auVar14._20_4_ * auVar14._20_4_ +
         auVar15._20_4_ * auVar15._20_4_ + auVar189._20_4_ * auVar189._20_4_) * fVar282;
    auVar38._24_4_ =
         (auVar14._24_4_ * auVar14._24_4_ +
         auVar15._24_4_ * auVar15._24_4_ + auVar189._24_4_ * auVar189._24_4_) * fVar286;
    auVar38._28_4_ = auVar14._28_4_ + fVar258;
    auVar39._4_4_ =
         (auVar17._4_4_ * auVar17._4_4_ +
         auVar108._4_4_ * auVar108._4_4_ + auVar336._4_4_ * auVar336._4_4_) * fVar259;
    auVar39._0_4_ =
         (auVar17._0_4_ * auVar17._0_4_ +
         auVar108._0_4_ * auVar108._0_4_ + auVar336._0_4_ * auVar336._0_4_) * fVar236;
    auVar39._8_4_ =
         (auVar17._8_4_ * auVar17._8_4_ +
         auVar108._8_4_ * auVar108._8_4_ + auVar336._8_4_ * auVar336._8_4_) * fVar260;
    auVar39._12_4_ =
         (auVar17._12_4_ * auVar17._12_4_ +
         auVar108._12_4_ * auVar108._12_4_ + auVar336._12_4_ * auVar336._12_4_) * fVar268;
    auVar39._16_4_ =
         (auVar17._16_4_ * auVar17._16_4_ +
         auVar108._16_4_ * auVar108._16_4_ + auVar336._16_4_ * auVar336._16_4_) * fVar270;
    auVar39._20_4_ =
         (auVar17._20_4_ * auVar17._20_4_ +
         auVar108._20_4_ * auVar108._20_4_ + auVar336._20_4_ * auVar336._20_4_) * fVar282;
    auVar39._24_4_ =
         (auVar17._24_4_ * auVar17._24_4_ +
         auVar108._24_4_ * auVar108._24_4_ + auVar336._24_4_ * auVar336._24_4_) * fVar286;
    auVar39._28_4_ = auVar16._28_4_ + auVar102._28_4_;
    auVar102 = vmaxps_avx(auVar38,auVar39);
    auVar108 = vperm2f128_avx(_local_b20,_local_b20,1);
    auVar108 = vshufps_avx(auVar108,_local_b20,0x30);
    local_920 = vshufps_avx(_local_b20,auVar108,0x29);
    local_6a0._0_4_ = (float)local_b20._0_4_ + fVar262;
    local_6a0._4_4_ = (float)local_b20._4_4_ + fVar234;
    local_6a0._8_4_ = fStack_b18 + fVar235;
    local_6a0._12_4_ = fStack_b14 + fVar254;
    local_6a0._16_4_ = fStack_b10 + fVar213;
    local_6a0._20_4_ = fStack_b0c + fVar214;
    local_6a0._24_4_ = fStack_b08 + fVar215;
    local_6a0._28_4_ = fStack_b04 + fVar256;
    auVar108 = vmaxps_avx(_local_b20,local_6a0);
    auVar14 = vmaxps_avx(_local_840,local_920);
    auVar108 = vmaxps_avx(auVar108,auVar14);
    auVar14 = vrsqrtps_avx(auVar188);
    fVar213 = auVar14._0_4_;
    fVar214 = auVar14._4_4_;
    fVar215 = auVar14._8_4_;
    fVar254 = auVar14._12_4_;
    fVar258 = auVar14._16_4_;
    fVar262 = auVar14._20_4_;
    fVar234 = auVar14._24_4_;
    auVar40._4_4_ = fVar214 * fVar214 * fVar214 * auVar188._4_4_ * 0.5;
    auVar40._0_4_ = fVar213 * fVar213 * fVar213 * auVar188._0_4_ * 0.5;
    auVar40._8_4_ = fVar215 * fVar215 * fVar215 * auVar188._8_4_ * 0.5;
    auVar40._12_4_ = fVar254 * fVar254 * fVar254 * auVar188._12_4_ * 0.5;
    auVar40._16_4_ = fVar258 * fVar258 * fVar258 * auVar188._16_4_ * 0.5;
    auVar40._20_4_ = fVar262 * fVar262 * fVar262 * auVar188._20_4_ * 0.5;
    auVar40._24_4_ = fVar234 * fVar234 * fVar234 * auVar188._24_4_ * 0.5;
    auVar40._28_4_ = auVar188._28_4_;
    auVar41._4_4_ = fVar214 * 1.5;
    auVar41._0_4_ = fVar213 * 1.5;
    auVar41._8_4_ = fVar215 * 1.5;
    auVar41._12_4_ = fVar254 * 1.5;
    auVar41._16_4_ = fVar258 * 1.5;
    auVar41._20_4_ = fVar262 * 1.5;
    auVar41._24_4_ = fVar234 * 1.5;
    auVar41._28_4_ = auVar14._28_4_;
    local_560 = vsubps_avx(auVar41,auVar40);
    auVar77._4_4_ = fVar300;
    auVar77._0_4_ = fVar289;
    auVar77._8_4_ = fVar304;
    auVar77._12_4_ = fVar308;
    auVar77._16_4_ = fVar312;
    auVar77._20_4_ = fVar316;
    auVar77._24_4_ = fVar320;
    auVar77._28_4_ = fVar324;
    local_7a0 = vsubps_avx(ZEXT832(0) << 0x20,auVar77);
    local_7c0 = vsubps_avx(ZEXT832(0) << 0x20,auVar81);
    fVar382 = local_7c0._0_4_;
    fVar384 = local_7c0._4_4_;
    fVar385 = local_7c0._8_4_;
    fVar386 = local_7c0._12_4_;
    fVar387 = local_7c0._16_4_;
    fVar388 = local_7c0._20_4_;
    fVar389 = local_7c0._24_4_;
    fVar213 = local_7a0._0_4_;
    fVar254 = local_7a0._4_4_;
    fVar234 = local_7a0._8_4_;
    fVar256 = local_7a0._12_4_;
    fVar268 = local_7a0._16_4_;
    fVar286 = local_7a0._20_4_;
    fVar311 = local_7a0._24_4_;
    auVar189 = ZEXT832(0) << 0x20;
    auVar15 = vsubps_avx(auVar189,auVar78);
    fVar214 = auVar15._0_4_;
    fVar258 = auVar15._4_4_;
    fVar235 = auVar15._8_4_;
    fVar259 = auVar15._12_4_;
    fVar270 = auVar15._16_4_;
    fVar287 = auVar15._20_4_;
    fVar315 = auVar15._24_4_;
    auVar327._0_4_ = local_660 * fVar214 + local_680 * fVar213 + fVar382 * local_800;
    auVar327._4_4_ = fStack_65c * fVar258 + fStack_67c * fVar254 + fVar384 * fStack_7fc;
    auVar327._8_4_ = fStack_658 * fVar235 + fStack_678 * fVar234 + fVar385 * fStack_7f8;
    auVar327._12_4_ = fStack_654 * fVar259 + fStack_674 * fVar256 + fVar386 * fStack_7f4;
    auVar327._16_4_ = fStack_650 * fVar270 + fStack_670 * fVar268 + fVar387 * fStack_7f0;
    auVar327._20_4_ = fStack_64c * fVar287 + fStack_66c * fVar286 + fVar388 * fStack_7ec;
    auVar327._24_4_ = fStack_648 * fVar315 + fStack_668 * fVar311 + fVar389 * fStack_7e8;
    auVar327._28_4_ = fVar288 + auVar17._28_4_ + fVar288 + auVar14._28_4_;
    auVar334._0_4_ = fVar214 * fVar214 + fVar213 * fVar213 + fVar382 * fVar382;
    auVar334._4_4_ = fVar258 * fVar258 + fVar254 * fVar254 + fVar384 * fVar384;
    auVar334._8_4_ = fVar235 * fVar235 + fVar234 * fVar234 + fVar385 * fVar385;
    auVar334._12_4_ = fVar259 * fVar259 + fVar256 * fVar256 + fVar386 * fVar386;
    auVar334._16_4_ = fVar270 * fVar270 + fVar268 * fVar268 + fVar387 * fVar387;
    auVar334._20_4_ = fVar287 * fVar287 + fVar286 * fVar286 + fVar388 * fVar388;
    auVar334._24_4_ = fVar315 * fVar315 + fVar311 * fVar311 + fVar389 * fVar389;
    auVar334._28_4_ = fVar193 + fVar193 + fVar288;
    fVar215 = local_560._0_4_;
    fVar262 = local_560._4_4_;
    fVar236 = local_560._8_4_;
    fVar260 = local_560._12_4_;
    fVar282 = local_560._16_4_;
    fVar288 = local_560._20_4_;
    fVar319 = local_560._24_4_;
    fVar323 = local_700._28_4_;
    local_580 = local_660 * fVar215 * fVar212 +
                fVar210 * fVar215 * local_680 + fVar215 * fVar211 * local_800;
    fStack_57c = fStack_65c * fVar262 * fVar252 +
                 fVar239 * fVar262 * fStack_67c + fVar262 * fVar250 * fStack_7fc;
    fStack_578 = fStack_658 * fVar236 * fVar233 +
                 fVar266 * fVar236 * fStack_678 + fVar236 * fVar216 * fStack_7f8;
    fStack_574 = fStack_654 * fVar260 * fVar255 +
                 fVar237 * fVar260 * fStack_674 + fVar260 * fVar238 * fStack_7f4;
    fStack_570 = fStack_650 * fVar282 * fVar267 +
                 fVar263 * fVar282 * fStack_670 + fVar282 * fVar264 * fStack_7f0;
    fStack_56c = fStack_64c * fVar288 * fVar285 +
                 fVar283 * fVar288 * fStack_66c + fVar288 * fVar284 * fStack_7ec;
    fStack_568 = fStack_648 * fVar319 * fVar307 +
                 fVar299 * fVar319 * fStack_668 + fVar319 * fVar303 * fStack_7e8;
    fVar193 = fStack_644 + fVar323 + fStack_7e4;
    local_5a0._0_4_ =
         fVar214 * fVar215 * fVar212 + fVar210 * fVar215 * fVar213 + fVar382 * fVar215 * fVar211;
    local_5a0._4_4_ =
         fVar258 * fVar262 * fVar252 + fVar239 * fVar262 * fVar254 + fVar384 * fVar262 * fVar250;
    local_5a0._8_4_ =
         fVar235 * fVar236 * fVar233 + fVar266 * fVar236 * fVar234 + fVar385 * fVar236 * fVar216;
    local_5a0._12_4_ =
         fVar259 * fVar260 * fVar255 + fVar237 * fVar260 * fVar256 + fVar386 * fVar260 * fVar238;
    local_5a0._16_4_ =
         fVar270 * fVar282 * fVar267 + fVar263 * fVar282 * fVar268 + fVar387 * fVar282 * fVar264;
    local_5a0._20_4_ =
         fVar287 * fVar288 * fVar285 + fVar283 * fVar288 * fVar286 + fVar388 * fVar288 * fVar284;
    local_5a0._24_4_ =
         fVar315 * fVar319 * fVar307 + fVar299 * fVar319 * fVar311 + fVar389 * fVar319 * fVar303;
    local_5a0._28_4_ = fVar323 + fVar193;
    auVar42._4_4_ = fStack_57c * local_5a0._4_4_;
    auVar42._0_4_ = local_580 * local_5a0._0_4_;
    auVar42._8_4_ = fStack_578 * local_5a0._8_4_;
    auVar42._12_4_ = fStack_574 * local_5a0._12_4_;
    auVar42._16_4_ = fStack_570 * local_5a0._16_4_;
    auVar42._20_4_ = fStack_56c * local_5a0._20_4_;
    auVar42._24_4_ = fStack_568 * local_5a0._24_4_;
    auVar42._28_4_ = fVar193;
    auVar14 = vsubps_avx(auVar327,auVar42);
    auVar43._4_4_ = local_5a0._4_4_ * local_5a0._4_4_;
    auVar43._0_4_ = local_5a0._0_4_ * local_5a0._0_4_;
    auVar43._8_4_ = local_5a0._8_4_ * local_5a0._8_4_;
    auVar43._12_4_ = local_5a0._12_4_ * local_5a0._12_4_;
    auVar43._16_4_ = local_5a0._16_4_ * local_5a0._16_4_;
    auVar43._20_4_ = local_5a0._20_4_ * local_5a0._20_4_;
    auVar43._24_4_ = local_5a0._24_4_ * local_5a0._24_4_;
    auVar43._28_4_ = fVar323;
    _local_aa0 = vsubps_avx(auVar334,auVar43);
    local_6e0 = vsqrtps_avx(auVar102);
    fVar193 = (local_6e0._0_4_ + auVar108._0_4_) * 1.0000002;
    fVar330 = (local_6e0._4_4_ + auVar108._4_4_) * 1.0000002;
    fVar366 = (local_6e0._8_4_ + auVar108._8_4_) * 1.0000002;
    fVar113 = (local_6e0._12_4_ + auVar108._12_4_) * 1.0000002;
    fVar114 = (local_6e0._16_4_ + auVar108._16_4_) * 1.0000002;
    fVar115 = (local_6e0._20_4_ + auVar108._20_4_) * 1.0000002;
    fVar116 = (local_6e0._24_4_ + auVar108._24_4_) * 1.0000002;
    auVar44._4_4_ = fVar330 * fVar330;
    auVar44._0_4_ = fVar193 * fVar193;
    auVar44._8_4_ = fVar366 * fVar366;
    auVar44._12_4_ = fVar113 * fVar113;
    auVar44._16_4_ = fVar114 * fVar114;
    auVar44._20_4_ = fVar115 * fVar115;
    auVar44._24_4_ = fVar116 * fVar116;
    auVar44._28_4_ = local_6e0._28_4_ + auVar108._28_4_;
    local_300._0_4_ = auVar14._0_4_ + auVar14._0_4_;
    local_300._4_4_ = auVar14._4_4_ + auVar14._4_4_;
    local_300._8_4_ = auVar14._8_4_ + auVar14._8_4_;
    local_300._12_4_ = auVar14._12_4_ + auVar14._12_4_;
    local_300._16_4_ = auVar14._16_4_ + auVar14._16_4_;
    local_300._20_4_ = auVar14._20_4_ + auVar14._20_4_;
    local_300._24_4_ = auVar14._24_4_ + auVar14._24_4_;
    fVar193 = auVar14._28_4_;
    local_300._28_4_ = fVar193 + fVar193;
    auVar108 = vsubps_avx(_local_aa0,auVar44);
    auVar45._4_4_ = fStack_57c * fStack_57c;
    auVar45._0_4_ = local_580 * local_580;
    auVar45._8_4_ = fStack_578 * fStack_578;
    auVar45._12_4_ = fStack_574 * fStack_574;
    auVar45._16_4_ = fStack_570 * fStack_570;
    auVar45._20_4_ = fStack_56c * fStack_56c;
    auVar45._24_4_ = fStack_568 * fStack_568;
    auVar45._28_4_ = fVar193;
    auVar247 = vsubps_avx(local_2a0,auVar45);
    local_6c0._4_4_ = local_300._4_4_ * local_300._4_4_;
    local_6c0._0_4_ = local_300._0_4_ * local_300._0_4_;
    local_6c0._8_4_ = local_300._8_4_ * local_300._8_4_;
    local_6c0._12_4_ = local_300._12_4_ * local_300._12_4_;
    local_6c0._16_4_ = local_300._16_4_ * local_300._16_4_;
    local_6c0._20_4_ = local_300._20_4_ * local_300._20_4_;
    local_6c0._24_4_ = local_300._24_4_ * local_300._24_4_;
    local_6c0._28_4_ = local_7a0._28_4_;
    fVar193 = auVar247._0_4_;
    local_860._0_4_ = fVar193 * 4.0;
    fVar330 = auVar247._4_4_;
    local_860._4_4_ = fVar330 * 4.0;
    fVar366 = auVar247._8_4_;
    fStack_858 = fVar366 * 4.0;
    fVar113 = auVar247._12_4_;
    fStack_854 = fVar113 * 4.0;
    fVar114 = auVar247._16_4_;
    fStack_850 = fVar114 * 4.0;
    fVar115 = auVar247._20_4_;
    fStack_84c = fVar115 * 4.0;
    fVar116 = auVar247._24_4_;
    fStack_848 = fVar116 * 4.0;
    uStack_844 = 0x40800000;
    auVar46._4_4_ = auVar108._4_4_ * (float)local_860._4_4_;
    auVar46._0_4_ = auVar108._0_4_ * (float)local_860._0_4_;
    auVar46._8_4_ = auVar108._8_4_ * fStack_858;
    auVar46._12_4_ = auVar108._12_4_ * fStack_854;
    auVar46._16_4_ = auVar108._16_4_ * fStack_850;
    auVar46._20_4_ = auVar108._20_4_ * fStack_84c;
    auVar46._24_4_ = auVar108._24_4_ * fStack_848;
    auVar46._28_4_ = 0x40800000;
    auVar14 = vsubps_avx(local_6c0,auVar46);
    auVar102 = vcmpps_avx(auVar14,auVar189,5);
    auVar278._8_4_ = 0x7fffffff;
    auVar278._0_8_ = 0x7fffffff7fffffff;
    auVar278._12_4_ = 0x7fffffff;
    auVar278._16_4_ = 0x7fffffff;
    auVar278._20_4_ = 0x7fffffff;
    auVar278._24_4_ = 0x7fffffff;
    auVar278._28_4_ = 0x7fffffff;
    local_3c0 = vandps_avx(auVar45,auVar278);
    local_340._0_4_ = fVar193 + fVar193;
    local_340._4_4_ = fVar330 + fVar330;
    local_340._8_4_ = fVar366 + fVar366;
    local_340._12_4_ = fVar113 + fVar113;
    local_340._16_4_ = fVar114 + fVar114;
    local_340._20_4_ = fVar115 + fVar115;
    local_340._24_4_ = fVar116 + fVar116;
    local_340._28_4_ = auVar247._28_4_ + auVar247._28_4_;
    local_2e0 = vandps_avx(auVar247,auVar278);
    uVar75 = CONCAT44(local_300._4_4_,local_300._0_4_);
    local_320._0_8_ = uVar75 ^ 0x8000000080000000;
    local_320._8_4_ = -local_300._8_4_;
    local_320._12_4_ = -local_300._12_4_;
    local_320._16_4_ = -local_300._16_4_;
    local_320._20_4_ = -local_300._20_4_;
    local_320._24_4_ = -local_300._24_4_;
    local_320._28_4_ = -local_300._28_4_;
    auVar192 = local_320;
    if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar102 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar102 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar102 >> 0x7f,0) == '\0') &&
          (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar102 >> 0xbf,0) == '\0') &&
        (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar102[0x1f])
    {
      auVar328._8_4_ = 0x7f800000;
      auVar328._0_8_ = 0x7f8000007f800000;
      auVar328._12_4_ = 0x7f800000;
      auVar328._16_4_ = 0x7f800000;
      auVar328._20_4_ = 0x7f800000;
      auVar328._24_4_ = 0x7f800000;
      auVar328._28_4_ = 0x7f800000;
      auVar106._8_4_ = 0xff800000;
      auVar106._0_8_ = 0xff800000ff800000;
      auVar106._12_4_ = 0xff800000;
      auVar106._16_4_ = 0xff800000;
      auVar106._20_4_ = 0xff800000;
      auVar106._24_4_ = 0xff800000;
      auVar106._28_4_ = 0xff800000;
    }
    else {
      auVar17 = vsqrtps_avx(auVar14);
      auVar16 = vrcpps_avx(local_340);
      auVar189 = vcmpps_avx(auVar14,auVar189,5);
      fVar193 = auVar16._0_4_;
      fVar330 = auVar16._4_4_;
      auVar47._4_4_ = local_340._4_4_ * fVar330;
      auVar47._0_4_ = local_340._0_4_ * fVar193;
      fVar366 = auVar16._8_4_;
      auVar47._8_4_ = local_340._8_4_ * fVar366;
      fVar113 = auVar16._12_4_;
      auVar47._12_4_ = local_340._12_4_ * fVar113;
      fVar114 = auVar16._16_4_;
      auVar47._16_4_ = local_340._16_4_ * fVar114;
      fVar115 = auVar16._20_4_;
      auVar47._20_4_ = local_340._20_4_ * fVar115;
      fVar116 = auVar16._24_4_;
      auVar47._24_4_ = local_340._24_4_ * fVar116;
      auVar47._28_4_ = auVar14._28_4_;
      auVar136._8_4_ = 0x3f800000;
      auVar136._0_8_ = 0x3f8000003f800000;
      auVar136._12_4_ = 0x3f800000;
      auVar136._16_4_ = 0x3f800000;
      auVar136._20_4_ = 0x3f800000;
      auVar136._24_4_ = 0x3f800000;
      auVar136._28_4_ = 0x3f800000;
      auVar14 = vsubps_avx(auVar136,auVar47);
      fVar193 = fVar193 + fVar193 * auVar14._0_4_;
      fVar330 = fVar330 + fVar330 * auVar14._4_4_;
      fVar366 = fVar366 + fVar366 * auVar14._8_4_;
      fVar113 = fVar113 + fVar113 * auVar14._12_4_;
      fVar114 = fVar114 + fVar114 * auVar14._16_4_;
      fVar115 = fVar115 + fVar115 * auVar14._20_4_;
      fVar116 = fVar116 + fVar116 * auVar14._24_4_;
      auVar336 = vsubps_avx(local_320,auVar17);
      fVar240 = auVar336._0_4_ * fVar193;
      fVar251 = auVar336._4_4_ * fVar330;
      auVar48._4_4_ = fVar251;
      auVar48._0_4_ = fVar240;
      fVar253 = auVar336._8_4_ * fVar366;
      auVar48._8_4_ = fVar253;
      fVar257 = auVar336._12_4_ * fVar113;
      auVar48._12_4_ = fVar257;
      fVar261 = auVar336._16_4_ * fVar114;
      auVar48._16_4_ = fVar261;
      fVar265 = auVar336._20_4_ * fVar115;
      auVar48._20_4_ = fVar265;
      fVar269 = auVar336._24_4_ * fVar116;
      auVar48._24_4_ = fVar269;
      auVar48._28_4_ = auVar336._28_4_;
      auVar17 = vsubps_avx(auVar17,local_300);
      fVar193 = auVar17._0_4_ * fVar193;
      fVar330 = auVar17._4_4_ * fVar330;
      auVar49._4_4_ = fVar330;
      auVar49._0_4_ = fVar193;
      fVar366 = auVar17._8_4_ * fVar366;
      auVar49._8_4_ = fVar366;
      fVar113 = auVar17._12_4_ * fVar113;
      auVar49._12_4_ = fVar113;
      fVar114 = auVar17._16_4_ * fVar114;
      auVar49._16_4_ = fVar114;
      fVar115 = auVar17._20_4_ * fVar115;
      auVar49._20_4_ = fVar115;
      fVar116 = auVar17._24_4_ * fVar116;
      auVar49._24_4_ = fVar116;
      auVar49._28_4_ = auVar16._28_4_ + auVar14._28_4_;
      local_3a0 = fVar215 * (local_5a0._0_4_ + local_580 * fVar240);
      fStack_39c = fVar262 * (local_5a0._4_4_ + fStack_57c * fVar251);
      fStack_398 = fVar236 * (local_5a0._8_4_ + fStack_578 * fVar253);
      fStack_394 = fVar260 * (local_5a0._12_4_ + fStack_574 * fVar257);
      fStack_390 = fVar282 * (local_5a0._16_4_ + fStack_570 * fVar261);
      fStack_38c = fVar288 * (local_5a0._20_4_ + fStack_56c * fVar265);
      fStack_388 = fVar319 * (local_5a0._24_4_ + fStack_568 * fVar269);
      uStack_384 = 0x3f800000;
      local_380 = fVar215 * (local_5a0._0_4_ + local_580 * fVar193);
      fStack_37c = fVar262 * (local_5a0._4_4_ + fStack_57c * fVar330);
      fStack_378 = fVar236 * (local_5a0._8_4_ + fStack_578 * fVar366);
      fStack_374 = fVar260 * (local_5a0._12_4_ + fStack_574 * fVar113);
      fStack_370 = fVar282 * (local_5a0._16_4_ + fStack_570 * fVar114);
      fStack_36c = fVar288 * (local_5a0._20_4_ + fStack_56c * fVar115);
      fStack_368 = fVar319 * (local_5a0._24_4_ + fStack_568 * fVar116);
      fStack_364 = local_300._28_4_;
      auVar223._8_4_ = 0x7f800000;
      auVar223._0_8_ = 0x7f8000007f800000;
      auVar223._12_4_ = 0x7f800000;
      auVar223._16_4_ = 0x7f800000;
      auVar223._20_4_ = 0x7f800000;
      auVar223._24_4_ = 0x7f800000;
      auVar223._28_4_ = 0x7f800000;
      auVar328 = vblendvps_avx(auVar223,auVar48,auVar189);
      auVar224._8_4_ = 0xff800000;
      auVar224._0_8_ = 0xff800000ff800000;
      auVar224._12_4_ = 0xff800000;
      auVar224._16_4_ = 0xff800000;
      auVar224._20_4_ = 0xff800000;
      auVar224._24_4_ = 0xff800000;
      auVar224._28_4_ = 0xff800000;
      auVar106 = vblendvps_avx(auVar224,auVar49,auVar189);
      auVar14 = vmaxps_avx(local_540,local_3c0);
      auVar247._8_4_ = 0x36000000;
      auVar247._0_8_ = 0x3600000036000000;
      auVar247._12_4_ = 0x36000000;
      auVar247._16_4_ = 0x36000000;
      auVar247._20_4_ = 0x36000000;
      auVar247._24_4_ = 0x36000000;
      auVar247._28_4_ = 0x36000000;
      auVar50._4_4_ = auVar14._4_4_ * 1.9073486e-06;
      auVar50._0_4_ = auVar14._0_4_ * 1.9073486e-06;
      auVar50._8_4_ = auVar14._8_4_ * 1.9073486e-06;
      auVar50._12_4_ = auVar14._12_4_ * 1.9073486e-06;
      auVar50._16_4_ = auVar14._16_4_ * 1.9073486e-06;
      auVar50._20_4_ = auVar14._20_4_ * 1.9073486e-06;
      auVar50._24_4_ = auVar14._24_4_ * 1.9073486e-06;
      auVar50._28_4_ = auVar14._28_4_;
      auVar14 = vcmpps_avx(local_2e0,auVar50,1);
      auVar16 = auVar189 & auVar14;
      if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar16 >> 0x7f,0) != '\0') ||
            (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar16 >> 0xbf,0) != '\0') ||
          (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar16[0x1f] < '\0') {
        auVar102 = vandps_avx(auVar14,auVar189);
        auVar175 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
        auVar247 = vcmpps_avx(auVar108,_DAT_01f7b000,2);
        auVar192._8_4_ = 0xff800000;
        auVar192._0_8_ = 0xff800000ff800000;
        auVar192._12_4_ = 0xff800000;
        auVar192._16_4_ = 0xff800000;
        auVar192._20_4_ = 0xff800000;
        auVar192._24_4_ = 0xff800000;
        auVar192._28_4_ = 0xff800000;
        auVar352._8_4_ = 0x7f800000;
        auVar352._0_8_ = 0x7f8000007f800000;
        auVar352._12_4_ = 0x7f800000;
        auVar352._16_4_ = 0x7f800000;
        auVar352._20_4_ = 0x7f800000;
        auVar352._24_4_ = 0x7f800000;
        auVar352._28_4_ = 0x7f800000;
        auVar108 = vblendvps_avx(auVar352,auVar192,auVar247);
        auVar19 = vpmovsxwd_avx(auVar175);
        auVar175 = vpunpckhwd_avx(auVar175,auVar175);
        auVar231._16_16_ = auVar175;
        auVar231._0_16_ = auVar19;
        auVar328 = vblendvps_avx(auVar328,auVar108,auVar231);
        auVar108 = vblendvps_avx(auVar192,auVar352,auVar247);
        auVar106 = vblendvps_avx(auVar106,auVar108,auVar231);
        auVar166._0_8_ = auVar102._0_8_ ^ 0xffffffffffffffff;
        auVar166._8_4_ = auVar102._8_4_ ^ 0xffffffff;
        auVar166._12_4_ = auVar102._12_4_ ^ 0xffffffff;
        auVar166._16_4_ = auVar102._16_4_ ^ 0xffffffff;
        auVar166._20_4_ = auVar102._20_4_ ^ 0xffffffff;
        auVar166._24_4_ = auVar102._24_4_ ^ 0xffffffff;
        auVar166._28_4_ = auVar102._28_4_ ^ 0xffffffff;
        auVar102 = vorps_avx(auVar247,auVar166);
        auVar102 = vandps_avx(auVar189,auVar102);
      }
    }
    auVar329 = ZEXT3264(auVar328);
    auVar249 = ZEXT3264(auVar247);
    auVar371 = ZEXT3264(local_5a0);
    auVar353 = ZEXT3264(CONCAT428(fStack_7e4,
                                  CONCAT424(fStack_7e8,
                                            CONCAT420(fStack_7ec,
                                                      CONCAT416(fStack_7f0,
                                                                CONCAT412(fStack_7f4,
                                                                          CONCAT48(fStack_7f8,
                                                                                   CONCAT44(
                                                  fStack_7fc,local_800))))))));
    auVar340 = ZEXT3264(local_3c0);
    auVar281 = ZEXT3264(local_900);
    auVar232 = ZEXT3264(local_520);
    auVar108 = local_520 & auVar102;
    local_920._0_8_ = uVar88;
    if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar108 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar108 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar108 >> 0x7f,0) == '\0') &&
          (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar108 >> 0xbf,0) == '\0') &&
        (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar108[0x1f])
    {
      auVar390 = ZEXT3264(local_a20);
    }
    else {
      fStack_564 = fStack_644 + fVar323 + fStack_7e4;
      auVar175 = ZEXT416((uint)((ray->super_RayK<1>).org.field_0.m128[3] - (float)local_870._0_4_));
      auVar175 = vshufps_avx(auVar175,auVar175,0);
      auVar225._16_16_ = auVar175;
      auVar225._0_16_ = auVar175;
      auVar189 = vmaxps_avx(auVar225,auVar328);
      auVar175 = ZEXT416((uint)((ray->super_RayK<1>).tfar - (float)local_870._0_4_));
      auVar175 = vshufps_avx(auVar175,auVar175,0);
      auVar226._16_16_ = auVar175;
      auVar226._0_16_ = auVar175;
      auVar16 = vminps_avx(auVar226,auVar106);
      fVar116 = auVar15._28_4_;
      auVar137._0_4_ = local_660 * fVar290 + local_680 * fVar332 + local_800 * fVar347;
      auVar137._4_4_ = fStack_65c * fVar301 + fStack_67c * fVar341 + fStack_7fc * fVar354;
      auVar137._8_4_ = fStack_658 * fVar305 + fStack_678 * fVar342 + fStack_7f8 * fVar356;
      auVar137._12_4_ = fStack_654 * fVar309 + fStack_674 * fVar343 + fStack_7f4 * fVar358;
      auVar137._16_4_ = fStack_650 * fVar313 + fStack_670 * fVar344 + fStack_7f0 * fVar360;
      auVar137._20_4_ = fStack_64c * fVar317 + fStack_66c * fVar345 + fStack_7ec * fVar362;
      auVar137._24_4_ = fStack_648 * fVar321 + fStack_668 * fVar346 + fStack_7e8 * fVar364;
      auVar137._28_4_ = fVar116 + fVar116 + fStack_204;
      auVar108 = vrcpps_avx(auVar137);
      fVar193 = auVar108._0_4_;
      fVar323 = auVar108._4_4_;
      auVar51._4_4_ = auVar137._4_4_ * fVar323;
      auVar51._0_4_ = auVar137._0_4_ * fVar193;
      fVar330 = auVar108._8_4_;
      auVar51._8_4_ = auVar137._8_4_ * fVar330;
      fVar366 = auVar108._12_4_;
      auVar51._12_4_ = auVar137._12_4_ * fVar366;
      fVar113 = auVar108._16_4_;
      auVar51._16_4_ = auVar137._16_4_ * fVar113;
      fVar114 = auVar108._20_4_;
      auVar51._20_4_ = auVar137._20_4_ * fVar114;
      fVar115 = auVar108._24_4_;
      auVar51._24_4_ = auVar137._24_4_ * fVar115;
      auVar51._28_4_ = fStack_884 + fVar331;
      auVar379._8_4_ = 0x3f800000;
      auVar379._0_8_ = 0x3f8000003f800000;
      auVar379._12_4_ = 0x3f800000;
      auVar379._16_4_ = 0x3f800000;
      auVar379._20_4_ = 0x3f800000;
      auVar379._24_4_ = 0x3f800000;
      auVar379._28_4_ = 0x3f800000;
      auVar14 = vsubps_avx(auVar379,auVar51);
      auVar279._8_4_ = 0x7fffffff;
      auVar279._0_8_ = 0x7fffffff7fffffff;
      auVar279._12_4_ = 0x7fffffff;
      auVar279._16_4_ = 0x7fffffff;
      auVar279._20_4_ = 0x7fffffff;
      auVar279._24_4_ = 0x7fffffff;
      auVar279._28_4_ = 0x7fffffff;
      auVar108 = vandps_avx(auVar137,auVar279);
      auVar335._8_4_ = 0x219392ef;
      auVar335._0_8_ = 0x219392ef219392ef;
      auVar335._12_4_ = 0x219392ef;
      auVar335._16_4_ = 0x219392ef;
      auVar335._20_4_ = 0x219392ef;
      auVar335._24_4_ = 0x219392ef;
      auVar335._28_4_ = 0x219392ef;
      auVar108 = vcmpps_avx(auVar108,auVar335,1);
      auVar52._4_4_ =
           (fVar323 + fVar323 * auVar14._4_4_) *
           -(fVar301 * fVar258 + fVar341 * fVar254 + fVar354 * fVar384);
      auVar52._0_4_ =
           (fVar193 + fVar193 * auVar14._0_4_) *
           -(fVar290 * fVar214 + fVar332 * fVar213 + fVar347 * fVar382);
      auVar52._8_4_ =
           (fVar330 + fVar330 * auVar14._8_4_) *
           -(fVar305 * fVar235 + fVar342 * fVar234 + fVar356 * fVar385);
      auVar52._12_4_ =
           (fVar366 + fVar366 * auVar14._12_4_) *
           -(fVar309 * fVar259 + fVar343 * fVar256 + fVar358 * fVar386);
      auVar52._16_4_ =
           (fVar113 + fVar113 * auVar14._16_4_) *
           -(fVar313 * fVar270 + fVar344 * fVar268 + fVar360 * fVar387);
      auVar52._20_4_ =
           (fVar114 + fVar114 * auVar14._20_4_) *
           -(fVar317 * fVar287 + fVar345 * fVar286 + fVar362 * fVar388);
      auVar52._24_4_ =
           (fVar115 + fVar115 * auVar14._24_4_) *
           -(fVar321 * fVar315 + fVar346 * fVar311 + fVar364 * fVar389);
      auVar52._28_4_ = -(fVar116 + auVar192._28_4_ + auVar175._12_4_);
      auVar74 = ZEXT812(0);
      auVar340 = ZEXT1264(auVar74) << 0x20;
      auVar14 = vcmpps_avx(auVar137,ZEXT1232(auVar74) << 0x20,1);
      auVar15 = vorps_avx(auVar108,auVar14);
      auVar14 = vcmpps_avx(auVar137,ZEXT1232(auVar74) << 0x20,6);
      auVar14 = vorps_avx(auVar108,auVar14);
      auVar351._8_4_ = 0xff800000;
      auVar351._0_8_ = 0xff800000ff800000;
      auVar351._12_4_ = 0xff800000;
      auVar351._16_4_ = 0xff800000;
      auVar351._20_4_ = 0xff800000;
      auVar351._24_4_ = 0xff800000;
      auVar351._28_4_ = 0xff800000;
      auVar353 = ZEXT3264(auVar351);
      auVar108 = vblendvps_avx(auVar52,auVar351,auVar15);
      auVar370._8_4_ = 0x7f800000;
      auVar370._0_8_ = 0x7f8000007f800000;
      auVar370._12_4_ = 0x7f800000;
      auVar370._16_4_ = 0x7f800000;
      auVar370._20_4_ = 0x7f800000;
      auVar370._24_4_ = 0x7f800000;
      auVar370._28_4_ = 0x7f800000;
      auVar371 = ZEXT3264(auVar370);
      auVar14 = vblendvps_avx(auVar52,auVar370,auVar14);
      auVar15 = vmaxps_avx(auVar189,auVar108);
      auVar329 = ZEXT3264(CONCAT428(fStack_664,
                                    CONCAT424(fStack_668,
                                              CONCAT420(fStack_66c,
                                                        CONCAT416(fStack_670,
                                                                  CONCAT412(fStack_674,
                                                                            CONCAT48(fStack_678,
                                                                                     CONCAT44(
                                                  fStack_67c,local_680))))))));
      auVar189 = vminps_avx(auVar16,auVar14);
      auVar336 = ZEXT1232(auVar74) << 0x20;
      auVar108 = vsubps_avx(auVar336,auVar337);
      auVar14 = vsubps_avx(auVar336,local_8e0);
      auVar53._4_4_ = auVar14._4_4_ * -fVar355;
      auVar53._0_4_ = auVar14._0_4_ * -fVar348;
      auVar53._8_4_ = auVar14._8_4_ * -fVar357;
      auVar53._12_4_ = auVar14._12_4_ * -fVar359;
      auVar53._16_4_ = auVar14._16_4_ * -fVar361;
      auVar53._20_4_ = auVar14._20_4_ * -fVar363;
      auVar53._24_4_ = auVar14._24_4_ * -fVar365;
      auVar53._28_4_ = auVar14._28_4_;
      auVar54._4_4_ = fVar372 * auVar108._4_4_;
      auVar54._0_4_ = fVar367 * auVar108._0_4_;
      auVar54._8_4_ = fVar373 * auVar108._8_4_;
      auVar54._12_4_ = fVar374 * auVar108._12_4_;
      auVar54._16_4_ = fVar375 * auVar108._16_4_;
      auVar54._20_4_ = fVar376 * auVar108._20_4_;
      auVar54._24_4_ = fVar377 * auVar108._24_4_;
      auVar54._28_4_ = auVar108._28_4_;
      auVar108 = vsubps_avx(auVar53,auVar54);
      auVar14 = vsubps_avx(auVar336,local_a60);
      auVar55._4_4_ = fVar302 * auVar14._4_4_;
      auVar55._0_4_ = fVar291 * auVar14._0_4_;
      auVar55._8_4_ = fVar306 * auVar14._8_4_;
      auVar55._12_4_ = fVar310 * auVar14._12_4_;
      auVar55._16_4_ = fVar314 * auVar14._16_4_;
      auVar55._20_4_ = fVar318 * auVar14._20_4_;
      uVar1 = auVar14._28_4_;
      auVar55._24_4_ = fVar322 * auVar14._24_4_;
      auVar55._28_4_ = uVar1;
      auVar337 = vsubps_avx(auVar108,auVar55);
      auVar56._4_4_ = fStack_7fc * -fVar355;
      auVar56._0_4_ = local_800 * -fVar348;
      auVar56._8_4_ = fStack_7f8 * -fVar357;
      auVar56._12_4_ = fStack_7f4 * -fVar359;
      auVar56._16_4_ = fStack_7f0 * -fVar361;
      auVar56._20_4_ = fStack_7ec * -fVar363;
      auVar56._24_4_ = fStack_7e8 * -fVar365;
      auVar56._28_4_ = uVar90 ^ 0x80000000;
      auVar380._8_4_ = 0x3f800000;
      auVar380._0_8_ = 0x3f8000003f800000;
      auVar380._12_4_ = 0x3f800000;
      auVar380._16_4_ = 0x3f800000;
      auVar380._20_4_ = 0x3f800000;
      auVar380._24_4_ = 0x3f800000;
      auVar380._28_4_ = 0x3f800000;
      auVar57._4_4_ = fStack_67c * fVar372;
      auVar57._0_4_ = local_680 * fVar367;
      auVar57._8_4_ = fStack_678 * fVar373;
      auVar57._12_4_ = fStack_674 * fVar374;
      auVar57._16_4_ = fStack_670 * fVar375;
      auVar57._20_4_ = fStack_66c * fVar376;
      auVar57._24_4_ = fStack_668 * fVar377;
      auVar57._28_4_ = uVar1;
      auVar108 = vsubps_avx(auVar56,auVar57);
      auVar58._4_4_ = fVar302 * fStack_65c;
      auVar58._0_4_ = fVar291 * local_660;
      auVar58._8_4_ = fVar306 * fStack_658;
      auVar58._12_4_ = fVar310 * fStack_654;
      auVar58._16_4_ = fVar314 * fStack_650;
      auVar58._20_4_ = fVar318 * fStack_64c;
      auVar58._24_4_ = fVar322 * fStack_648;
      auVar58._28_4_ = uVar1;
      auVar16 = vsubps_avx(auVar108,auVar58);
      auVar108 = vrcpps_avx(auVar16);
      fVar193 = auVar108._0_4_;
      fVar213 = auVar108._4_4_;
      auVar59._4_4_ = auVar16._4_4_ * fVar213;
      auVar59._0_4_ = auVar16._0_4_ * fVar193;
      fVar214 = auVar108._8_4_;
      auVar59._8_4_ = auVar16._8_4_ * fVar214;
      fVar254 = auVar108._12_4_;
      auVar59._12_4_ = auVar16._12_4_ * fVar254;
      fVar258 = auVar108._16_4_;
      auVar59._16_4_ = auVar16._16_4_ * fVar258;
      fVar234 = auVar108._20_4_;
      auVar59._20_4_ = auVar16._20_4_ * fVar234;
      fVar235 = auVar108._24_4_;
      auVar59._24_4_ = auVar16._24_4_ * fVar235;
      auVar59._28_4_ = fStack_644;
      auVar17 = vsubps_avx(auVar380,auVar59);
      auVar108 = vandps_avx(auVar16,auVar279);
      auVar280._8_4_ = 0x219392ef;
      auVar280._0_8_ = 0x219392ef219392ef;
      auVar280._12_4_ = 0x219392ef;
      auVar280._16_4_ = 0x219392ef;
      auVar280._20_4_ = 0x219392ef;
      auVar280._24_4_ = 0x219392ef;
      auVar280._28_4_ = 0x219392ef;
      auVar14 = vcmpps_avx(auVar108,auVar280,1);
      auVar249 = ZEXT3264(auVar14);
      auVar60._4_4_ = (fVar213 + fVar213 * auVar17._4_4_) * -auVar337._4_4_;
      auVar60._0_4_ = (fVar193 + fVar193 * auVar17._0_4_) * -auVar337._0_4_;
      auVar60._8_4_ = (fVar214 + fVar214 * auVar17._8_4_) * -auVar337._8_4_;
      auVar60._12_4_ = (fVar254 + fVar254 * auVar17._12_4_) * -auVar337._12_4_;
      auVar60._16_4_ = (fVar258 + fVar258 * auVar17._16_4_) * -auVar337._16_4_;
      auVar60._20_4_ = (fVar234 + fVar234 * auVar17._20_4_) * -auVar337._20_4_;
      auVar60._24_4_ = (fVar235 + fVar235 * auVar17._24_4_) * -auVar337._24_4_;
      auVar60._28_4_ = auVar337._28_4_ ^ 0x80000000;
      auVar108 = vcmpps_avx(auVar16,auVar336,1);
      auVar108 = vorps_avx(auVar14,auVar108);
      auVar108 = vblendvps_avx(auVar60,auVar351,auVar108);
      local_740 = vmaxps_avx(auVar15,auVar108);
      auVar232 = ZEXT3264(local_520);
      auVar337 = ZEXT1232(auVar74) << 0x20;
      auVar108 = vcmpps_avx(auVar16,auVar337,6);
      auVar108 = vorps_avx(auVar14,auVar108);
      auVar108 = vblendvps_avx(auVar60,auVar370,auVar108);
      auVar102 = vandps_avx(auVar102,local_520);
      local_600 = vminps_avx(auVar189,auVar108);
      auVar108 = vcmpps_avx(local_740,local_600,2);
      auVar14 = auVar102 & auVar108;
      if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0x7f,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0xbf,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar14[0x1f] < '\0') {
        auVar14 = vminps_avx(_local_b20,local_6a0);
        auVar15 = vminps_avx(_local_840,local_920);
        auVar14 = vminps_avx(auVar14,auVar15);
        auVar14 = vsubps_avx(auVar14,local_6e0);
        auVar102 = vandps_avx(auVar108,auVar102);
        auVar82._4_4_ = fStack_39c;
        auVar82._0_4_ = local_3a0;
        auVar82._8_4_ = fStack_398;
        auVar82._12_4_ = fStack_394;
        auVar82._16_4_ = fStack_390;
        auVar82._20_4_ = fStack_38c;
        auVar82._24_4_ = fStack_388;
        auVar82._28_4_ = uStack_384;
        auVar108 = vminps_avx(auVar82,auVar380);
        auVar189 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar108 = vmaxps_avx(auVar108,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar151 + fVar117 * (auVar108._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar168 + fVar147 * (auVar108._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar169 + fVar148 * (auVar108._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar170 + fVar150 * (auVar108._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar151 + fVar117 * (auVar108._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar168 + fVar147 * (auVar108._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar169 + fVar148 * (auVar108._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar170 + auVar108._28_4_ + 7.0;
        auVar83._4_4_ = fStack_37c;
        auVar83._0_4_ = local_380;
        auVar83._8_4_ = fStack_378;
        auVar83._12_4_ = fStack_374;
        auVar83._16_4_ = fStack_370;
        auVar83._20_4_ = fStack_36c;
        auVar83._24_4_ = fStack_368;
        auVar83._28_4_ = fStack_364;
        auVar108 = vminps_avx(auVar83,auVar380);
        auVar108 = vmaxps_avx(auVar108,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar151 + fVar117 * (auVar108._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar168 + fVar147 * (auVar108._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar169 + fVar148 * (auVar108._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar170 + fVar150 * (auVar108._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar151 + fVar117 * (auVar108._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar168 + fVar147 * (auVar108._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar169 + fVar148 * (auVar108._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar170 + auVar108._28_4_ + 7.0;
        auVar61._4_4_ = auVar14._4_4_ * 0.99999976;
        auVar61._0_4_ = auVar14._0_4_ * 0.99999976;
        auVar61._8_4_ = auVar14._8_4_ * 0.99999976;
        auVar61._12_4_ = auVar14._12_4_ * 0.99999976;
        auVar61._16_4_ = auVar14._16_4_ * 0.99999976;
        auVar61._20_4_ = auVar14._20_4_ * 0.99999976;
        auVar61._24_4_ = auVar14._24_4_ * 0.99999976;
        auVar61._28_4_ = 0x3f7ffffc;
        auVar108 = vmaxps_avx(auVar337,auVar61);
        auVar62._4_4_ = auVar108._4_4_ * auVar108._4_4_;
        auVar62._0_4_ = auVar108._0_4_ * auVar108._0_4_;
        auVar62._8_4_ = auVar108._8_4_ * auVar108._8_4_;
        auVar62._12_4_ = auVar108._12_4_ * auVar108._12_4_;
        auVar62._16_4_ = auVar108._16_4_ * auVar108._16_4_;
        auVar62._20_4_ = auVar108._20_4_ * auVar108._20_4_;
        auVar62._24_4_ = auVar108._24_4_ * auVar108._24_4_;
        auVar62._28_4_ = auVar108._28_4_;
        auVar14 = vsubps_avx(_local_aa0,auVar62);
        auVar63._4_4_ = auVar14._4_4_ * (float)local_860._4_4_;
        auVar63._0_4_ = auVar14._0_4_ * (float)local_860._0_4_;
        auVar63._8_4_ = auVar14._8_4_ * fStack_858;
        auVar63._12_4_ = auVar14._12_4_ * fStack_854;
        auVar63._16_4_ = auVar14._16_4_ * fStack_850;
        auVar63._20_4_ = auVar14._20_4_ * fStack_84c;
        auVar63._24_4_ = auVar14._24_4_ * fStack_848;
        auVar63._28_4_ = auVar108._28_4_;
        auVar15 = vsubps_avx(local_6c0,auVar63);
        auVar108 = vcmpps_avx(auVar15,ZEXT832(0) << 0x20,5);
        if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar108 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar108 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar108 >> 0x7f,0) == '\0') &&
              (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar108 >> 0xbf,0) == '\0') &&
            (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar108[0x1f]) {
          auVar249 = ZEXT864(0) << 0x20;
          auVar232 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar271 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar329 = ZEXT864(0) << 0x20;
          _local_b20 = SUB3228(ZEXT832(0),0) << 0x20;
          auVar297._8_4_ = 0x7f800000;
          auVar297._0_8_ = 0x7f8000007f800000;
          auVar297._12_4_ = 0x7f800000;
          auVar297._16_4_ = 0x7f800000;
          auVar297._20_4_ = 0x7f800000;
          auVar297._24_4_ = 0x7f800000;
          auVar297._28_4_ = 0x7f800000;
          auVar338._8_4_ = 0xff800000;
          auVar338._0_8_ = 0xff800000ff800000;
          auVar338._12_4_ = 0xff800000;
          auVar338._16_4_ = 0xff800000;
          auVar338._20_4_ = 0xff800000;
          auVar338._24_4_ = 0xff800000;
          auVar338._28_4_ = 0xff800000;
        }
        else {
          local_9c0 = auVar14;
          local_a40 = auVar108;
          _local_aa0 = auVar102;
          auVar189 = vrcpps_avx(local_340);
          fVar193 = auVar189._0_4_;
          fVar213 = auVar189._4_4_;
          auVar64._4_4_ = local_340._4_4_ * fVar213;
          auVar64._0_4_ = local_340._0_4_ * fVar193;
          fVar214 = auVar189._8_4_;
          auVar64._8_4_ = local_340._8_4_ * fVar214;
          fVar254 = auVar189._12_4_;
          auVar64._12_4_ = local_340._12_4_ * fVar254;
          fVar258 = auVar189._16_4_;
          auVar64._16_4_ = local_340._16_4_ * fVar258;
          fVar234 = auVar189._20_4_;
          auVar64._20_4_ = local_340._20_4_ * fVar234;
          fVar235 = auVar189._24_4_;
          auVar64._24_4_ = local_340._24_4_ * fVar235;
          auVar64._28_4_ = auVar14._28_4_;
          auVar17 = vsubps_avx(auVar380,auVar64);
          auVar16 = vsqrtps_avx(auVar15);
          fVar193 = fVar193 + fVar193 * auVar17._0_4_;
          fVar213 = fVar213 + fVar213 * auVar17._4_4_;
          fVar214 = fVar214 + fVar214 * auVar17._8_4_;
          fVar254 = fVar254 + fVar254 * auVar17._12_4_;
          fVar258 = fVar258 + fVar258 * auVar17._16_4_;
          fVar234 = fVar234 + fVar234 * auVar17._20_4_;
          fVar235 = fVar235 + fVar235 * auVar17._24_4_;
          auVar336 = vsubps_avx(local_320,auVar16);
          fVar315 = auVar336._0_4_ * fVar193;
          fVar323 = auVar336._4_4_ * fVar213;
          auVar65._4_4_ = fVar323;
          auVar65._0_4_ = fVar315;
          fVar330 = auVar336._8_4_ * fVar214;
          auVar65._8_4_ = fVar330;
          fVar366 = auVar336._12_4_ * fVar254;
          auVar65._12_4_ = fVar366;
          fVar113 = auVar336._16_4_ * fVar258;
          auVar65._16_4_ = fVar113;
          fVar114 = auVar336._20_4_ * fVar234;
          auVar65._20_4_ = fVar114;
          fVar115 = auVar336._24_4_ * fVar235;
          auVar65._24_4_ = fVar115;
          auVar65._28_4_ = local_a80._28_4_;
          auVar336 = vsubps_avx(auVar16,local_300);
          fVar193 = auVar336._0_4_ * fVar193;
          fVar213 = auVar336._4_4_ * fVar213;
          auVar66._4_4_ = fVar213;
          auVar66._0_4_ = fVar193;
          fVar214 = auVar336._8_4_ * fVar214;
          auVar66._8_4_ = fVar214;
          fVar254 = auVar336._12_4_ * fVar254;
          auVar66._12_4_ = fVar254;
          fVar258 = auVar336._16_4_ * fVar258;
          auVar66._16_4_ = fVar258;
          fVar234 = auVar336._20_4_ * fVar234;
          auVar66._20_4_ = fVar234;
          fVar235 = auVar336._24_4_ * fVar235;
          auVar66._24_4_ = fVar235;
          auVar66._28_4_ = 0x3f800000;
          fVar256 = (fVar315 * local_580 + local_5a0._0_4_) * fVar215;
          fVar259 = (fVar323 * fStack_57c + local_5a0._4_4_) * fVar262;
          fVar268 = (fVar330 * fStack_578 + local_5a0._8_4_) * fVar236;
          fVar270 = (fVar366 * fStack_574 + local_5a0._12_4_) * fVar260;
          fVar286 = (fVar113 * fStack_570 + local_5a0._16_4_) * fVar282;
          fVar287 = (fVar114 * fStack_56c + local_5a0._20_4_) * fVar288;
          fVar311 = (fVar115 * fStack_568 + local_5a0._24_4_) * fVar319;
          auVar205._0_4_ = local_8c0 + fVar256 * fVar212;
          auVar205._4_4_ = fStack_8bc + fVar259 * fVar252;
          auVar205._8_4_ = fStack_8b8 + fVar268 * fVar233;
          auVar205._12_4_ = fStack_8b4 + fVar270 * fVar255;
          auVar205._16_4_ = fStack_8b0 + fVar286 * fVar267;
          auVar205._20_4_ = fStack_8ac + fVar287 * fVar285;
          auVar205._24_4_ = fStack_8a8 + fVar311 * fVar307;
          auVar205._28_4_ = fStack_8a4 + auVar336._28_4_;
          auVar67._4_4_ = fStack_65c * fVar323;
          auVar67._0_4_ = local_660 * fVar315;
          auVar67._8_4_ = fStack_658 * fVar330;
          auVar67._12_4_ = fStack_654 * fVar366;
          auVar67._16_4_ = fStack_650 * fVar113;
          auVar67._20_4_ = fStack_64c * fVar114;
          auVar67._24_4_ = fStack_648 * fVar115;
          auVar67._28_4_ = auVar16._28_4_;
          auVar336 = vsubps_avx(auVar67,auVar205);
          auVar227._0_4_ = fVar289 + fVar210 * fVar256;
          auVar227._4_4_ = fVar300 + fVar239 * fVar259;
          auVar227._8_4_ = fVar304 + fVar266 * fVar268;
          auVar227._12_4_ = fVar308 + fVar237 * fVar270;
          auVar227._16_4_ = fVar312 + fVar263 * fVar286;
          auVar227._20_4_ = fVar316 + fVar283 * fVar287;
          auVar227._24_4_ = fVar320 + fVar299 * fVar311;
          auVar227._28_4_ = fVar324 + auVar16._28_4_;
          auVar68._4_4_ = fStack_67c * fVar323;
          auVar68._0_4_ = local_680 * fVar315;
          auVar68._8_4_ = fStack_678 * fVar330;
          auVar68._12_4_ = fStack_674 * fVar366;
          auVar68._16_4_ = fStack_670 * fVar113;
          auVar68._20_4_ = fStack_66c * fVar114;
          auVar68._24_4_ = fStack_668 * fVar115;
          auVar68._28_4_ = 0x3e000000;
          local_8e0 = vsubps_avx(auVar68,auVar227);
          auVar190._0_4_ = local_8a0 + fVar211 * fVar256;
          auVar190._4_4_ = fStack_89c + fVar250 * fVar259;
          auVar190._8_4_ = fStack_898 + fVar216 * fVar268;
          auVar190._12_4_ = aStack_894.w + fVar238 * fVar270;
          auVar190._16_4_ = fStack_890 + fVar264 * fVar286;
          auVar190._20_4_ = fStack_88c + fVar284 * fVar287;
          auVar190._24_4_ = fStack_888 + fVar303 * fVar311;
          auVar190._28_4_ = fStack_884 + auVar189._28_4_ + auVar17._28_4_ + local_5a0._28_4_;
          auVar69._4_4_ = fVar323 * fStack_7fc;
          auVar69._0_4_ = fVar315 * local_800;
          auVar69._8_4_ = fVar330 * fStack_7f8;
          auVar69._12_4_ = fVar366 * fStack_7f4;
          auVar69._16_4_ = fVar113 * fStack_7f0;
          auVar69._20_4_ = fVar114 * fStack_7ec;
          auVar69._24_4_ = fVar115 * fStack_7e8;
          auVar69._28_4_ = auVar227._28_4_;
          auVar189 = vsubps_avx(auVar69,auVar190);
          _local_b20 = auVar189._0_28_;
          fVar215 = (fVar193 * local_580 + local_5a0._0_4_) * fVar215;
          fVar262 = (fVar213 * fStack_57c + local_5a0._4_4_) * fVar262;
          fVar236 = (fVar214 * fStack_578 + local_5a0._8_4_) * fVar236;
          fVar260 = (fVar254 * fStack_574 + local_5a0._12_4_) * fVar260;
          fVar282 = (fVar258 * fStack_570 + local_5a0._16_4_) * fVar282;
          fVar288 = (fVar234 * fStack_56c + local_5a0._20_4_) * fVar288;
          fVar319 = (fVar235 * fStack_568 + local_5a0._24_4_) * fVar319;
          auVar191._0_4_ = local_8c0 + fVar215 * fVar212;
          auVar191._4_4_ = fStack_8bc + fVar262 * fVar252;
          auVar191._8_4_ = fStack_8b8 + fVar236 * fVar233;
          auVar191._12_4_ = fStack_8b4 + fVar260 * fVar255;
          auVar191._16_4_ = fStack_8b0 + fVar282 * fVar267;
          auVar191._20_4_ = fStack_8ac + fVar288 * fVar285;
          auVar191._24_4_ = fStack_8a8 + fVar319 * fVar307;
          auVar191._28_4_ = fStack_8a4 + auVar189._28_4_ + local_5a0._28_4_;
          auVar70._4_4_ = fStack_65c * fVar213;
          auVar70._0_4_ = local_660 * fVar193;
          auVar70._8_4_ = fStack_658 * fVar214;
          auVar70._12_4_ = fStack_654 * fVar254;
          auVar70._16_4_ = fStack_650 * fVar258;
          auVar70._20_4_ = fStack_64c * fVar234;
          auVar70._24_4_ = fStack_648 * fVar235;
          auVar70._28_4_ = 0x3e000000;
          auVar189 = vsubps_avx(auVar70,auVar191);
          auVar248._0_4_ = fVar289 + fVar210 * fVar215;
          auVar248._4_4_ = fVar300 + fVar239 * fVar262;
          auVar248._8_4_ = fVar304 + fVar266 * fVar236;
          auVar248._12_4_ = fVar308 + fVar237 * fVar260;
          auVar248._16_4_ = fVar312 + fVar263 * fVar282;
          auVar248._20_4_ = fVar316 + fVar283 * fVar288;
          auVar248._24_4_ = fVar320 + fVar299 * fVar319;
          auVar248._28_4_ = fVar324 + 0.125;
          auVar71._4_4_ = fStack_67c * fVar213;
          auVar71._0_4_ = local_680 * fVar193;
          auVar71._8_4_ = fStack_678 * fVar214;
          auVar71._12_4_ = fStack_674 * fVar254;
          auVar71._16_4_ = fStack_670 * fVar258;
          auVar71._20_4_ = fStack_66c * fVar234;
          auVar71._24_4_ = fStack_668 * fVar235;
          auVar71._28_4_ = fStack_644;
          auVar16 = vsubps_avx(auVar71,auVar248);
          auVar249 = ZEXT3264(auVar16);
          auVar228._0_4_ = local_8a0 + fVar211 * fVar215;
          auVar228._4_4_ = fStack_89c + fVar250 * fVar262;
          auVar228._8_4_ = fStack_898 + fVar216 * fVar236;
          auVar228._12_4_ = aStack_894.w + fVar238 * fVar260;
          auVar228._16_4_ = fStack_890 + fVar264 * fVar282;
          auVar228._20_4_ = fStack_88c + fVar284 * fVar288;
          auVar228._24_4_ = fStack_888 + fVar303 * fVar319;
          auVar228._28_4_ = fStack_884 + auVar227._28_4_;
          auVar72._4_4_ = fVar213 * fStack_7fc;
          auVar72._0_4_ = fVar193 * local_800;
          auVar72._8_4_ = fVar214 * fStack_7f8;
          auVar72._12_4_ = fVar254 * fStack_7f4;
          auVar72._16_4_ = fVar258 * fStack_7f0;
          auVar72._20_4_ = fVar234 * fStack_7ec;
          auVar72._24_4_ = fVar235 * fStack_7e8;
          auVar72._28_4_ = fStack_644;
          auVar16 = vsubps_avx(auVar72,auVar228);
          auVar232 = ZEXT3264(auVar16);
          auVar337 = vcmpps_avx(auVar15,auVar337,5);
          auVar298._8_4_ = 0x7f800000;
          auVar298._0_8_ = 0x7f8000007f800000;
          auVar298._12_4_ = 0x7f800000;
          auVar298._16_4_ = 0x7f800000;
          auVar298._20_4_ = 0x7f800000;
          auVar298._24_4_ = 0x7f800000;
          auVar298._28_4_ = 0x7f800000;
          auVar297 = vblendvps_avx(auVar298,auVar65,auVar337);
          auVar15 = vmaxps_avx(local_540,local_3c0);
          auVar73._4_4_ = auVar15._4_4_ * 1.9073486e-06;
          auVar73._0_4_ = auVar15._0_4_ * 1.9073486e-06;
          auVar73._8_4_ = auVar15._8_4_ * 1.9073486e-06;
          auVar73._12_4_ = auVar15._12_4_ * 1.9073486e-06;
          auVar73._16_4_ = auVar15._16_4_ * 1.9073486e-06;
          auVar73._20_4_ = auVar15._20_4_ * 1.9073486e-06;
          auVar73._24_4_ = auVar15._24_4_ * 1.9073486e-06;
          auVar73._28_4_ = auVar15._28_4_;
          auVar15 = vcmpps_avx(local_2e0,auVar73,1);
          auVar339._8_4_ = 0xff800000;
          auVar339._0_8_ = 0xff800000ff800000;
          auVar339._12_4_ = 0xff800000;
          auVar339._16_4_ = 0xff800000;
          auVar339._20_4_ = 0xff800000;
          auVar339._24_4_ = 0xff800000;
          auVar339._28_4_ = 0xff800000;
          auVar338 = vblendvps_avx(auVar339,auVar66,auVar337);
          auVar16 = auVar337 & auVar15;
          if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar16 >> 0x7f,0) != '\0') ||
                (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar16 >> 0xbf,0) != '\0') ||
              (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar16[0x1f] < '\0') {
            auVar108 = vandps_avx(auVar15,auVar337);
            auVar175 = vpackssdw_avx(auVar108._0_16_,auVar108._16_16_);
            auVar15 = vcmpps_avx(auVar14,_DAT_01f7b000,2);
            auVar146._8_4_ = 0xff800000;
            auVar146._0_8_ = 0xff800000ff800000;
            auVar146._12_4_ = 0xff800000;
            auVar146._16_4_ = 0xff800000;
            auVar146._20_4_ = 0xff800000;
            auVar146._24_4_ = 0xff800000;
            auVar146._28_4_ = 0xff800000;
            auVar209._8_4_ = 0x7f800000;
            auVar209._0_8_ = 0x7f8000007f800000;
            auVar209._12_4_ = 0x7f800000;
            auVar209._16_4_ = 0x7f800000;
            auVar209._20_4_ = 0x7f800000;
            auVar209._24_4_ = 0x7f800000;
            auVar209._28_4_ = 0x7f800000;
            auVar14 = vblendvps_avx(auVar209,auVar146,auVar15);
            auVar19 = vpmovsxwd_avx(auVar175);
            auVar175 = vpunpckhwd_avx(auVar175,auVar175);
            auVar381._16_16_ = auVar175;
            auVar381._0_16_ = auVar19;
            auVar297 = vblendvps_avx(auVar297,auVar14,auVar381);
            auVar14 = vblendvps_avx(auVar146,auVar209,auVar15);
            auVar338 = vblendvps_avx(auVar338,auVar14,auVar381);
            auVar167._0_8_ = auVar108._0_8_ ^ 0xffffffffffffffff;
            auVar167._8_4_ = auVar108._8_4_ ^ 0xffffffff;
            auVar167._12_4_ = auVar108._12_4_ ^ 0xffffffff;
            auVar167._16_4_ = auVar108._16_4_ ^ 0xffffffff;
            auVar167._20_4_ = auVar108._20_4_ ^ 0xffffffff;
            auVar167._24_4_ = auVar108._24_4_ ^ 0xffffffff;
            auVar167._28_4_ = auVar108._28_4_ ^ 0xffffffff;
            auVar108 = vorps_avx(auVar15,auVar167);
            auVar108 = vandps_avx(auVar337,auVar108);
          }
          auVar271 = auVar336._0_28_;
          auVar329 = ZEXT3264(local_8e0);
        }
        auVar340 = ZEXT3264(auVar338);
        fVar193 = (ray->super_RayK<1>).dir.field_0.m128[0];
        auVar371 = ZEXT3264(CONCAT428(fVar193,CONCAT424(fVar193,CONCAT420(fVar193,CONCAT416(fVar193,
                                                  CONCAT412(fVar193,CONCAT48(fVar193,CONCAT44(
                                                  fVar193,fVar193))))))));
        fVar210 = (ray->super_RayK<1>).dir.field_0.m128[1];
        fVar211 = (ray->super_RayK<1>).dir.field_0.m128[2];
        auVar353 = ZEXT3264(CONCAT428(fVar211,CONCAT424(fVar211,CONCAT420(fVar211,CONCAT416(fVar211,
                                                  CONCAT412(fVar211,CONCAT48(fVar211,CONCAT44(
                                                  fVar211,fVar211))))))));
        local_5e0 = local_740;
        local_5c0 = vminps_avx(local_600,auVar297);
        _local_620 = vmaxps_avx(local_740,auVar338);
        auVar14 = vcmpps_avx(local_740,local_5c0,2);
        local_6a0 = vandps_avx(auVar14,auVar102);
        auVar14 = vcmpps_avx(_local_620,local_600,2);
        _local_860 = vandps_avx(auVar102,auVar14);
        auVar102 = vorps_avx(local_6a0,_local_860);
        auVar390 = ZEXT3264(local_a20);
        if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar102 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar102 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar102 >> 0x7f,0) != '\0') ||
              (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar102 >> 0xbf,0) != '\0') ||
            (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar102[0x1f] < '\0') {
          _local_820 = _local_620;
          fVar212 = local_860._28_4_;
          auVar109._0_4_ =
               fVar193 * auVar189._0_4_ + fVar210 * auVar249._0_4_ + fVar211 * auVar232._0_4_;
          auVar109._4_4_ =
               fVar193 * auVar189._4_4_ + fVar210 * auVar249._4_4_ + fVar211 * auVar232._4_4_;
          auVar109._8_4_ =
               fVar193 * auVar189._8_4_ + fVar210 * auVar249._8_4_ + fVar211 * auVar232._8_4_;
          auVar109._12_4_ =
               fVar193 * auVar189._12_4_ + fVar210 * auVar249._12_4_ + fVar211 * auVar232._12_4_;
          auVar109._16_4_ =
               fVar193 * auVar189._16_4_ + fVar210 * auVar249._16_4_ + fVar211 * auVar232._16_4_;
          auVar109._20_4_ =
               fVar193 * auVar189._20_4_ + fVar210 * auVar249._20_4_ + fVar211 * auVar232._20_4_;
          auVar109._24_4_ =
               fVar193 * auVar189._24_4_ + fVar210 * auVar249._24_4_ + fVar211 * auVar232._24_4_;
          auVar109._28_4_ = fVar212 + fVar212 + auVar102._28_4_;
          auVar161._0_8_ = auVar108._0_8_ ^ 0xffffffffffffffff;
          auVar161._8_4_ = auVar108._8_4_ ^ 0xffffffff;
          auVar161._12_4_ = auVar108._12_4_ ^ 0xffffffff;
          auVar161._16_4_ = auVar108._16_4_ ^ 0xffffffff;
          auVar161._20_4_ = auVar108._20_4_ ^ 0xffffffff;
          auVar161._24_4_ = auVar108._24_4_ ^ 0xffffffff;
          auVar161._28_4_ = auVar108._28_4_ ^ 0xffffffff;
          auVar206._8_4_ = 0x7fffffff;
          auVar206._0_8_ = 0x7fffffff7fffffff;
          auVar206._12_4_ = 0x7fffffff;
          auVar206._16_4_ = 0x7fffffff;
          auVar206._20_4_ = 0x7fffffff;
          auVar206._24_4_ = 0x7fffffff;
          auVar206._28_4_ = 0x7fffffff;
          auVar102 = vandps_avx(auVar109,auVar206);
          auVar229._8_4_ = 0x3e99999a;
          auVar229._0_8_ = 0x3e99999a3e99999a;
          auVar229._12_4_ = 0x3e99999a;
          auVar229._16_4_ = 0x3e99999a;
          auVar229._20_4_ = 0x3e99999a;
          auVar229._24_4_ = 0x3e99999a;
          auVar229._28_4_ = 0x3e99999a;
          auVar102 = vcmpps_avx(auVar102,auVar229,1);
          local_6e0 = vorps_avx(auVar102,auVar161);
          auVar110._0_4_ =
               fVar193 * auVar271._0_4_ +
               auVar329._0_4_ * fVar210 + fVar211 * (float)local_b20._0_4_;
          auVar110._4_4_ =
               fVar193 * auVar271._4_4_ +
               auVar329._4_4_ * fVar210 + fVar211 * (float)local_b20._4_4_;
          auVar110._8_4_ =
               fVar193 * auVar271._8_4_ + auVar329._8_4_ * fVar210 + fVar211 * fStack_b18;
          auVar110._12_4_ =
               fVar193 * auVar271._12_4_ + auVar329._12_4_ * fVar210 + fVar211 * fStack_b14;
          auVar110._16_4_ =
               fVar193 * auVar271._16_4_ + auVar329._16_4_ * fVar210 + fVar211 * fStack_b10;
          auVar110._20_4_ =
               fVar193 * auVar271._20_4_ + auVar329._20_4_ * fVar210 + fVar211 * fStack_b0c;
          auVar110._24_4_ =
               fVar193 * auVar271._24_4_ + auVar329._24_4_ * fVar210 + fVar211 * fStack_b08;
          auVar110._28_4_ = fVar212 + auVar189._28_4_ + local_6e0._28_4_;
          auVar102 = vandps_avx(auVar110,auVar206);
          auVar102 = vcmpps_avx(auVar102,auVar229,1);
          auVar102 = vorps_avx(auVar102,auVar161);
          auVar140._8_4_ = 3;
          auVar140._0_8_ = 0x300000003;
          auVar140._12_4_ = 3;
          auVar140._16_4_ = 3;
          auVar140._20_4_ = 3;
          auVar140._24_4_ = 3;
          auVar140._28_4_ = 3;
          auVar162._8_4_ = 2;
          auVar162._0_8_ = 0x200000002;
          auVar162._12_4_ = 2;
          auVar162._16_4_ = 2;
          auVar162._20_4_ = 2;
          auVar162._24_4_ = 2;
          auVar162._28_4_ = 2;
          auVar102 = vblendvps_avx(auVar162,auVar140,auVar102);
          local_760 = ZEXT432(local_b4c);
          auVar19 = vpshufd_avx(ZEXT416(local_b4c),0);
          auVar175 = vpcmpgtd_avx(auVar102._16_16_,auVar19);
          local_700._0_16_ = auVar19;
          auVar19 = vpcmpgtd_avx(auVar102._0_16_,auVar19);
          auVar141._16_16_ = auVar175;
          auVar141._0_16_ = auVar19;
          local_6c0 = vblendps_avx(ZEXT1632(auVar19),auVar141,0xf0);
          auVar102 = vandnps_avx(local_6c0,local_6a0);
          local_840._4_4_ = local_740._4_4_ + local_900._4_4_;
          local_840._0_4_ = local_740._0_4_ + local_900._0_4_;
          fStack_838 = local_740._8_4_ + local_900._8_4_;
          fStack_834 = local_740._12_4_ + local_900._12_4_;
          fStack_830 = local_740._16_4_ + local_900._16_4_;
          fStack_82c = local_740._20_4_ + local_900._20_4_;
          fStack_828 = local_740._24_4_ + local_900._24_4_;
          fStack_824 = local_740._28_4_ + local_900._28_4_;
          while( true ) {
            local_3e0 = auVar102;
            if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar102 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar102 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar102 >> 0x7f,0) == '\0') &&
                  (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar102 >> 0xbf,0) == '\0') &&
                (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar102[0x1f]) break;
            auVar142._8_4_ = 0x7f800000;
            auVar142._0_8_ = 0x7f8000007f800000;
            auVar142._12_4_ = 0x7f800000;
            auVar142._16_4_ = 0x7f800000;
            auVar142._20_4_ = 0x7f800000;
            auVar142._24_4_ = 0x7f800000;
            auVar142._28_4_ = 0x7f800000;
            auVar108 = vblendvps_avx(auVar142,local_740,auVar102);
            auVar14 = vshufps_avx(auVar108,auVar108,0xb1);
            auVar14 = vminps_avx(auVar108,auVar14);
            auVar337 = vshufpd_avx(auVar14,auVar14,5);
            auVar14 = vminps_avx(auVar14,auVar337);
            auVar337 = vperm2f128_avx(auVar14,auVar14,1);
            auVar14 = vminps_avx(auVar14,auVar337);
            auVar108 = vcmpps_avx(auVar108,auVar14,0);
            auVar14 = auVar102 & auVar108;
            if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar14 >> 0x7f,0) != '\0') ||
                  (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar14 >> 0xbf,0) != '\0') ||
                (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar14[0x1f] < '\0') {
              auVar102 = vandps_avx(auVar108,auVar102);
            }
            uVar85 = vmovmskps_avx(auVar102);
            uVar90 = 0;
            if (uVar85 != 0) {
              for (; (uVar85 >> uVar90 & 1) == 0; uVar90 = uVar90 + 1) {
              }
            }
            uVar88 = (ulong)uVar90;
            *(undefined4 *)(local_3e0 + uVar88 * 4) = 0;
            aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
            local_8a0 = aVar3.x;
            fStack_89c = aVar3.y;
            fStack_898 = aVar3.z;
            aStack_894 = aVar3.field_3;
            auVar175 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
            fVar193 = local_1a0[uVar88];
            uVar90 = *(uint *)(local_5e0 + uVar88 * 4);
            if (auVar175._0_4_ < 0.0) {
              auVar340 = ZEXT1664(auVar340._0_16_);
              auVar353 = ZEXT1664(auVar353._0_16_);
              auVar371 = ZEXT1664(auVar371._0_16_);
              fVar210 = sqrtf(auVar175._0_4_);
              auVar390 = ZEXT3264(local_a20);
            }
            else {
              auVar175 = vsqrtss_avx(auVar175,auVar175);
              fVar210 = auVar175._0_4_;
            }
            auVar249 = ZEXT464((uint)fVar193);
            auVar19 = vminps_avx(_local_9d0,_local_9f0);
            auVar175 = vmaxps_avx(_local_9d0,_local_9f0);
            auVar18 = vminps_avx(_local_9e0,_local_a00);
            auVar97 = vminps_avx(auVar19,auVar18);
            auVar19 = vmaxps_avx(_local_9e0,_local_a00);
            auVar18 = vmaxps_avx(auVar175,auVar19);
            auVar172._8_4_ = 0x7fffffff;
            auVar172._0_8_ = 0x7fffffff7fffffff;
            auVar172._12_4_ = 0x7fffffff;
            auVar175 = vandps_avx(auVar97,auVar172);
            auVar19 = vandps_avx(auVar18,auVar172);
            auVar175 = vmaxps_avx(auVar175,auVar19);
            auVar19 = vmovshdup_avx(auVar175);
            auVar19 = vmaxss_avx(auVar19,auVar175);
            auVar175 = vshufpd_avx(auVar175,auVar175,1);
            auVar175 = vmaxss_avx(auVar175,auVar19);
            local_8c0 = auVar175._0_4_ * 1.9073486e-06;
            local_9c0._0_4_ = fVar210 * 1.9073486e-06;
            local_7e0._0_16_ = vshufps_avx(auVar18,auVar18,0xff);
            auVar175 = vinsertps_avx(ZEXT416(uVar90),ZEXT416((uint)fVar193),0x10);
            auVar329 = ZEXT1664(auVar175);
            lVar86 = 5;
            do {
              do {
                auVar175 = auVar329._0_16_;
                bVar92 = lVar86 == 0;
                lVar86 = lVar86 + -1;
                if (bVar92) goto LAB_00a4eff7;
                auVar18 = vmovshdup_avx(auVar175);
                fVar193 = auVar18._0_4_;
                fVar215 = 1.0 - fVar193;
                fVar210 = fVar215 * fVar215;
                fVar211 = fVar215 * fVar210;
                fVar212 = fVar193 * fVar193;
                fVar213 = fVar193 * fVar212;
                fVar214 = fVar193 * fVar215;
                auVar19 = vshufps_avx(ZEXT416((uint)(fVar213 * 0.16666667)),
                                      ZEXT416((uint)(fVar213 * 0.16666667)),0);
                auVar97 = ZEXT416((uint)((fVar213 * 4.0 + fVar211 +
                                         fVar193 * fVar214 * 12.0 + fVar215 * fVar214 * 6.0) *
                                        0.16666667));
                auVar97 = vshufps_avx(auVar97,auVar97,0);
                auVar122 = ZEXT416((uint)((fVar211 * 4.0 + fVar213 +
                                          fVar215 * fVar214 * 12.0 + fVar193 * fVar214 * 6.0) *
                                         0.16666667));
                auVar122 = vshufps_avx(auVar122,auVar122,0);
                auVar96 = vshufps_avx(auVar175,auVar175,0);
                auVar153._0_4_ = auVar96._0_4_ * local_8a0 + 0.0;
                auVar153._4_4_ = auVar96._4_4_ * fStack_89c + 0.0;
                auVar153._8_4_ = auVar96._8_4_ * fStack_898 + 0.0;
                auVar153._12_4_ = auVar96._12_4_ * aStack_894.w + 0.0;
                auVar96 = vshufps_avx(ZEXT416((uint)(fVar211 * 0.16666667)),
                                      ZEXT416((uint)(fVar211 * 0.16666667)),0);
                auVar95._0_4_ =
                     auVar96._0_4_ * (float)local_9d0._0_4_ +
                     auVar122._0_4_ * (float)local_9f0._0_4_ +
                     auVar19._0_4_ * (float)local_a00._0_4_ + auVar97._0_4_ * (float)local_9e0._0_4_
                ;
                auVar95._4_4_ =
                     auVar96._4_4_ * (float)local_9d0._4_4_ +
                     auVar122._4_4_ * (float)local_9f0._4_4_ +
                     auVar19._4_4_ * (float)local_a00._4_4_ + auVar97._4_4_ * (float)local_9e0._4_4_
                ;
                auVar95._8_4_ =
                     auVar96._8_4_ * fStack_9c8 +
                     auVar122._8_4_ * fStack_9e8 +
                     auVar19._8_4_ * fStack_9f8 + auVar97._8_4_ * fStack_9d8;
                auVar95._12_4_ =
                     auVar96._12_4_ * fStack_9c4 +
                     auVar122._12_4_ * fStack_9e4 +
                     auVar19._12_4_ * fStack_9f4 + auVar97._12_4_ * fStack_9d4;
                local_8e0._0_16_ = auVar95;
                auVar19 = vsubps_avx(auVar153,auVar95);
                _local_aa0 = auVar19;
                auVar19 = vdpps_avx(auVar19,auVar19,0x7f);
                fVar211 = auVar19._0_4_;
                if (fVar211 < 0.0) {
                  local_a40._0_16_ = auVar18;
                  local_940._0_4_ = fVar212;
                  local_a60._0_4_ = fVar210;
                  local_a80._0_4_ = fVar214;
                  fVar213 = sqrtf(fVar211);
                  fVar212 = (float)local_940._0_4_;
                  fVar214 = (float)local_a80._0_4_;
                  fVar210 = (float)local_a60._0_4_;
                  fVar193 = (float)local_a40._0_4_;
                }
                else {
                  auVar18 = vsqrtss_avx(auVar19,auVar19);
                  fVar213 = auVar18._0_4_;
                }
                auVar18 = vshufps_avx(ZEXT416((uint)(fVar212 * 0.5)),ZEXT416((uint)(fVar212 * 0.5)),
                                      0);
                auVar97 = ZEXT416((uint)((fVar210 + fVar214 * 4.0) * 0.5));
                auVar97 = vshufps_avx(auVar97,auVar97,0);
                auVar122 = ZEXT416((uint)((fVar193 * -fVar193 - fVar214 * 4.0) * 0.5));
                auVar122 = vshufps_avx(auVar122,auVar122,0);
                auVar96 = ZEXT416((uint)(fVar215 * -fVar215 * 0.5));
                auVar96 = vshufps_avx(auVar96,auVar96,0);
                auVar292._0_4_ =
                     (float)local_9d0._0_4_ * auVar96._0_4_ +
                     (float)local_9f0._0_4_ * auVar122._0_4_ +
                     (float)local_a00._0_4_ * auVar18._0_4_ + (float)local_9e0._0_4_ * auVar97._0_4_
                ;
                auVar292._4_4_ =
                     (float)local_9d0._4_4_ * auVar96._4_4_ +
                     (float)local_9f0._4_4_ * auVar122._4_4_ +
                     (float)local_a00._4_4_ * auVar18._4_4_ + (float)local_9e0._4_4_ * auVar97._4_4_
                ;
                auVar292._8_4_ =
                     fStack_9c8 * auVar96._8_4_ +
                     fStack_9e8 * auVar122._8_4_ +
                     fStack_9f8 * auVar18._8_4_ + fStack_9d8 * auVar97._8_4_;
                auVar292._12_4_ =
                     fStack_9c4 * auVar96._12_4_ +
                     fStack_9e4 * auVar122._12_4_ +
                     fStack_9f4 * auVar18._12_4_ + fStack_9d4 * auVar97._12_4_;
                auVar18 = vshufps_avx(auVar175,auVar175,0x55);
                auVar97 = ZEXT416((uint)(fVar215 - (fVar193 + fVar193)));
                auVar122 = vshufps_avx(auVar97,auVar97,0);
                auVar97 = ZEXT416((uint)(fVar193 - (fVar215 + fVar215)));
                auVar96 = vshufps_avx(auVar97,auVar97,0);
                auVar5 = vshufps_avx(ZEXT416((uint)fVar215),ZEXT416((uint)fVar215),0);
                auVar97 = vdpps_avx(auVar292,auVar292,0x7f);
                auVar123._0_4_ =
                     (float)local_9d0._0_4_ * auVar5._0_4_ +
                     (float)local_9f0._0_4_ * auVar96._0_4_ +
                     (float)local_a00._0_4_ * auVar18._0_4_ +
                     (float)local_9e0._0_4_ * auVar122._0_4_;
                auVar123._4_4_ =
                     (float)local_9d0._4_4_ * auVar5._4_4_ +
                     (float)local_9f0._4_4_ * auVar96._4_4_ +
                     (float)local_a00._4_4_ * auVar18._4_4_ +
                     (float)local_9e0._4_4_ * auVar122._4_4_;
                auVar123._8_4_ =
                     fStack_9c8 * auVar5._8_4_ +
                     fStack_9e8 * auVar96._8_4_ +
                     fStack_9f8 * auVar18._8_4_ + fStack_9d8 * auVar122._8_4_;
                auVar123._12_4_ =
                     fStack_9c4 * auVar5._12_4_ +
                     fStack_9e4 * auVar96._12_4_ +
                     fStack_9f4 * auVar18._12_4_ + fStack_9d4 * auVar122._12_4_;
                auVar18 = vblendps_avx(auVar97,_DAT_01f45a50,0xe);
                auVar122 = vrsqrtss_avx(auVar18,auVar18);
                fVar210 = auVar122._0_4_;
                fVar193 = auVar97._0_4_;
                auVar122 = vdpps_avx(auVar292,auVar123,0x7f);
                auVar96 = vshufps_avx(auVar97,auVar97,0);
                auVar124._0_4_ = auVar123._0_4_ * auVar96._0_4_;
                auVar124._4_4_ = auVar123._4_4_ * auVar96._4_4_;
                auVar124._8_4_ = auVar123._8_4_ * auVar96._8_4_;
                auVar124._12_4_ = auVar123._12_4_ * auVar96._12_4_;
                auVar122 = vshufps_avx(auVar122,auVar122,0);
                auVar195._0_4_ = auVar292._0_4_ * auVar122._0_4_;
                auVar195._4_4_ = auVar292._4_4_ * auVar122._4_4_;
                auVar195._8_4_ = auVar292._8_4_ * auVar122._8_4_;
                auVar195._12_4_ = auVar292._12_4_ * auVar122._12_4_;
                auVar5 = vsubps_avx(auVar124,auVar195);
                auVar122 = vrcpss_avx(auVar18,auVar18);
                auVar18 = vmaxss_avx(ZEXT416((uint)local_8c0),
                                     ZEXT416((uint)(auVar329._0_4_ * (float)local_9c0._0_4_)));
                auVar340 = ZEXT1664(auVar18);
                auVar122 = ZEXT416((uint)(auVar122._0_4_ * (2.0 - fVar193 * auVar122._0_4_)));
                auVar122 = vshufps_avx(auVar122,auVar122,0);
                uVar88 = CONCAT44(auVar292._4_4_,auVar292._0_4_);
                auVar218._0_8_ = uVar88 ^ 0x8000000080000000;
                auVar218._8_4_ = -auVar292._8_4_;
                auVar218._12_4_ = -auVar292._12_4_;
                auVar96 = ZEXT416((uint)(fVar210 * 1.5 +
                                        fVar193 * -0.5 * fVar210 * fVar210 * fVar210));
                auVar96 = vshufps_avx(auVar96,auVar96,0);
                auVar173._0_4_ = auVar96._0_4_ * auVar5._0_4_ * auVar122._0_4_;
                auVar173._4_4_ = auVar96._4_4_ * auVar5._4_4_ * auVar122._4_4_;
                auVar173._8_4_ = auVar96._8_4_ * auVar5._8_4_ * auVar122._8_4_;
                auVar173._12_4_ = auVar96._12_4_ * auVar5._12_4_ * auVar122._12_4_;
                auVar243._0_4_ = auVar292._0_4_ * auVar96._0_4_;
                auVar243._4_4_ = auVar292._4_4_ * auVar96._4_4_;
                auVar243._8_4_ = auVar292._8_4_ * auVar96._8_4_;
                auVar243._12_4_ = auVar292._12_4_ * auVar96._12_4_;
                local_a40._0_4_ = auVar18._0_4_;
                if (fVar193 < 0.0) {
                  local_940._0_4_ = fVar213;
                  local_a60._0_16_ = auVar218;
                  local_a80._0_16_ = auVar243;
                  local_960._0_16_ = auVar173;
                  fVar193 = sqrtf(fVar193);
                  auVar340 = ZEXT464((uint)local_a40._0_4_);
                  auVar173 = local_960._0_16_;
                  auVar218 = local_a60._0_16_;
                  auVar243 = local_a80._0_16_;
                  fVar213 = (float)local_940._0_4_;
                }
                else {
                  auVar18 = vsqrtss_avx(auVar97,auVar97);
                  fVar193 = auVar18._0_4_;
                }
                auVar18 = vdpps_avx(_local_aa0,auVar243,0x7f);
                fVar193 = (local_8c0 / fVar193) * (fVar213 + 1.0) +
                          auVar340._0_4_ + fVar213 * local_8c0;
                auVar97 = vdpps_avx(auVar218,auVar243,0x7f);
                auVar122 = vdpps_avx(_local_aa0,auVar173,0x7f);
                auVar79._4_4_ = fStack_89c;
                auVar79._0_4_ = local_8a0;
                auVar79._8_4_ = fStack_898;
                auVar79._12_4_ = aStack_894.a;
                auVar96 = vdpps_avx(auVar79,auVar243,0x7f);
                auVar5 = vdpps_avx(_local_aa0,auVar218,0x7f);
                fVar210 = auVar97._0_4_ + auVar122._0_4_;
                fVar212 = auVar18._0_4_;
                auVar98._0_4_ = fVar212 * fVar212;
                auVar98._4_4_ = auVar18._4_4_ * auVar18._4_4_;
                auVar98._8_4_ = auVar18._8_4_ * auVar18._8_4_;
                auVar98._12_4_ = auVar18._12_4_ * auVar18._12_4_;
                auVar122 = vsubps_avx(auVar19,auVar98);
                auVar97 = vdpps_avx(_local_aa0,auVar79,0x7f);
                fVar213 = auVar5._0_4_ - fVar212 * fVar210;
                fVar214 = auVar97._0_4_ - fVar212 * auVar96._0_4_;
                auVar97 = vrsqrtss_avx(auVar122,auVar122);
                fVar215 = auVar122._0_4_;
                fVar212 = auVar97._0_4_;
                fVar212 = fVar212 * 1.5 + fVar215 * -0.5 * fVar212 * fVar212 * fVar212;
                if (fVar215 < 0.0) {
                  local_940._0_16_ = auVar18;
                  local_a60._0_4_ = fVar193;
                  local_a80._0_16_ = auVar96;
                  local_960._0_16_ = ZEXT416((uint)fVar210);
                  local_780._0_4_ = fVar213;
                  local_7a0._0_4_ = fVar214;
                  local_7c0._0_4_ = fVar212;
                  fVar215 = sqrtf(fVar215);
                  auVar340 = ZEXT464((uint)local_a40._0_4_);
                  fVar212 = (float)local_7c0._0_4_;
                  fVar213 = (float)local_780._0_4_;
                  fVar214 = (float)local_7a0._0_4_;
                  auVar96 = local_a80._0_16_;
                  fVar193 = (float)local_a60._0_4_;
                  auVar18 = local_940._0_16_;
                  auVar97 = local_960._0_16_;
                }
                else {
                  auVar97 = vsqrtss_avx(auVar122,auVar122);
                  fVar215 = auVar97._0_4_;
                  auVar97 = ZEXT416((uint)fVar210);
                }
                auVar371 = ZEXT1664(auVar18);
                auVar353 = ZEXT464((uint)fVar193);
                auVar390 = ZEXT3264(local_a20);
                auVar5 = vpermilps_avx(local_8e0._0_16_,0xff);
                auVar349 = vshufps_avx(auVar292,auVar292,0xff);
                fVar213 = fVar213 * fVar212 - auVar349._0_4_;
                auVar196._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
                auVar196._8_4_ = auVar96._8_4_ ^ 0x80000000;
                auVar196._12_4_ = auVar96._12_4_ ^ 0x80000000;
                auVar219._0_4_ = -fVar213;
                auVar219._4_4_ = 0x80000000;
                auVar219._8_4_ = 0x80000000;
                auVar219._12_4_ = 0x80000000;
                fVar210 = auVar97._0_4_ * fVar214 * fVar212;
                auVar249 = ZEXT464((uint)fVar210);
                auVar122 = vinsertps_avx(auVar219,ZEXT416((uint)(fVar214 * fVar212)),0x1c);
                auVar96 = vmovsldup_avx(ZEXT416((uint)(fVar210 - auVar96._0_4_ * fVar213)));
                auVar122 = vdivps_avx(auVar122,auVar96);
                auVar97 = vinsertps_avx(auVar97,auVar196,0x10);
                auVar97 = vdivps_avx(auVar97,auVar96);
                auVar96 = vmovsldup_avx(auVar18);
                auVar99 = ZEXT416((uint)(fVar215 - auVar5._0_4_));
                auVar5 = vmovsldup_avx(auVar99);
                auVar154._0_4_ = auVar96._0_4_ * auVar122._0_4_ + auVar5._0_4_ * auVar97._0_4_;
                auVar154._4_4_ = auVar96._4_4_ * auVar122._4_4_ + auVar5._4_4_ * auVar97._4_4_;
                auVar154._8_4_ = auVar96._8_4_ * auVar122._8_4_ + auVar5._8_4_ * auVar97._8_4_;
                auVar154._12_4_ = auVar96._12_4_ * auVar122._12_4_ + auVar5._12_4_ * auVar97._12_4_;
                auVar97 = vsubps_avx(auVar175,auVar154);
                auVar329 = ZEXT1664(auVar97);
                auVar155._8_4_ = 0x7fffffff;
                auVar155._0_8_ = 0x7fffffff7fffffff;
                auVar155._12_4_ = 0x7fffffff;
                auVar175 = vandps_avx(auVar18,auVar155);
              } while (fVar193 <= auVar175._0_4_);
              auVar174._8_4_ = 0x7fffffff;
              auVar174._0_8_ = 0x7fffffff7fffffff;
              auVar174._12_4_ = 0x7fffffff;
              auVar175 = vandps_avx(auVar99,auVar174);
            } while ((float)local_7e0._0_4_ * 1.9073486e-06 + auVar340._0_4_ + fVar193 <=
                     auVar175._0_4_);
            fVar210 = auVar97._0_4_ + (float)local_870._0_4_;
            if ((ray->super_RayK<1>).org.field_0.m128[3] <= fVar210) {
              fVar212 = (ray->super_RayK<1>).tfar;
              auVar249 = ZEXT464((uint)fVar212);
              if (fVar210 <= fVar212) {
                auVar175 = vmovshdup_avx(auVar97);
                fVar213 = auVar175._0_4_;
                if ((0.0 <= fVar213) && (fVar213 <= 1.0)) {
                  auVar175 = vrsqrtss_avx(auVar19,auVar19);
                  fVar214 = auVar175._0_4_;
                  pGVar10 = (context->scene->geometries).items[uVar84].ptr;
                  if ((pGVar10->mask & (ray->super_RayK<1>).mask) != 0) {
                    auVar175 = ZEXT416((uint)(fVar214 * 1.5 +
                                             fVar211 * -0.5 * fVar214 * fVar214 * fVar214));
                    auVar175 = vshufps_avx(auVar175,auVar175,0);
                    auVar176._0_4_ = auVar175._0_4_ * (float)local_aa0._0_4_;
                    auVar176._4_4_ = auVar175._4_4_ * (float)local_aa0._4_4_;
                    auVar176._8_4_ = auVar175._8_4_ * fStack_a98;
                    auVar176._12_4_ = auVar175._12_4_ * fStack_a94;
                    auVar125._0_4_ = auVar292._0_4_ + auVar349._0_4_ * auVar176._0_4_;
                    auVar125._4_4_ = auVar292._4_4_ + auVar349._4_4_ * auVar176._4_4_;
                    auVar125._8_4_ = auVar292._8_4_ + auVar349._8_4_ * auVar176._8_4_;
                    auVar125._12_4_ = auVar292._12_4_ + auVar349._12_4_ * auVar176._12_4_;
                    auVar175 = vshufps_avx(auVar176,auVar176,0xc9);
                    auVar19 = vshufps_avx(auVar292,auVar292,0xc9);
                    auVar177._0_4_ = auVar19._0_4_ * auVar176._0_4_;
                    auVar177._4_4_ = auVar19._4_4_ * auVar176._4_4_;
                    auVar177._8_4_ = auVar19._8_4_ * auVar176._8_4_;
                    auVar177._12_4_ = auVar19._12_4_ * auVar176._12_4_;
                    auVar197._0_4_ = auVar292._0_4_ * auVar175._0_4_;
                    auVar197._4_4_ = auVar292._4_4_ * auVar175._4_4_;
                    auVar197._8_4_ = auVar292._8_4_ * auVar175._8_4_;
                    auVar197._12_4_ = auVar292._12_4_ * auVar175._12_4_;
                    auVar122 = vsubps_avx(auVar197,auVar177);
                    auVar175 = vshufps_avx(auVar122,auVar122,0xc9);
                    auVar19 = vshufps_avx(auVar125,auVar125,0xc9);
                    auVar198._0_4_ = auVar19._0_4_ * auVar175._0_4_;
                    auVar198._4_4_ = auVar19._4_4_ * auVar175._4_4_;
                    auVar198._8_4_ = auVar19._8_4_ * auVar175._8_4_;
                    auVar198._12_4_ = auVar19._12_4_ * auVar175._12_4_;
                    auVar175 = vshufps_avx(auVar122,auVar122,0xd2);
                    auVar126._0_4_ = auVar125._0_4_ * auVar175._0_4_;
                    auVar126._4_4_ = auVar125._4_4_ * auVar175._4_4_;
                    auVar126._8_4_ = auVar125._8_4_ * auVar175._8_4_;
                    auVar126._12_4_ = auVar125._12_4_ * auVar175._12_4_;
                    auVar19 = vsubps_avx(auVar198,auVar126);
                    auVar175 = vshufps_avx(auVar19,auVar19,0xe9);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      (ray->super_RayK<1>).tfar = fVar210;
                      uVar2 = vmovlps_avx(auVar175);
                      *(undefined8 *)&(ray->Ng).field_0 = uVar2;
                      (ray->Ng).field_0.field_0.z = auVar19._0_4_;
                      ray->u = fVar213;
                      ray->v = 0.0;
                      ray->primID = local_920._0_4_;
                      ray->geomID = uVar84;
                      ray->instID[0] = context->user->instID[0];
                      ray->instPrimID[0] = context->user->instPrimID[0];
                    }
                    else {
                      local_990 = vmovlps_avx(auVar175);
                      local_988 = auVar19._0_4_;
                      local_984 = fVar213;
                      local_980 = 0;
                      local_97c = local_920._0_4_;
                      local_978 = uVar84;
                      local_974 = context->user->instID[0];
                      local_970 = context->user->instPrimID[0];
                      (ray->super_RayK<1>).tfar = fVar210;
                      local_720._0_4_ = 0xffffffff;
                      local_ad8.valid = (int *)local_720;
                      local_ad8.geometryUserPtr = pGVar10->userPtr;
                      local_ad8.context = context->user;
                      local_ad8.hit = (RTCHitN *)&local_990;
                      local_ad8.N = 1;
                      local_ad8.ray = (RTCRayN *)ray;
                      if (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00a4f10d:
                        p_Var11 = context->args->filter;
                        if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar249 = ZEXT1664(auVar249._0_16_);
                          auVar329 = ZEXT1664(auVar329._0_16_);
                          auVar340 = ZEXT1664(auVar340._0_16_);
                          auVar353 = ZEXT1664(auVar353._0_16_);
                          auVar371 = ZEXT1664(auVar371._0_16_);
                          (*p_Var11)(&local_ad8);
                          auVar390 = ZEXT3264(local_a20);
                          if (*local_ad8.valid == 0) goto LAB_00a4f1ad;
                        }
                        (((Vec3f *)((long)local_ad8.ray + 0x30))->field_0).components[0] =
                             *(float *)local_ad8.hit;
                        (((Vec3f *)((long)local_ad8.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_ad8.hit + 4);
                        (((Vec3f *)((long)local_ad8.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_ad8.hit + 8);
                        *(float *)((long)local_ad8.ray + 0x3c) = *(float *)(local_ad8.hit + 0xc);
                        *(float *)((long)local_ad8.ray + 0x40) = *(float *)(local_ad8.hit + 0x10);
                        *(float *)((long)local_ad8.ray + 0x44) = *(float *)(local_ad8.hit + 0x14);
                        *(float *)((long)local_ad8.ray + 0x48) = *(float *)(local_ad8.hit + 0x18);
                        *(float *)((long)local_ad8.ray + 0x4c) = *(float *)(local_ad8.hit + 0x1c);
                        *(float *)((long)local_ad8.ray + 0x50) = *(float *)(local_ad8.hit + 0x20);
                      }
                      else {
                        auVar249 = ZEXT464((uint)fVar212);
                        auVar329 = ZEXT1664(auVar97);
                        auVar340 = ZEXT1664(auVar340._0_16_);
                        auVar353 = ZEXT464((uint)fVar193);
                        auVar371 = ZEXT1664(auVar18);
                        (*pGVar10->intersectionFilterN)(&local_ad8);
                        auVar390 = ZEXT3264(local_a20);
                        if (*local_ad8.valid != 0) goto LAB_00a4f10d;
LAB_00a4f1ad:
                        (ray->super_RayK<1>).tfar = fVar212;
                      }
                    }
                  }
                }
              }
            }
LAB_00a4eff7:
            fVar193 = (ray->super_RayK<1>).tfar;
            auVar111._4_4_ = fVar193;
            auVar111._0_4_ = fVar193;
            auVar111._8_4_ = fVar193;
            auVar111._12_4_ = fVar193;
            auVar111._16_4_ = fVar193;
            auVar111._20_4_ = fVar193;
            auVar111._24_4_ = fVar193;
            auVar111._28_4_ = fVar193;
            auVar102 = vcmpps_avx(_local_840,auVar111,2);
            auVar102 = vandps_avx(auVar102,local_3e0);
          }
          auVar143._0_4_ = local_900._0_4_ + (float)local_820._0_4_;
          auVar143._4_4_ = local_900._4_4_ + (float)local_820._4_4_;
          auVar143._8_4_ = local_900._8_4_ + fStack_818;
          auVar143._12_4_ = local_900._12_4_ + fStack_814;
          auVar143._16_4_ = local_900._16_4_ + fStack_810;
          auVar143._20_4_ = local_900._20_4_ + fStack_80c;
          auVar143._24_4_ = local_900._24_4_ + fStack_808;
          auVar143._28_4_ = local_900._28_4_ + fStack_804;
          auVar102 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
          fVar193 = (ray->super_RayK<1>).tfar;
          auVar163._4_4_ = fVar193;
          auVar163._0_4_ = fVar193;
          auVar163._8_4_ = fVar193;
          auVar163._12_4_ = fVar193;
          auVar163._16_4_ = fVar193;
          auVar163._20_4_ = fVar193;
          auVar163._24_4_ = fVar193;
          auVar163._28_4_ = fVar193;
          auVar108 = vcmpps_avx(auVar143,auVar163,2);
          _local_840 = vandps_avx(auVar108,_local_860);
          auVar144._8_4_ = 3;
          auVar144._0_8_ = 0x300000003;
          auVar144._12_4_ = 3;
          auVar144._16_4_ = 3;
          auVar144._20_4_ = 3;
          auVar144._24_4_ = 3;
          auVar144._28_4_ = 3;
          auVar164._8_4_ = 2;
          auVar164._0_8_ = 0x200000002;
          auVar164._12_4_ = 2;
          auVar164._16_4_ = 2;
          auVar164._20_4_ = 2;
          auVar164._24_4_ = 2;
          auVar164._28_4_ = 2;
          auVar108 = vblendvps_avx(auVar164,auVar144,local_6e0);
          auVar175 = vpcmpgtd_avx(auVar108._16_16_,local_700._0_16_);
          auVar19 = vpshufd_avx(local_760._0_16_,0);
          auVar19 = vpcmpgtd_avx(auVar108._0_16_,auVar19);
          auVar165._16_16_ = auVar175;
          auVar165._0_16_ = auVar102._0_16_;
          _local_860 = vblendps_avx(ZEXT1632(auVar19),auVar165,0xf0);
          auVar108 = vandnps_avx(_local_860,_local_840);
          local_740 = _local_620;
          local_820._4_4_ = local_900._4_4_ + (float)local_620._4_4_;
          local_820._0_4_ = local_900._0_4_ + (float)local_620._0_4_;
          fStack_818 = local_900._8_4_ + fStack_618;
          fStack_814 = local_900._12_4_ + fStack_614;
          fStack_810 = local_900._16_4_ + fStack_610;
          fStack_80c = local_900._20_4_ + fStack_60c;
          fStack_808 = local_900._24_4_ + fStack_608;
          fStack_804 = local_900._28_4_ + fStack_604;
          while( true ) {
            auVar281 = ZEXT3264(local_900);
            local_720 = auVar108;
            if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar108 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar108 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar108 >> 0x7f,0) == '\0') &&
                  (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar108 >> 0xbf,0) == '\0') &&
                (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar108[0x1f]) break;
            auVar112._8_4_ = 0x7f800000;
            auVar112._0_8_ = 0x7f8000007f800000;
            auVar112._12_4_ = 0x7f800000;
            auVar112._16_4_ = 0x7f800000;
            auVar112._20_4_ = 0x7f800000;
            auVar112._24_4_ = 0x7f800000;
            auVar112._28_4_ = 0x7f800000;
            auVar102 = vblendvps_avx(auVar112,local_740,auVar108);
            auVar14 = vshufps_avx(auVar102,auVar102,0xb1);
            auVar14 = vminps_avx(auVar102,auVar14);
            auVar337 = vshufpd_avx(auVar14,auVar14,5);
            auVar14 = vminps_avx(auVar14,auVar337);
            auVar337 = vperm2f128_avx(auVar14,auVar14,1);
            auVar14 = vminps_avx(auVar14,auVar337);
            auVar102 = vcmpps_avx(auVar102,auVar14,0);
            auVar14 = auVar108 & auVar102;
            if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar14 >> 0x7f,0) != '\0') ||
                  (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar14 >> 0xbf,0) != '\0') ||
                (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar14[0x1f] < '\0') {
              auVar108 = vandps_avx(auVar102,auVar108);
            }
            uVar85 = vmovmskps_avx(auVar108);
            uVar90 = 0;
            if (uVar85 != 0) {
              for (; (uVar85 >> uVar90 & 1) == 0; uVar90 = uVar90 + 1) {
              }
            }
            uVar88 = (ulong)uVar90;
            *(undefined4 *)(local_720 + uVar88 * 4) = 0;
            aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
            local_8a0 = aVar3.x;
            fStack_89c = aVar3.y;
            fStack_898 = aVar3.z;
            aStack_894 = aVar3.field_3;
            auVar175 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
            fVar193 = local_1c0[uVar88];
            uVar90 = *(uint *)(local_600 + uVar88 * 4);
            if (auVar175._0_4_ < 0.0) {
              auVar329 = ZEXT1664(auVar329._0_16_);
              auVar353 = ZEXT1664(auVar353._0_16_);
              auVar371 = ZEXT1664(auVar371._0_16_);
              fVar210 = sqrtf(auVar175._0_4_);
              auVar390 = ZEXT3264(local_a20);
            }
            else {
              auVar175 = vsqrtss_avx(auVar175,auVar175);
              fVar210 = auVar175._0_4_;
            }
            auVar249 = ZEXT464((uint)fVar193);
            auVar19 = vminps_avx(_local_9d0,_local_9f0);
            auVar175 = vmaxps_avx(_local_9d0,_local_9f0);
            auVar18 = vminps_avx(_local_9e0,_local_a00);
            auVar97 = vminps_avx(auVar19,auVar18);
            auVar19 = vmaxps_avx(_local_9e0,_local_a00);
            auVar18 = vmaxps_avx(auVar175,auVar19);
            auVar178._8_4_ = 0x7fffffff;
            auVar178._0_8_ = 0x7fffffff7fffffff;
            auVar178._12_4_ = 0x7fffffff;
            auVar175 = vandps_avx(auVar97,auVar178);
            auVar19 = vandps_avx(auVar18,auVar178);
            auVar175 = vmaxps_avx(auVar175,auVar19);
            auVar19 = vmovshdup_avx(auVar175);
            auVar19 = vmaxss_avx(auVar19,auVar175);
            auVar175 = vshufpd_avx(auVar175,auVar175,1);
            auVar175 = vmaxss_avx(auVar175,auVar19);
            local_8c0 = auVar175._0_4_ * 1.9073486e-06;
            local_940._0_4_ = fVar210 * 1.9073486e-06;
            local_7e0._0_16_ = vshufps_avx(auVar18,auVar18,0xff);
            auVar175 = vinsertps_avx(ZEXT416(uVar90),ZEXT416((uint)fVar193),0x10);
            auVar340 = ZEXT1664(auVar175);
            lVar86 = 5;
            do {
              do {
                auVar175 = auVar340._0_16_;
                bVar92 = lVar86 == 0;
                lVar86 = lVar86 + -1;
                if (bVar92) goto LAB_00a4fa9d;
                auVar18 = vmovshdup_avx(auVar175);
                fVar193 = auVar18._0_4_;
                fVar215 = 1.0 - fVar193;
                fVar210 = fVar215 * fVar215;
                fVar211 = fVar215 * fVar210;
                fVar212 = fVar193 * fVar193;
                fVar213 = fVar193 * fVar212;
                fVar214 = fVar193 * fVar215;
                auVar19 = vshufps_avx(ZEXT416((uint)(fVar213 * 0.16666667)),
                                      ZEXT416((uint)(fVar213 * 0.16666667)),0);
                auVar97 = ZEXT416((uint)((fVar213 * 4.0 + fVar211 +
                                         fVar193 * fVar214 * 12.0 + fVar215 * fVar214 * 6.0) *
                                        0.16666667));
                auVar97 = vshufps_avx(auVar97,auVar97,0);
                auVar122 = ZEXT416((uint)((fVar211 * 4.0 + fVar213 +
                                          fVar215 * fVar214 * 12.0 + fVar193 * fVar214 * 6.0) *
                                         0.16666667));
                auVar122 = vshufps_avx(auVar122,auVar122,0);
                auVar96 = vshufps_avx(auVar175,auVar175,0);
                auVar156._0_4_ = auVar96._0_4_ * local_8a0 + 0.0;
                auVar156._4_4_ = auVar96._4_4_ * fStack_89c + 0.0;
                auVar156._8_4_ = auVar96._8_4_ * fStack_898 + 0.0;
                auVar156._12_4_ = auVar96._12_4_ * aStack_894.w + 0.0;
                auVar96 = vshufps_avx(ZEXT416((uint)(fVar211 * 0.16666667)),
                                      ZEXT416((uint)(fVar211 * 0.16666667)),0);
                auVar100._0_4_ =
                     auVar96._0_4_ * (float)local_9d0._0_4_ +
                     auVar122._0_4_ * (float)local_9f0._0_4_ +
                     auVar19._0_4_ * (float)local_a00._0_4_ + auVar97._0_4_ * (float)local_9e0._0_4_
                ;
                auVar100._4_4_ =
                     auVar96._4_4_ * (float)local_9d0._4_4_ +
                     auVar122._4_4_ * (float)local_9f0._4_4_ +
                     auVar19._4_4_ * (float)local_a00._4_4_ + auVar97._4_4_ * (float)local_9e0._4_4_
                ;
                auVar100._8_4_ =
                     auVar96._8_4_ * fStack_9c8 +
                     auVar122._8_4_ * fStack_9e8 +
                     auVar19._8_4_ * fStack_9f8 + auVar97._8_4_ * fStack_9d8;
                auVar100._12_4_ =
                     auVar96._12_4_ * fStack_9c4 +
                     auVar122._12_4_ * fStack_9e4 +
                     auVar19._12_4_ * fStack_9f4 + auVar97._12_4_ * fStack_9d4;
                local_8e0._0_16_ = auVar100;
                auVar19 = vsubps_avx(auVar156,auVar100);
                _local_aa0 = auVar19;
                auVar19 = vdpps_avx(auVar19,auVar19,0x7f);
                fVar211 = auVar19._0_4_;
                if (fVar211 < 0.0) {
                  local_a40._0_16_ = auVar18;
                  local_9c0._0_4_ = fVar212;
                  local_a60._0_4_ = fVar210;
                  local_a80._0_4_ = fVar214;
                  fVar213 = sqrtf(fVar211);
                  fVar210 = (float)local_a60._0_4_;
                  fVar212 = (float)local_9c0._0_4_;
                  fVar214 = (float)local_a80._0_4_;
                  fVar193 = (float)local_a40._0_4_;
                }
                else {
                  auVar18 = vsqrtss_avx(auVar19,auVar19);
                  fVar213 = auVar18._0_4_;
                }
                auVar353 = ZEXT464((uint)fVar215);
                auVar18 = vshufps_avx(ZEXT416((uint)(fVar212 * 0.5)),ZEXT416((uint)(fVar212 * 0.5)),
                                      0);
                auVar97 = ZEXT416((uint)((fVar210 + fVar214 * 4.0) * 0.5));
                auVar97 = vshufps_avx(auVar97,auVar97,0);
                auVar122 = ZEXT416((uint)((fVar193 * -fVar193 - fVar214 * 4.0) * 0.5));
                auVar122 = vshufps_avx(auVar122,auVar122,0);
                auVar96 = ZEXT416((uint)(fVar215 * -fVar215 * 0.5));
                auVar96 = vshufps_avx(auVar96,auVar96,0);
                auVar293._0_4_ =
                     (float)local_9d0._0_4_ * auVar96._0_4_ +
                     (float)local_9f0._0_4_ * auVar122._0_4_ +
                     (float)local_a00._0_4_ * auVar18._0_4_ + (float)local_9e0._0_4_ * auVar97._0_4_
                ;
                auVar293._4_4_ =
                     (float)local_9d0._4_4_ * auVar96._4_4_ +
                     (float)local_9f0._4_4_ * auVar122._4_4_ +
                     (float)local_a00._4_4_ * auVar18._4_4_ + (float)local_9e0._4_4_ * auVar97._4_4_
                ;
                auVar293._8_4_ =
                     fStack_9c8 * auVar96._8_4_ +
                     fStack_9e8 * auVar122._8_4_ +
                     fStack_9f8 * auVar18._8_4_ + fStack_9d8 * auVar97._8_4_;
                auVar293._12_4_ =
                     fStack_9c4 * auVar96._12_4_ +
                     fStack_9e4 * auVar122._12_4_ +
                     fStack_9f4 * auVar18._12_4_ + fStack_9d4 * auVar97._12_4_;
                auVar18 = vshufps_avx(auVar175,auVar175,0x55);
                auVar97 = ZEXT416((uint)(fVar215 - (fVar193 + fVar193)));
                auVar122 = vshufps_avx(auVar97,auVar97,0);
                auVar97 = ZEXT416((uint)(fVar193 - (fVar215 + fVar215)));
                auVar96 = vshufps_avx(auVar97,auVar97,0);
                auVar349 = ZEXT416((uint)fVar215);
                auVar5 = vshufps_avx(auVar349,auVar349,0);
                auVar97 = vdpps_avx(auVar293,auVar293,0x7f);
                auVar127._0_4_ =
                     (float)local_9d0._0_4_ * auVar5._0_4_ +
                     (float)local_9f0._0_4_ * auVar96._0_4_ +
                     (float)local_a00._0_4_ * auVar18._0_4_ +
                     (float)local_9e0._0_4_ * auVar122._0_4_;
                auVar127._4_4_ =
                     (float)local_9d0._4_4_ * auVar5._4_4_ +
                     (float)local_9f0._4_4_ * auVar96._4_4_ +
                     (float)local_a00._4_4_ * auVar18._4_4_ +
                     (float)local_9e0._4_4_ * auVar122._4_4_;
                auVar127._8_4_ =
                     fStack_9c8 * auVar5._8_4_ +
                     fStack_9e8 * auVar96._8_4_ +
                     fStack_9f8 * auVar18._8_4_ + fStack_9d8 * auVar122._8_4_;
                auVar127._12_4_ =
                     fStack_9c4 * auVar5._12_4_ +
                     fStack_9e4 * auVar96._12_4_ +
                     fStack_9f4 * auVar18._12_4_ + fStack_9d4 * auVar122._12_4_;
                auVar18 = vblendps_avx(auVar97,_DAT_01f45a50,0xe);
                auVar122 = vrsqrtss_avx(auVar18,auVar18);
                fVar210 = auVar122._0_4_;
                fVar193 = auVar97._0_4_;
                auVar122 = vdpps_avx(auVar293,auVar127,0x7f);
                auVar96 = vshufps_avx(auVar97,auVar97,0);
                auVar128._0_4_ = auVar127._0_4_ * auVar96._0_4_;
                auVar128._4_4_ = auVar127._4_4_ * auVar96._4_4_;
                auVar128._8_4_ = auVar127._8_4_ * auVar96._8_4_;
                auVar128._12_4_ = auVar127._12_4_ * auVar96._12_4_;
                auVar122 = vshufps_avx(auVar122,auVar122,0);
                auVar199._0_4_ = auVar293._0_4_ * auVar122._0_4_;
                auVar199._4_4_ = auVar293._4_4_ * auVar122._4_4_;
                auVar199._8_4_ = auVar293._8_4_ * auVar122._8_4_;
                auVar199._12_4_ = auVar293._12_4_ * auVar122._12_4_;
                auVar5 = vsubps_avx(auVar128,auVar199);
                auVar122 = vrcpss_avx(auVar18,auVar18);
                auVar18 = vmaxss_avx(ZEXT416((uint)local_8c0),
                                     ZEXT416((uint)(auVar340._0_4_ * (float)local_940._0_4_)));
                auVar371 = ZEXT1664(auVar18);
                auVar122 = ZEXT416((uint)(auVar122._0_4_ * (2.0 - fVar193 * auVar122._0_4_)));
                auVar122 = vshufps_avx(auVar122,auVar122,0);
                uVar88 = CONCAT44(auVar293._4_4_,auVar293._0_4_);
                auVar220._0_8_ = uVar88 ^ 0x8000000080000000;
                auVar220._8_4_ = -auVar293._8_4_;
                auVar220._12_4_ = -auVar293._12_4_;
                auVar96 = ZEXT416((uint)(fVar210 * 1.5 +
                                        fVar193 * -0.5 * fVar210 * fVar210 * fVar210));
                auVar96 = vshufps_avx(auVar96,auVar96,0);
                auVar179._0_4_ = auVar96._0_4_ * auVar5._0_4_ * auVar122._0_4_;
                auVar179._4_4_ = auVar96._4_4_ * auVar5._4_4_ * auVar122._4_4_;
                auVar179._8_4_ = auVar96._8_4_ * auVar5._8_4_ * auVar122._8_4_;
                auVar179._12_4_ = auVar96._12_4_ * auVar5._12_4_ * auVar122._12_4_;
                auVar244._0_4_ = auVar293._0_4_ * auVar96._0_4_;
                auVar244._4_4_ = auVar293._4_4_ * auVar96._4_4_;
                auVar244._8_4_ = auVar293._8_4_ * auVar96._8_4_;
                auVar244._12_4_ = auVar293._12_4_ * auVar96._12_4_;
                local_a40._0_4_ = auVar18._0_4_;
                if (fVar193 < 0.0) {
                  local_9c0._0_4_ = fVar213;
                  local_a60._0_16_ = auVar220;
                  local_a80._0_16_ = auVar244;
                  local_960._0_16_ = auVar179;
                  auVar353 = ZEXT1664(auVar349);
                  fVar193 = sqrtf(fVar193);
                  auVar371 = ZEXT464((uint)local_a40._0_4_);
                  auVar179 = local_960._0_16_;
                  auVar220 = local_a60._0_16_;
                  auVar244 = local_a80._0_16_;
                }
                else {
                  auVar18 = vsqrtss_avx(auVar97,auVar97);
                  fVar193 = auVar18._0_4_;
                  local_9c0._0_4_ = fVar213;
                }
                auVar18 = vdpps_avx(_local_aa0,auVar244,0x7f);
                fVar193 = (local_8c0 / fVar193) * ((float)local_9c0._0_4_ + 1.0) +
                          auVar371._0_4_ + (float)local_9c0._0_4_ * local_8c0;
                auVar97 = vdpps_avx(auVar220,auVar244,0x7f);
                auVar122 = vdpps_avx(_local_aa0,auVar179,0x7f);
                auVar80._4_4_ = fStack_89c;
                auVar80._0_4_ = local_8a0;
                auVar80._8_4_ = fStack_898;
                auVar80._12_4_ = aStack_894.a;
                auVar96 = vdpps_avx(auVar80,auVar244,0x7f);
                auVar5 = vdpps_avx(_local_aa0,auVar220,0x7f);
                fVar210 = auVar97._0_4_ + auVar122._0_4_;
                fVar212 = auVar18._0_4_;
                auVar101._0_4_ = fVar212 * fVar212;
                auVar101._4_4_ = auVar18._4_4_ * auVar18._4_4_;
                auVar101._8_4_ = auVar18._8_4_ * auVar18._8_4_;
                auVar101._12_4_ = auVar18._12_4_ * auVar18._12_4_;
                auVar122 = vsubps_avx(auVar19,auVar101);
                local_9c0._0_16_ = ZEXT416((uint)fVar210);
                auVar97 = vdpps_avx(_local_aa0,auVar80,0x7f);
                fVar213 = auVar5._0_4_ - fVar212 * fVar210;
                fVar212 = auVar97._0_4_ - fVar212 * auVar96._0_4_;
                auVar97 = vrsqrtss_avx(auVar122,auVar122);
                fVar214 = auVar122._0_4_;
                fVar210 = auVar97._0_4_;
                fVar210 = fVar210 * 1.5 + fVar214 * -0.5 * fVar210 * fVar210 * fVar210;
                if (fVar214 < 0.0) {
                  local_a60._0_16_ = auVar18;
                  local_a80._0_4_ = fVar193;
                  local_960._0_16_ = auVar96;
                  local_780._0_4_ = fVar213;
                  local_7a0._0_4_ = fVar212;
                  local_7c0._0_4_ = fVar210;
                  auVar353 = ZEXT1664(auVar353._0_16_);
                  fVar214 = sqrtf(fVar214);
                  auVar371 = ZEXT464((uint)local_a40._0_4_);
                  fVar210 = (float)local_7c0._0_4_;
                  fVar213 = (float)local_780._0_4_;
                  fVar212 = (float)local_7a0._0_4_;
                  auVar96 = local_960._0_16_;
                  auVar18 = local_a60._0_16_;
                  fVar193 = (float)local_a80._0_4_;
                }
                else {
                  auVar97 = vsqrtss_avx(auVar122,auVar122);
                  fVar214 = auVar97._0_4_;
                }
                auVar390 = ZEXT3264(local_a20);
                auVar5 = vpermilps_avx(local_8e0._0_16_,0xff);
                auVar349 = vshufps_avx(auVar293,auVar293,0xff);
                fVar215 = fVar213 * fVar210 - auVar349._0_4_;
                auVar200._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
                auVar200._8_4_ = auVar96._8_4_ ^ 0x80000000;
                auVar200._12_4_ = auVar96._12_4_ ^ 0x80000000;
                auVar221._0_4_ = -fVar215;
                auVar221._4_4_ = 0x80000000;
                auVar221._8_4_ = 0x80000000;
                auVar221._12_4_ = 0x80000000;
                auVar329 = ZEXT1664(local_9c0._0_16_);
                fVar213 = local_9c0._0_4_ * fVar212 * fVar210;
                auVar249 = ZEXT464((uint)fVar213);
                auVar97 = vinsertps_avx(auVar221,ZEXT416((uint)(fVar212 * fVar210)),0x1c);
                auVar96 = vmovsldup_avx(ZEXT416((uint)(fVar213 - auVar96._0_4_ * fVar215)));
                auVar97 = vdivps_avx(auVar97,auVar96);
                auVar122 = vinsertps_avx(local_9c0._0_16_,auVar200,0x10);
                auVar122 = vdivps_avx(auVar122,auVar96);
                auVar96 = vmovsldup_avx(auVar18);
                auVar99 = ZEXT416((uint)(fVar214 - auVar5._0_4_));
                auVar5 = vmovsldup_avx(auVar99);
                auVar157._0_4_ = auVar96._0_4_ * auVar97._0_4_ + auVar5._0_4_ * auVar122._0_4_;
                auVar157._4_4_ = auVar96._4_4_ * auVar97._4_4_ + auVar5._4_4_ * auVar122._4_4_;
                auVar157._8_4_ = auVar96._8_4_ * auVar97._8_4_ + auVar5._8_4_ * auVar122._8_4_;
                auVar157._12_4_ = auVar96._12_4_ * auVar97._12_4_ + auVar5._12_4_ * auVar122._12_4_;
                auVar97 = vsubps_avx(auVar175,auVar157);
                auVar340 = ZEXT1664(auVar97);
                auVar158._8_4_ = 0x7fffffff;
                auVar158._0_8_ = 0x7fffffff7fffffff;
                auVar158._12_4_ = 0x7fffffff;
                auVar175 = vandps_avx(auVar18,auVar158);
              } while (fVar193 <= auVar175._0_4_);
              auVar180._8_4_ = 0x7fffffff;
              auVar180._0_8_ = 0x7fffffff7fffffff;
              auVar180._12_4_ = 0x7fffffff;
              auVar175 = vandps_avx(auVar99,auVar180);
            } while ((float)local_7e0._0_4_ * 1.9073486e-06 + auVar371._0_4_ + fVar193 <=
                     auVar175._0_4_);
            fVar193 = auVar97._0_4_ + (float)local_870._0_4_;
            if ((ray->super_RayK<1>).org.field_0.m128[3] <= fVar193) {
              fVar210 = (ray->super_RayK<1>).tfar;
              auVar249 = ZEXT464((uint)fVar210);
              if (fVar193 <= fVar210) {
                auVar175 = vmovshdup_avx(auVar97);
                fVar212 = auVar175._0_4_;
                if ((0.0 <= fVar212) && (fVar212 <= 1.0)) {
                  auVar175 = vrsqrtss_avx(auVar19,auVar19);
                  fVar213 = auVar175._0_4_;
                  pGVar10 = (context->scene->geometries).items[uVar84].ptr;
                  if ((pGVar10->mask & (ray->super_RayK<1>).mask) != 0) {
                    auVar175 = ZEXT416((uint)(fVar213 * 1.5 +
                                             fVar211 * -0.5 * fVar213 * fVar213 * fVar213));
                    auVar175 = vshufps_avx(auVar175,auVar175,0);
                    auVar181._0_4_ = auVar175._0_4_ * (float)local_aa0._0_4_;
                    auVar181._4_4_ = auVar175._4_4_ * (float)local_aa0._4_4_;
                    auVar181._8_4_ = auVar175._8_4_ * fStack_a98;
                    auVar181._12_4_ = auVar175._12_4_ * fStack_a94;
                    auVar129._0_4_ = auVar293._0_4_ + auVar349._0_4_ * auVar181._0_4_;
                    auVar129._4_4_ = auVar293._4_4_ + auVar349._4_4_ * auVar181._4_4_;
                    auVar129._8_4_ = auVar293._8_4_ + auVar349._8_4_ * auVar181._8_4_;
                    auVar129._12_4_ = auVar293._12_4_ + auVar349._12_4_ * auVar181._12_4_;
                    auVar175 = vshufps_avx(auVar181,auVar181,0xc9);
                    auVar19 = vshufps_avx(auVar293,auVar293,0xc9);
                    auVar182._0_4_ = auVar19._0_4_ * auVar181._0_4_;
                    auVar182._4_4_ = auVar19._4_4_ * auVar181._4_4_;
                    auVar182._8_4_ = auVar19._8_4_ * auVar181._8_4_;
                    auVar182._12_4_ = auVar19._12_4_ * auVar181._12_4_;
                    auVar201._0_4_ = auVar293._0_4_ * auVar175._0_4_;
                    auVar201._4_4_ = auVar293._4_4_ * auVar175._4_4_;
                    auVar201._8_4_ = auVar293._8_4_ * auVar175._8_4_;
                    auVar201._12_4_ = auVar293._12_4_ * auVar175._12_4_;
                    auVar18 = vsubps_avx(auVar201,auVar182);
                    auVar175 = vshufps_avx(auVar18,auVar18,0xc9);
                    auVar19 = vshufps_avx(auVar129,auVar129,0xc9);
                    auVar202._0_4_ = auVar19._0_4_ * auVar175._0_4_;
                    auVar202._4_4_ = auVar19._4_4_ * auVar175._4_4_;
                    auVar202._8_4_ = auVar19._8_4_ * auVar175._8_4_;
                    auVar202._12_4_ = auVar19._12_4_ * auVar175._12_4_;
                    auVar175 = vshufps_avx(auVar18,auVar18,0xd2);
                    auVar130._0_4_ = auVar129._0_4_ * auVar175._0_4_;
                    auVar130._4_4_ = auVar129._4_4_ * auVar175._4_4_;
                    auVar130._8_4_ = auVar129._8_4_ * auVar175._8_4_;
                    auVar130._12_4_ = auVar129._12_4_ * auVar175._12_4_;
                    auVar19 = vsubps_avx(auVar202,auVar130);
                    auVar175 = vshufps_avx(auVar19,auVar19,0xe9);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      (ray->super_RayK<1>).tfar = fVar193;
                      uVar2 = vmovlps_avx(auVar175);
                      *(undefined8 *)&(ray->Ng).field_0 = uVar2;
                      (ray->Ng).field_0.field_0.z = auVar19._0_4_;
                      ray->u = fVar212;
                      ray->v = 0.0;
                      ray->primID = local_920._0_4_;
                      ray->geomID = uVar84;
                      ray->instID[0] = context->user->instID[0];
                      ray->instPrimID[0] = context->user->instPrimID[0];
                    }
                    else {
                      local_990 = vmovlps_avx(auVar175);
                      local_988 = auVar19._0_4_;
                      local_984 = fVar212;
                      local_980 = 0;
                      local_97c = local_920._0_4_;
                      local_978 = uVar84;
                      local_974 = context->user->instID[0];
                      local_970 = context->user->instPrimID[0];
                      (ray->super_RayK<1>).tfar = fVar193;
                      local_aa4 = -1;
                      local_ad8.valid = &local_aa4;
                      local_ad8.geometryUserPtr = pGVar10->userPtr;
                      local_ad8.context = context->user;
                      local_ad8.hit = (RTCHitN *)&local_990;
                      local_ad8.N = 1;
                      local_ad8.ray = (RTCRayN *)ray;
                      if (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00a4fbb9:
                        p_Var11 = context->args->filter;
                        if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar249 = ZEXT1664(auVar249._0_16_);
                          auVar329 = ZEXT1664(auVar329._0_16_);
                          auVar340 = ZEXT1664(auVar340._0_16_);
                          auVar353 = ZEXT1664(auVar353._0_16_);
                          auVar371 = ZEXT1664(auVar371._0_16_);
                          (*p_Var11)(&local_ad8);
                          auVar390 = ZEXT3264(local_a20);
                          if (*local_ad8.valid == 0) goto LAB_00a4fc59;
                        }
                        (((Vec3f *)((long)local_ad8.ray + 0x30))->field_0).components[0] =
                             *(float *)local_ad8.hit;
                        (((Vec3f *)((long)local_ad8.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_ad8.hit + 4);
                        (((Vec3f *)((long)local_ad8.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_ad8.hit + 8);
                        *(float *)((long)local_ad8.ray + 0x3c) = *(float *)(local_ad8.hit + 0xc);
                        *(float *)((long)local_ad8.ray + 0x40) = *(float *)(local_ad8.hit + 0x10);
                        *(float *)((long)local_ad8.ray + 0x44) = *(float *)(local_ad8.hit + 0x14);
                        *(float *)((long)local_ad8.ray + 0x48) = *(float *)(local_ad8.hit + 0x18);
                        *(float *)((long)local_ad8.ray + 0x4c) = *(float *)(local_ad8.hit + 0x1c);
                        *(float *)((long)local_ad8.ray + 0x50) = *(float *)(local_ad8.hit + 0x20);
                      }
                      else {
                        auVar249 = ZEXT464((uint)fVar210);
                        auVar329 = ZEXT1664(local_9c0._0_16_);
                        auVar340 = ZEXT1664(auVar97);
                        auVar353 = ZEXT1664(auVar353._0_16_);
                        auVar371 = ZEXT1664(auVar371._0_16_);
                        (*pGVar10->intersectionFilterN)(&local_ad8);
                        auVar390 = ZEXT3264(local_a20);
                        if (*local_ad8.valid != 0) goto LAB_00a4fbb9;
LAB_00a4fc59:
                        (ray->super_RayK<1>).tfar = fVar210;
                      }
                    }
                  }
                }
              }
            }
LAB_00a4fa9d:
            fVar193 = (ray->super_RayK<1>).tfar;
            auVar145._4_4_ = fVar193;
            auVar145._0_4_ = fVar193;
            auVar145._8_4_ = fVar193;
            auVar145._12_4_ = fVar193;
            auVar145._16_4_ = fVar193;
            auVar145._20_4_ = fVar193;
            auVar145._24_4_ = fVar193;
            auVar145._28_4_ = fVar193;
            auVar102 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
            auVar108 = vcmpps_avx(_local_820,auVar145,2);
            auVar108 = vandps_avx(auVar108,local_720);
          }
          auVar108 = vandps_avx(local_6c0,local_6a0);
          auVar14 = vandps_avx(_local_860,_local_840);
          auVar207._0_4_ = local_900._0_4_ + local_5e0._0_4_;
          auVar207._4_4_ = local_900._4_4_ + local_5e0._4_4_;
          auVar207._8_4_ = local_900._8_4_ + local_5e0._8_4_;
          auVar207._12_4_ = local_900._12_4_ + local_5e0._12_4_;
          auVar207._16_4_ = local_900._16_4_ + local_5e0._16_4_;
          auVar207._20_4_ = local_900._20_4_ + local_5e0._20_4_;
          auVar207._24_4_ = local_900._24_4_ + local_5e0._24_4_;
          auVar207._28_4_ = local_900._28_4_ + local_5e0._28_4_;
          auVar175 = vshufps_avx(auVar102._0_16_,auVar102._0_16_,0);
          auVar230._16_16_ = auVar175;
          auVar230._0_16_ = auVar175;
          auVar232 = ZEXT3264(auVar230);
          auVar102 = vcmpps_avx(auVar207,auVar230,2);
          auVar102 = vandps_avx(auVar102,auVar108);
          auVar208._0_4_ = local_900._0_4_ + local_620._0_4_;
          auVar208._4_4_ = local_900._4_4_ + local_620._4_4_;
          auVar208._8_4_ = local_900._8_4_ + local_620._8_4_;
          auVar208._12_4_ = local_900._12_4_ + local_620._12_4_;
          auVar208._16_4_ = local_900._16_4_ + local_620._16_4_;
          auVar208._20_4_ = local_900._20_4_ + local_620._20_4_;
          auVar208._24_4_ = local_900._24_4_ + local_620._24_4_;
          auVar208._28_4_ = local_900._28_4_ + local_620._28_4_;
          auVar108 = vcmpps_avx(auVar208,auVar230,2);
          auVar108 = vandps_avx(auVar108,auVar14);
          auVar108 = vorps_avx(auVar102,auVar108);
          if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar108 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar108 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar108 >> 0x7f,0) != '\0') ||
                (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar108 >> 0xbf,0) != '\0') ||
              (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar108[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar91 * 0x60) = auVar108;
            auVar102 = vblendvps_avx(_local_620,local_5e0,auVar102);
            *(undefined1 (*) [32])(auStack_160 + uVar91 * 0x60) = auVar102;
            uVar88 = vmovlps_avx(local_630);
            (&uStack_140)[uVar91 * 0xc] = uVar88;
            auStack_138[uVar91 * 0x18] = local_b4c + 1;
            uVar91 = (ulong)((int)uVar91 + 1);
          }
          goto LAB_00a4e59e;
        }
      }
      auVar390 = ZEXT3264(local_a20);
      auVar281 = ZEXT3264(local_900);
    }
LAB_00a4e59e:
    fVar193 = (ray->super_RayK<1>).tfar;
    auVar138._4_4_ = fVar193;
    auVar138._0_4_ = fVar193;
    auVar138._8_4_ = fVar193;
    auVar138._12_4_ = fVar193;
    auVar138._16_4_ = fVar193;
    auVar138._20_4_ = fVar193;
    auVar138._24_4_ = fVar193;
    auVar138._28_4_ = fVar193;
    while( true ) {
      uVar90 = (uint)uVar91;
      if (uVar90 == 0) {
        auVar102 = vcmpps_avx(local_360,auVar138,2);
        uVar84 = vmovmskps_avx(auVar102);
        uVar84 = (uint)uVar89 & uVar84;
        goto LAB_00a4d4b5;
      }
      uVar88 = (ulong)(uVar90 - 1);
      lVar86 = uVar88 * 0x60;
      auVar102 = *(undefined1 (*) [32])(auStack_160 + lVar86);
      auVar107._0_4_ = auVar281._0_4_ + auVar102._0_4_;
      auVar107._4_4_ = auVar281._4_4_ + auVar102._4_4_;
      auVar107._8_4_ = auVar281._8_4_ + auVar102._8_4_;
      auVar107._12_4_ = auVar281._12_4_ + auVar102._12_4_;
      auVar107._16_4_ = auVar281._16_4_ + auVar102._16_4_;
      auVar107._20_4_ = auVar281._20_4_ + auVar102._20_4_;
      auVar107._24_4_ = auVar281._24_4_ + auVar102._24_4_;
      auVar107._28_4_ = auVar281._28_4_ + auVar102._28_4_;
      auVar14 = vcmpps_avx(auVar107,auVar138,2);
      auVar108 = vandps_avx(auVar14,*(undefined1 (*) [32])(auStack_180 + lVar86));
      local_5e0 = auVar108;
      auVar14 = *(undefined1 (*) [32])(auStack_180 + lVar86) & auVar14;
      if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0x7f,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0xbf,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar14[0x1f] < '\0') break;
      uVar91 = (ulong)(uVar90 - 1);
    }
    auVar139._8_4_ = 0x7f800000;
    auVar139._0_8_ = 0x7f8000007f800000;
    auVar139._12_4_ = 0x7f800000;
    auVar139._16_4_ = 0x7f800000;
    auVar139._20_4_ = 0x7f800000;
    auVar139._24_4_ = 0x7f800000;
    auVar139._28_4_ = 0x7f800000;
    auVar102 = vblendvps_avx(auVar139,auVar102,auVar108);
    auVar14 = vshufps_avx(auVar102,auVar102,0xb1);
    auVar14 = vminps_avx(auVar102,auVar14);
    auVar337 = vshufpd_avx(auVar14,auVar14,5);
    auVar14 = vminps_avx(auVar14,auVar337);
    auVar337 = vperm2f128_avx(auVar14,auVar14,1);
    auVar14 = vminps_avx(auVar14,auVar337);
    auVar102 = vcmpps_avx(auVar102,auVar14,0);
    auVar14 = auVar108 & auVar102;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar108 = vandps_avx(auVar102,auVar108);
    }
    auVar121._8_8_ = 0;
    auVar121._0_8_ = (&uStack_140)[uVar88 * 0xc];
    local_b4c = auStack_138[uVar88 * 0x18];
    uVar87 = vmovmskps_avx(auVar108);
    uVar85 = 0;
    if (uVar87 != 0) {
      for (; (uVar87 >> uVar85 & 1) == 0; uVar85 = uVar85 + 1) {
      }
    }
    *(undefined4 *)(local_5e0 + (ulong)uVar85 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar86) = local_5e0;
    uVar87 = uVar90 - 1;
    if ((((((((local_5e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_5e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_5e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_5e0 >> 0x7f,0) != '\0') ||
          (local_5e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_5e0 >> 0xbf,0) != '\0') ||
        (local_5e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_5e0[0x1f] < '\0') {
      uVar87 = uVar90;
    }
    auVar175 = vshufps_avx(auVar121,auVar121,0);
    auVar19 = vshufps_avx(auVar121,auVar121,0x55);
    auVar19 = vsubps_avx(auVar19,auVar175);
    local_620._4_4_ = auVar175._4_4_ + auVar19._4_4_ * 0.14285715;
    local_620._0_4_ = auVar175._0_4_ + auVar19._0_4_ * 0.0;
    fStack_618 = auVar175._8_4_ + auVar19._8_4_ * 0.2857143;
    fStack_614 = auVar175._12_4_ + auVar19._12_4_ * 0.42857146;
    fStack_610 = auVar175._0_4_ + auVar19._0_4_ * 0.5714286;
    fStack_60c = auVar175._4_4_ + auVar19._4_4_ * 0.71428573;
    fStack_608 = auVar175._8_4_ + auVar19._8_4_ * 0.8571429;
    fStack_604 = auVar175._12_4_ + auVar19._12_4_;
    local_630._8_8_ = 0;
    local_630._0_8_ = *(ulong *)(local_620 + (ulong)uVar85 * 4);
    uVar91 = (ulong)uVar87;
    uVar88 = local_920._0_8_;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }